

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution1D_x86_avx::forward
          (Convolution1D_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  uint uVar3;
  _func_int *p_Var4;
  _func_int **pp_Var5;
  _func_int *p_Var6;
  size_t sVar7;
  size_t sVar8;
  void *pvVar9;
  void *pvVar10;
  float fVar11;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  int *piVar34;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  int iVar38;
  void *pvVar39;
  long lVar40;
  void *pvVar41;
  ulong uVar42;
  long lVar43;
  int j_8;
  ulong uVar44;
  void *pvVar45;
  int iVar46;
  undefined1 (*pauVar47) [32];
  undefined1 (*pauVar48) [16];
  int q;
  int _elempack;
  float *pfVar49;
  int j;
  int iVar50;
  int iVar51;
  int iVar52;
  int j_3;
  float *pfVar53;
  long lVar54;
  bool bVar55;
  float fVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar77 [28];
  undefined1 auVar78 [28];
  undefined1 auVar79 [28];
  float fVar62;
  float fVar99;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar97;
  float fVar98;
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  float fVar103;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar160;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  float fVar158;
  float fVar159;
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 in_ZMM2 [64];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [64];
  undefined1 auVar208 [64];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar209;
  float fVar241;
  undefined1 auVar214 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar239;
  float fVar240;
  float fVar242;
  float fVar243;
  float fVar244;
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [64];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [32];
  undefined1 auVar278 [64];
  undefined1 auVar279 [32];
  undefined1 auVar280 [64];
  float fVar281;
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  undefined1 auVar282 [64];
  undefined1 auVar283 [64];
  float fVar290;
  float fVar292;
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  undefined1 auVar291 [64];
  float fVar298;
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  undefined1 auVar299 [64];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  undefined1 auVar309 [64];
  undefined1 auVar310 [64];
  float fVar316;
  float fVar324;
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  float fVar322;
  float fVar323;
  float fVar325;
  float fVar326;
  float fVar327;
  undefined1 auVar320 [32];
  undefined1 auVar321 [64];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  float fVar343;
  float fVar344;
  float fVar345;
  float fVar346;
  float fVar347;
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  float fVar348;
  undefined1 auVar342 [32];
  int local_b8;
  Mat local_98;
  void *local_48;
  void *local_40;
  long local_38;
  float fVar12;
  undefined1 auVar148 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar157 [32];
  undefined1 auVar226 [32];
  undefined1 auVar232 [32];
  undefined1 auVar238 [32];
  
  uVar42 = bottom_blob->elemsize;
  iVar2 = bottom_blob->elempack;
  p_Var4 = this->_vptr_Convolution1D_x86_avx[-3];
  iVar52 = *(int *)(&this->field_0xd4 + (long)p_Var4);
  iVar51 = *(int *)(&this->field_0xd8 + (long)p_Var4);
  local_98.cstep = 0;
  local_98.data = (Allocator *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_98.elempack = 0;
  local_98.h = 0;
  local_98.allocator = (Allocator *)local_98.data;
  local_98.dims = (int)local_98.refcount;
  local_98.w = local_98.refcount._4_4_;
  local_98.d = (int)local_98.refcount;
  local_98.c = local_98.elempack;
  Convolution1D::make_padding
            ((Convolution1D *)((long)&this->_vptr_Convolution1D_x86_avx + (long)p_Var4),bottom_blob,
             &local_98,opt);
  iVar38 = local_98.h;
  local_b8 = -100;
  if (((Allocator *)local_98.data != (Allocator *)0x0) && ((long)local_98.c * local_98.cstep != 0))
  {
    uVar3 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx[-3]);
    if (opt->use_packing_layout == true) {
      lVar40 = 8;
      if ((uVar3 & 7) != 0) {
        lVar40 = (ulong)((uVar3 & 3) == 0) * 3 + 1;
      }
    }
    else {
      lVar40 = 1;
    }
    _elempack = (int)lVar40;
    iVar52 = (local_98.w + ~((iVar52 + -1) * iVar51)) /
             *(int *)(&this->field_0xdc + (long)this->_vptr_Convolution1D_x86_avx[-3]);
    pvVar39 = (void *)((long)(int)uVar3 / (long)_elempack & 0xffffffff);
    iVar51 = (int)((long)(int)uVar3 / (long)_elempack);
    Mat::create(top_blob,iVar52 + 1,iVar51,lVar40 * (uVar42 / (ulong)(long)iVar2),_elempack,
                opt->blob_allocator);
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      if ((iVar2 == 8) && (_elempack == 8)) {
        uVar42 = 0;
        if (0 < iVar38) {
          uVar42 = (ulong)(uint)iVar38;
        }
        pvVar41 = (void *)0x0;
        if (0 < iVar51) {
          pvVar41 = pvVar39;
        }
        auVar320._8_4_ = 0x3f000000;
        auVar320._0_8_ = 0x3f0000003f000000;
        auVar320._12_4_ = 0x3f000000;
        auVar320._16_4_ = 0x3f000000;
        auVar320._20_4_ = 0x3f000000;
        auVar320._24_4_ = 0x3f000000;
        auVar320._28_4_ = 0x3f000000;
        auVar207 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar282 = ZEXT1664(ZEXT816(0) << 0x40);
        for (pvVar45 = (void *)0x0; pvVar45 != pvVar41; pvVar45 = (void *)((long)pvVar45 + 1)) {
          pauVar47 = (undefined1 (*) [32])
                     ((long)top_blob->w * (long)pvVar45 * top_blob->elemsize + (long)top_blob->data)
          ;
          pp_Var5 = this->_vptr_Convolution1D_x86_avx;
          for (iVar50 = 0; iVar50 <= iVar52; iVar50 = iVar50 + 1) {
            p_Var4 = pp_Var5[-3];
            if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
              auVar309 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar309 = ZEXT3264(*(undefined1 (*) [32])
                                   (*(long *)(&this->field_0x190 + (long)p_Var4) +
                                   (long)pvVar45 * 0x20));
            }
            pfVar53 = (float *)((this->weight_data_packed).cstep * (long)pvVar45 *
                                (this->weight_data_packed).elemsize +
                               (long)(this->weight_data_packed).data);
            for (uVar44 = 0; uVar44 != uVar42; uVar44 = uVar44 + 1) {
              p_Var6 = this->_vptr_Convolution1D_x86_avx[-3];
              pfVar49 = (float *)((long)(_func_int ***)local_98.data +
                                 (long)(*(int *)(&this->field_0xdc + (long)p_Var6) * iVar50 * 8) * 4
                                 + (long)local_98.w * local_98.elemsize * uVar44);
              iVar46 = *(int *)(&this->field_0xd4 + (long)p_Var6);
              if (*(int *)(&this->field_0xd4 + (long)p_Var6) < 1) {
                iVar46 = 0;
              }
              while (bVar55 = iVar46 != 0, iVar46 = iVar46 + -1, bVar55) {
                fVar56 = *pfVar49;
                fVar98 = pfVar49[1];
                fVar99 = pfVar49[2];
                fVar62 = pfVar49[3];
                fVar97 = pfVar49[4];
                fVar100 = pfVar49[5];
                fVar101 = pfVar49[6];
                fVar102 = pfVar49[7];
                fVar103 = fVar98 * pfVar53[8] + fVar99 * pfVar53[0x10];
                fVar158 = fVar98 * pfVar53[9] + fVar99 * pfVar53[0x11];
                fVar159 = fVar98 * pfVar53[10] + fVar99 * pfVar53[0x12];
                fVar160 = fVar98 * pfVar53[0xb] + fVar99 * pfVar53[0x13];
                fVar161 = fVar98 * pfVar53[0xc] + fVar99 * pfVar53[0x14];
                fVar162 = fVar98 * pfVar53[0xd] + fVar99 * pfVar53[0x15];
                fVar163 = fVar98 * pfVar53[0xe] + fVar99 * pfVar53[0x16];
                in_ZMM2 = ZEXT3264(CONCAT428(fVar98 + fVar99,
                                             CONCAT424(fVar163,CONCAT420(fVar162,CONCAT416(fVar161,
                                                  CONCAT412(fVar160,CONCAT48(fVar159,CONCAT44(
                                                  fVar158,fVar103))))))));
                auVar309 = ZEXT3264(CONCAT428(auVar309._28_4_ + fVar56 + fVar98 + fVar99 +
                                              fVar62 + fVar99 + fVar62 + fVar97 + fVar62,
                                              CONCAT424(auVar309._24_4_ + fVar56 * pfVar53[6] +
                                                        fVar163 + fVar62 * pfVar53[0x1e] +
                                                                  fVar97 * pfVar53[0x26] +
                                                                  fVar100 * pfVar53[0x2e] +
                                                        fVar101 * pfVar53[0x36] +
                                                        fVar102 * pfVar53[0x3e],
                                                        CONCAT420(auVar309._20_4_ +
                                                                  fVar56 * pfVar53[5] + fVar162 +
                                                                  fVar62 * pfVar53[0x1d] +
                                                                  fVar97 * pfVar53[0x25] +
                                                                  fVar100 * pfVar53[0x2d] +
                                                                  fVar101 * pfVar53[0x35] +
                                                                  fVar102 * pfVar53[0x3d],
                                                                  CONCAT416(auVar309._16_4_ +
                                                                            fVar56 * pfVar53[4] +
                                                                            fVar161 + fVar62 * 
                                                  pfVar53[0x1c] + fVar97 * pfVar53[0x24] +
                                                  fVar100 * pfVar53[0x2c] +
                                                  fVar101 * pfVar53[0x34] + fVar102 * pfVar53[0x3c],
                                                  CONCAT412(auVar309._12_4_ + fVar56 * pfVar53[3] +
                                                            fVar160 + fVar62 * pfVar53[0x1b] +
                                                                      fVar97 * pfVar53[0x23] +
                                                                      fVar100 * pfVar53[0x2b] +
                                                            fVar101 * pfVar53[0x33] +
                                                            fVar102 * pfVar53[0x3b],
                                                            CONCAT48(auVar309._8_4_ +
                                                                     fVar56 * pfVar53[2] + fVar159 +
                                                                     fVar62 * pfVar53[0x1a] +
                                                                     fVar97 * pfVar53[0x22] +
                                                                     fVar100 * pfVar53[0x2a] +
                                                                     fVar101 * pfVar53[0x32] +
                                                                     fVar102 * pfVar53[0x3a],
                                                                     CONCAT44(auVar309._4_4_ +
                                                                              fVar56 * pfVar53[1] +
                                                                              fVar158 + fVar62 * 
                                                  pfVar53[0x19] + fVar97 * pfVar53[0x21] +
                                                  fVar100 * pfVar53[0x29] +
                                                  fVar101 * pfVar53[0x31] + fVar102 * pfVar53[0x39],
                                                  auVar309._0_4_ + fVar56 * *pfVar53 + fVar103 +
                                                  fVar62 * pfVar53[0x18] + fVar97 * pfVar53[0x20] +
                                                  fVar100 * pfVar53[0x28] +
                                                  fVar101 * pfVar53[0x30] + fVar102 * pfVar53[0x38])
                                                  )))))));
                pfVar49 = pfVar49 + (long)*(int *)(&this->field_0xd8 + (long)p_Var6) * 8;
                pfVar53 = pfVar53 + 0x40;
              }
            }
            auVar86 = auVar309._0_32_;
            auVar192 = auVar86;
            if (5 < *(int *)(&this->field_0xf4 + (long)p_Var4) - 1U) goto switchD_004b77ed_caseD_1;
            auVar61 = auVar282._0_32_;
            auVar192 = vmaxps_avx(auVar86,auVar61);
            fVar103 = auVar309._8_4_;
            fVar158 = auVar309._12_4_;
            fVar159 = auVar309._16_4_;
            fVar160 = auVar309._20_4_;
            fVar161 = auVar309._24_4_;
            auVar204 = auVar207._0_32_;
            fVar56 = auVar207._0_4_;
            fVar98 = auVar207._4_4_;
            fVar99 = auVar207._8_4_;
            fVar62 = auVar207._12_4_;
            fVar97 = auVar207._16_4_;
            fVar100 = auVar207._20_4_;
            fVar101 = auVar207._24_4_;
            fVar102 = auVar207._28_4_;
            switch(*(int *)(&this->field_0xf4 + (long)p_Var4)) {
            case 2:
              auVar86 = vminps_avx(auVar86,auVar61);
              fVar56 = **(float **)(&this->field_0xf8 + (long)p_Var4);
              auVar221._0_4_ = fVar56 * auVar86._0_4_ + auVar192._0_4_;
              auVar221._4_4_ = fVar56 * auVar86._4_4_ + auVar192._4_4_;
              auVar221._8_4_ = fVar56 * auVar86._8_4_ + auVar192._8_4_;
              auVar221._12_4_ = fVar56 * auVar86._12_4_ + auVar192._12_4_;
              auVar221._16_4_ = fVar56 * auVar86._16_4_ + auVar192._16_4_;
              auVar221._20_4_ = fVar56 * auVar86._20_4_ + auVar192._20_4_;
              auVar221._24_4_ = fVar56 * auVar86._24_4_ + auVar192._24_4_;
              auVar221._28_4_ = auVar86._28_4_ + auVar192._28_4_;
              auVar192 = auVar221;
              break;
            case 3:
              uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
              auVar224._4_4_ = uVar1;
              auVar224._0_4_ = uVar1;
              auVar224._8_4_ = uVar1;
              auVar224._12_4_ = uVar1;
              auVar224._16_4_ = uVar1;
              auVar224._20_4_ = uVar1;
              auVar224._24_4_ = uVar1;
              auVar224._28_4_ = uVar1;
              uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
              auVar340._4_4_ = uVar1;
              auVar340._0_4_ = uVar1;
              auVar340._8_4_ = uVar1;
              auVar340._12_4_ = uVar1;
              auVar340._16_4_ = uVar1;
              auVar340._20_4_ = uVar1;
              auVar340._24_4_ = uVar1;
              auVar340._28_4_ = uVar1;
              auVar192 = vmaxps_avx(auVar86,auVar224);
              auVar192 = vminps_avx(auVar340,auVar192);
              break;
            case 4:
              auVar225._0_8_ = auVar309._0_8_ ^ 0x8000000080000000;
              auVar225._8_4_ = -fVar103;
              auVar225._12_4_ = -fVar158;
              auVar225._16_4_ = -fVar159;
              auVar225._20_4_ = -fVar160;
              auVar225._24_4_ = -fVar161;
              auVar225._28_4_ = -auVar309._28_4_;
              auVar83._8_4_ = 0x42b0c0a5;
              auVar83._0_8_ = 0x42b0c0a542b0c0a5;
              auVar83._12_4_ = 0x42b0c0a5;
              auVar83._16_4_ = 0x42b0c0a5;
              auVar83._20_4_ = 0x42b0c0a5;
              auVar83._24_4_ = 0x42b0c0a5;
              auVar83._28_4_ = 0x42b0c0a5;
              auVar192 = vminps_avx(auVar225,auVar83);
              auVar84._8_4_ = 0xc2b0c0a5;
              auVar84._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar84._12_4_ = 0xc2b0c0a5;
              auVar84._16_4_ = 0xc2b0c0a5;
              auVar84._20_4_ = 0xc2b0c0a5;
              auVar84._24_4_ = 0xc2b0c0a5;
              auVar84._28_4_ = 0xc2b0c0a5;
              auVar86 = vmaxps_avx(auVar192,auVar84);
              auVar306._0_4_ = auVar86._0_4_ * 1.442695 + 0.5;
              auVar306._4_4_ = auVar86._4_4_ * 1.442695 + 0.5;
              auVar306._8_4_ = auVar86._8_4_ * 1.442695 + 0.5;
              auVar306._12_4_ = auVar86._12_4_ * 1.442695 + 0.5;
              auVar306._16_4_ = auVar86._16_4_ * 1.442695 + 0.5;
              auVar306._20_4_ = auVar86._20_4_ * 1.442695 + 0.5;
              auVar306._24_4_ = auVar86._24_4_ * 1.442695 + 0.5;
              auVar306._28_4_ = auVar309._28_4_ + 0.5;
              auVar61 = vroundps_avx(auVar306,1);
              auVar192 = vcmpps_avx(auVar306,auVar61,1);
              auVar192 = vandps_avx(auVar192,auVar204);
              auVar192 = vsubps_avx(auVar61,auVar192);
              fVar103 = auVar192._0_4_ * -0.6931472 + auVar86._0_4_;
              fVar158 = auVar192._4_4_ * -0.6931472 + auVar86._4_4_;
              fVar159 = auVar192._8_4_ * -0.6931472 + auVar86._8_4_;
              fVar160 = auVar192._12_4_ * -0.6931472 + auVar86._12_4_;
              fVar161 = auVar192._16_4_ * -0.6931472 + auVar86._16_4_;
              fVar162 = auVar192._20_4_ * -0.6931472 + auVar86._20_4_;
              fVar163 = auVar192._24_4_ * -0.6931472 + auVar86._24_4_;
              in_ZMM2 = ZEXT3264(CONCAT428(0x3ab743ce,
                                           CONCAT424(0x3ab743ce,
                                                     CONCAT420(0x3ab743ce,
                                                               CONCAT416(0x3ab743ce,
                                                                         CONCAT412(0x3ab743ce,
                                                                                   CONCAT48(
                                                  0x3ab743ce,0x3ab743ce3ab743ce)))))));
              auVar211._0_4_ = (int)auVar192._0_4_;
              auVar211._4_4_ = (int)auVar192._4_4_;
              auVar211._8_4_ = (int)auVar192._8_4_;
              auVar211._12_4_ = (int)auVar192._12_4_;
              auVar226._16_4_ = (int)auVar192._16_4_;
              auVar226._0_16_ = auVar211;
              auVar226._20_4_ = (int)auVar192._20_4_;
              auVar226._24_4_ = (int)auVar192._24_4_;
              auVar226._28_4_ = (int)auVar192._28_4_;
              auVar210 = vpslld_avx(auVar211,0x17);
              auVar104 = vpslld_avx(auVar226._16_16_,0x17);
              auVar57._8_4_ = 0x3f800000;
              auVar57._0_8_ = 0x3f8000003f800000;
              auVar57._12_4_ = 0x3f800000;
              auVar104 = vpaddd_avx(auVar104,auVar57);
              auVar210 = vpaddd_avx(auVar210,auVar57);
              auVar85._0_4_ =
                   (fVar103 + fVar56 +
                   fVar103 * fVar103 *
                   (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) * fVar103 +
                     0.041665796) * fVar103 + 0.16666666) * fVar103 + 0.5)) * auVar210._0_4_ +
                   fVar56;
              auVar85._4_4_ =
                   (fVar158 + fVar98 +
                   fVar158 * fVar158 *
                   (((((fVar158 * 0.00019875691 + 0.0013981999) * fVar158 + 0.008333452) * fVar158 +
                     0.041665796) * fVar158 + 0.16666666) * fVar158 + 0.5)) * auVar210._4_4_ +
                   fVar98;
              auVar85._8_4_ =
                   (fVar159 + fVar99 +
                   fVar159 * fVar159 *
                   (((((fVar159 * 0.00019875691 + 0.0013981999) * fVar159 + 0.008333452) * fVar159 +
                     0.041665796) * fVar159 + 0.16666666) * fVar159 + 0.5)) * auVar210._8_4_ +
                   fVar99;
              auVar85._12_4_ =
                   (fVar160 + fVar62 +
                   fVar160 * fVar160 *
                   (((((fVar160 * 0.00019875691 + 0.0013981999) * fVar160 + 0.008333452) * fVar160 +
                     0.041665796) * fVar160 + 0.16666666) * fVar160 + 0.5)) * auVar210._12_4_ +
                   fVar62;
              auVar85._16_4_ =
                   (fVar161 + fVar97 +
                   fVar161 * fVar161 *
                   (((((fVar161 * 0.00019875691 + 0.0013981999) * fVar161 + 0.008333452) * fVar161 +
                     0.041665796) * fVar161 + 0.16666666) * fVar161 + 0.5)) * auVar104._0_4_ +
                   fVar97;
              auVar85._20_4_ =
                   (fVar162 + fVar100 +
                   fVar162 * fVar162 *
                   (((((fVar162 * 0.00019875691 + 0.0013981999) * fVar162 + 0.008333452) * fVar162 +
                     0.041665796) * fVar162 + 0.16666666) * fVar162 + 0.5)) * auVar104._4_4_ +
                   fVar100;
              auVar85._24_4_ =
                   (fVar163 + fVar101 +
                   fVar163 * fVar163 *
                   (((((fVar163 * 0.00019875691 + 0.0013981999) * fVar163 + 0.008333452) * fVar163 +
                     0.041665796) * fVar163 + 0.16666666) * fVar163 + 0.5)) * auVar104._8_4_ +
                   fVar101;
              auVar85._28_4_ = auVar61._28_4_ + auVar86._28_4_ + fVar102 + 0.71826285 + fVar102;
              auVar86 = vrcpps_avx(auVar85);
              fVar56 = auVar86._0_4_;
              fVar98 = auVar86._4_4_;
              auVar23._4_4_ = auVar85._4_4_ * fVar98;
              auVar23._0_4_ = auVar85._0_4_ * fVar56;
              fVar99 = auVar86._8_4_;
              auVar23._8_4_ = auVar85._8_4_ * fVar99;
              fVar62 = auVar86._12_4_;
              auVar23._12_4_ = auVar85._12_4_ * fVar62;
              fVar97 = auVar86._16_4_;
              auVar23._16_4_ = auVar85._16_4_ * fVar97;
              fVar100 = auVar86._20_4_;
              auVar23._20_4_ = auVar85._20_4_ * fVar100;
              fVar101 = auVar86._24_4_;
              auVar23._24_4_ = auVar85._24_4_ * fVar101;
              auVar23._28_4_ = auVar85._28_4_;
              auVar204 = vsubps_avx(auVar204,auVar23);
              auVar192._0_4_ = fVar56 + fVar56 * auVar204._0_4_;
              auVar192._4_4_ = fVar98 + fVar98 * auVar204._4_4_;
              auVar192._8_4_ = fVar99 + fVar99 * auVar204._8_4_;
              auVar192._12_4_ = fVar62 + fVar62 * auVar204._12_4_;
              auVar192._16_4_ = fVar97 + fVar97 * auVar204._16_4_;
              auVar192._20_4_ = fVar100 + fVar100 * auVar204._20_4_;
              auVar192._24_4_ = fVar101 + fVar101 * auVar204._24_4_;
              auVar192._28_4_ = auVar86._28_4_ + auVar204._28_4_;
              break;
            case 5:
              auVar277._8_4_ = 0x42b0c0a5;
              auVar277._0_8_ = 0x42b0c0a542b0c0a5;
              auVar277._12_4_ = 0x42b0c0a5;
              auVar277._16_4_ = 0x42b0c0a5;
              auVar277._20_4_ = 0x42b0c0a5;
              auVar277._24_4_ = 0x42b0c0a5;
              auVar277._28_4_ = 0x42b0c0a5;
              auVar86 = vminps_avx(auVar86,auVar277);
              auVar279._8_4_ = 0xc2b0c0a5;
              auVar279._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar279._12_4_ = 0xc2b0c0a5;
              auVar279._16_4_ = 0xc2b0c0a5;
              auVar279._20_4_ = 0xc2b0c0a5;
              auVar279._24_4_ = 0xc2b0c0a5;
              auVar279._28_4_ = 0xc2b0c0a5;
              auVar86 = vmaxps_avx(auVar279,auVar86);
              auVar222._0_4_ = auVar86._0_4_ * 1.442695 + 0.5;
              auVar222._4_4_ = auVar86._4_4_ * 1.442695 + 0.5;
              auVar222._8_4_ = auVar86._8_4_ * 1.442695 + 0.5;
              auVar222._12_4_ = auVar86._12_4_ * 1.442695 + 0.5;
              auVar222._16_4_ = auVar86._16_4_ * 1.442695 + 0.5;
              auVar222._20_4_ = auVar86._20_4_ * 1.442695 + 0.5;
              auVar222._24_4_ = auVar86._24_4_ * 1.442695 + 0.5;
              auVar222._28_4_ = auVar192._28_4_ + 0.5;
              auVar61 = vroundps_avx(auVar222,1);
              auVar192 = vcmpps_avx(auVar222,auVar61,1);
              auVar192 = vandps_avx(auVar192,auVar204);
              auVar192 = vsubps_avx(auVar61,auVar192);
              auVar20._4_4_ = auVar192._4_4_ * 0.6931472;
              auVar20._0_4_ = auVar192._0_4_ * 0.6931472;
              auVar20._8_4_ = auVar192._8_4_ * 0.6931472;
              auVar20._12_4_ = auVar192._12_4_ * 0.6931472;
              auVar20._16_4_ = auVar192._16_4_ * 0.6931472;
              auVar20._20_4_ = auVar192._20_4_ * 0.6931472;
              auVar20._24_4_ = auVar192._24_4_ * 0.6931472;
              auVar20._28_4_ = auVar61._28_4_;
              auVar86 = vsubps_avx(auVar86,auVar20);
              fVar162 = auVar86._0_4_;
              fVar163 = auVar86._4_4_;
              fVar343 = auVar86._8_4_;
              fVar344 = auVar86._12_4_;
              fVar345 = auVar86._16_4_;
              fVar346 = auVar86._20_4_;
              fVar347 = auVar86._24_4_;
              auVar104._0_4_ = (int)auVar192._0_4_;
              auVar104._4_4_ = (int)auVar192._4_4_;
              auVar104._8_4_ = (int)auVar192._8_4_;
              auVar104._12_4_ = (int)auVar192._12_4_;
              auVar141._16_4_ = (int)auVar192._16_4_;
              auVar141._0_16_ = auVar104;
              auVar141._20_4_ = (int)auVar192._20_4_;
              auVar141._24_4_ = (int)auVar192._24_4_;
              auVar141._28_4_ = (int)auVar192._28_4_;
              auVar210 = vpslld_avx(auVar104,0x17);
              auVar104 = vpslld_avx(auVar141._16_16_,0x17);
              auVar197._8_4_ = 0x3f800000;
              auVar197._0_8_ = 0x3f8000003f800000;
              auVar197._12_4_ = 0x3f800000;
              auVar104 = vpaddd_avx(auVar104,auVar197);
              auVar210 = vpaddd_avx(auVar210,auVar197);
              auVar223._0_4_ =
                   (fVar162 + fVar56 +
                   fVar162 * fVar162 *
                   (((((fVar162 * 0.00019875691 + 0.0013981999) * fVar162 + 0.008333452) * fVar162 +
                     0.041665796) * fVar162 + 0.16666666) * fVar162 + 0.5)) * auVar210._0_4_ +
                   fVar56;
              auVar223._4_4_ =
                   (fVar163 + fVar98 +
                   fVar163 * fVar163 *
                   (((((fVar163 * 0.00019875691 + 0.0013981999) * fVar163 + 0.008333452) * fVar163 +
                     0.041665796) * fVar163 + 0.16666666) * fVar163 + 0.5)) * auVar210._4_4_ +
                   fVar98;
              auVar223._8_4_ =
                   (fVar343 + fVar99 +
                   fVar343 * fVar343 *
                   (((((fVar343 * 0.00019875691 + 0.0013981999) * fVar343 + 0.008333452) * fVar343 +
                     0.041665796) * fVar343 + 0.16666666) * fVar343 + 0.5)) * auVar210._8_4_ +
                   fVar99;
              auVar223._12_4_ =
                   (fVar344 + fVar62 +
                   fVar344 * fVar344 *
                   (((((fVar344 * 0.00019875691 + 0.0013981999) * fVar344 + 0.008333452) * fVar344 +
                     0.041665796) * fVar344 + 0.16666666) * fVar344 + 0.5)) * auVar210._12_4_ +
                   fVar62;
              auVar223._16_4_ =
                   (fVar345 + fVar97 +
                   fVar345 * fVar345 *
                   (((((fVar345 * 0.00019875691 + 0.0013981999) * fVar345 + 0.008333452) * fVar345 +
                     0.041665796) * fVar345 + 0.16666666) * fVar345 + 0.5)) * auVar104._0_4_ +
                   fVar97;
              auVar223._20_4_ =
                   (fVar346 + fVar100 +
                   fVar346 * fVar346 *
                   (((((fVar346 * 0.00019875691 + 0.0013981999) * fVar346 + 0.008333452) * fVar346 +
                     0.041665796) * fVar346 + 0.16666666) * fVar346 + 0.5)) * auVar104._4_4_ +
                   fVar100;
              auVar223._24_4_ =
                   (fVar347 + fVar101 +
                   fVar347 * fVar347 *
                   (((((fVar347 * 0.00019875691 + 0.0013981999) * fVar347 + 0.008333452) * fVar347 +
                     0.041665796) * fVar347 + 0.16666666) * fVar347 + 0.5)) * auVar104._8_4_ +
                   fVar101;
              auVar223._28_4_ =
                   auVar86._28_4_ + fVar102 +
                   in_ZMM2._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 + 0.5 +
                   fVar102;
              auVar80._8_4_ = 0x800000;
              auVar80._0_8_ = 0x80000000800000;
              auVar80._12_4_ = 0x800000;
              auVar80._16_4_ = 0x800000;
              auVar80._20_4_ = 0x800000;
              auVar80._24_4_ = 0x800000;
              auVar80._28_4_ = 0x800000;
              auVar61 = vmaxps_avx(auVar223,auVar80);
              auVar104 = vpsrld_avx(auVar61._16_16_,0x17);
              auVar190._8_4_ = 0x807fffff;
              auVar190._0_8_ = 0x807fffff807fffff;
              auVar190._12_4_ = 0x807fffff;
              auVar190._16_4_ = 0x807fffff;
              auVar190._20_4_ = 0x807fffff;
              auVar190._24_4_ = 0x807fffff;
              auVar190._28_4_ = 0x807fffff;
              auVar192 = vandps_avx(auVar61,auVar190);
              auVar147 = vorps_avx(auVar192,auVar320);
              auVar191._8_4_ = 0x3f3504f3;
              auVar191._0_8_ = 0x3f3504f33f3504f3;
              auVar191._12_4_ = 0x3f3504f3;
              auVar191._16_4_ = 0x3f3504f3;
              auVar191._20_4_ = 0x3f3504f3;
              auVar191._24_4_ = 0x3f3504f3;
              auVar191._28_4_ = 0x3f3504f3;
              auVar86 = vcmpps_avx(auVar191,auVar147,2);
              auVar192 = vandnps_avx(auVar86,auVar147);
              fVar162 = auVar147._0_4_ + -1.0 + auVar192._0_4_;
              fVar163 = auVar147._4_4_ + -1.0 + auVar192._4_4_;
              fVar343 = auVar147._8_4_ + -1.0 + auVar192._8_4_;
              fVar344 = auVar147._12_4_ + -1.0 + auVar192._12_4_;
              fVar345 = auVar147._16_4_ + -1.0 + auVar192._16_4_;
              fVar346 = auVar147._20_4_ + -1.0 + auVar192._20_4_;
              fVar347 = auVar147._24_4_ + -1.0 + auVar192._24_4_;
              auVar104 = vpsubd_avx(auVar104,auVar86._16_16_);
              auVar210 = vpsrld_avx(auVar61._0_16_,0x17);
              auVar245._8_4_ = 0xffffff81;
              auVar245._0_8_ = 0xffffff81ffffff81;
              auVar245._12_4_ = 0xffffff81;
              auVar104 = vpaddd_avx(auVar104,auVar245);
              auVar210 = vpsubd_avx(auVar210,auVar86._0_16_);
              auVar210 = vpaddd_avx(auVar210,auVar245);
              auVar81._16_16_ = auVar104;
              auVar81._0_16_ = auVar210;
              auVar86 = vcmpps_avx(auVar223,_DAT_004d5ba0,2);
              auVar61 = vcvtdq2ps_avx(auVar81);
              auVar21._4_4_ =
                   (fVar163 + auVar61._4_4_ * 0.6931472 +
                   fVar163 * fVar163 *
                   (fVar163 * (fVar163 * (fVar163 * (fVar163 * (fVar163 * (fVar163 * (fVar163 * (
                                                  fVar163 * (fVar163 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar21._0_4_ =
                   (fVar162 + auVar61._0_4_ * 0.6931472 +
                   fVar162 * fVar162 *
                   (fVar162 * (fVar162 * (fVar162 * (fVar162 * (fVar162 * (fVar162 * (fVar162 * (
                                                  fVar162 * (fVar162 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar21._8_4_ =
                   (fVar343 + auVar61._8_4_ * 0.6931472 +
                   fVar343 * fVar343 *
                   (fVar343 * (fVar343 * (fVar343 * (fVar343 * (fVar343 * (fVar343 * (fVar343 * (
                                                  fVar343 * (fVar343 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar21._12_4_ =
                   (fVar344 + auVar61._12_4_ * 0.6931472 +
                   fVar344 * fVar344 *
                   (fVar344 * (fVar344 * (fVar344 * (fVar344 * (fVar344 * (fVar344 * (fVar344 * (
                                                  fVar344 * (fVar344 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar21._16_4_ =
                   (fVar345 + auVar61._16_4_ * 0.6931472 +
                   fVar345 * fVar345 *
                   (fVar345 * (fVar345 * (fVar345 * (fVar345 * (fVar345 * (fVar345 * (fVar345 * (
                                                  fVar345 * (fVar345 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar21._20_4_ =
                   (fVar346 + auVar61._20_4_ * 0.6931472 +
                   fVar346 * fVar346 *
                   (fVar346 * (fVar346 * (fVar346 * (fVar346 * (fVar346 * (fVar346 * (fVar346 * (
                                                  fVar346 * (fVar346 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar21._24_4_ =
                   (fVar347 + auVar61._24_4_ * 0.6931472 +
                   fVar347 * fVar347 *
                   (fVar347 * (fVar347 * (fVar347 * (fVar347 * (fVar347 * (fVar347 * (fVar347 * (
                                                  fVar347 * (fVar347 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar21._28_4_ = auVar147._28_4_ + -1.0 + auVar192._28_4_ + auVar61._28_4_ + 0.0;
              auVar142._8_4_ = 0x7fffffff;
              auVar142._0_8_ = 0x7fffffff7fffffff;
              auVar142._12_4_ = 0x7fffffff;
              auVar142._16_4_ = 0x7fffffff;
              auVar142._20_4_ = 0x7fffffff;
              auVar142._24_4_ = 0x7fffffff;
              auVar142._28_4_ = 0x7fffffff;
              auVar192 = vblendvps_avx(auVar21,auVar142,auVar86);
              auVar143._8_4_ = 0x42b0c0a5;
              auVar143._0_8_ = 0x42b0c0a542b0c0a5;
              auVar143._12_4_ = 0x42b0c0a5;
              auVar143._16_4_ = 0x42b0c0a5;
              auVar143._20_4_ = 0x42b0c0a5;
              auVar143._24_4_ = 0x42b0c0a5;
              auVar143._28_4_ = 0x42b0c0a5;
              auVar192 = vminps_avx(auVar192,auVar143);
              auVar144._8_4_ = 0xc2b0c0a5;
              auVar144._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar144._12_4_ = 0xc2b0c0a5;
              auVar144._16_4_ = 0xc2b0c0a5;
              auVar144._20_4_ = 0xc2b0c0a5;
              auVar144._24_4_ = 0xc2b0c0a5;
              auVar144._28_4_ = 0xc2b0c0a5;
              auVar86 = vmaxps_avx(auVar192,auVar144);
              auVar282 = ZEXT864(0) << 0x20;
              auVar145._0_4_ = auVar86._0_4_ * 1.442695 + 0.5;
              auVar145._4_4_ = auVar86._4_4_ * 1.442695 + 0.5;
              auVar145._8_4_ = auVar86._8_4_ * 1.442695 + 0.5;
              auVar145._12_4_ = auVar86._12_4_ * 1.442695 + 0.5;
              auVar145._16_4_ = auVar86._16_4_ * 1.442695 + 0.5;
              auVar145._20_4_ = auVar86._20_4_ * 1.442695 + 0.5;
              auVar145._24_4_ = auVar86._24_4_ * 1.442695 + 0.5;
              auVar145._28_4_ = 0xc2afc0a5;
              auVar61 = vroundps_avx(auVar145,1);
              auVar192 = vcmpps_avx(auVar145,auVar61,1);
              auVar192 = vandps_avx(auVar192,auVar204);
              auVar147 = vsubps_avx(auVar61,auVar192);
              auVar22._4_4_ = auVar147._4_4_ * 0.6931472;
              auVar22._0_4_ = auVar147._0_4_ * 0.6931472;
              auVar22._8_4_ = auVar147._8_4_ * 0.6931472;
              auVar22._12_4_ = auVar147._12_4_ * 0.6931472;
              auVar22._16_4_ = auVar147._16_4_ * 0.6931472;
              auVar22._20_4_ = auVar147._20_4_ * 0.6931472;
              auVar22._24_4_ = auVar147._24_4_ * 0.6931472;
              auVar22._28_4_ = auVar61._28_4_;
              auVar86 = vsubps_avx(auVar86,auVar22);
              fVar162 = auVar86._0_4_;
              fVar163 = auVar86._4_4_;
              fVar343 = auVar86._8_4_;
              fVar344 = auVar86._12_4_;
              fVar345 = auVar86._16_4_;
              fVar346 = auVar86._20_4_;
              fVar347 = auVar86._24_4_;
              auVar207 = ZEXT3264(auVar204);
              auVar192._0_4_ =
                   ((((fVar162 * 0.00019875691 + 0.0013981999) * fVar162 + 0.008333452) * fVar162 +
                    0.041665796) * fVar162 + 0.16666666) * fVar162 + 0.5;
              auVar192._4_4_ =
                   ((((fVar163 * 0.00019875691 + 0.0013981999) * fVar163 + 0.008333452) * fVar163 +
                    0.041665796) * fVar163 + 0.16666666) * fVar163 + 0.5;
              auVar192._8_4_ =
                   ((((fVar343 * 0.00019875691 + 0.0013981999) * fVar343 + 0.008333452) * fVar343 +
                    0.041665796) * fVar343 + 0.16666666) * fVar343 + 0.5;
              auVar192._12_4_ =
                   ((((fVar344 * 0.00019875691 + 0.0013981999) * fVar344 + 0.008333452) * fVar344 +
                    0.041665796) * fVar344 + 0.16666666) * fVar344 + 0.5;
              auVar192._16_4_ =
                   ((((fVar345 * 0.00019875691 + 0.0013981999) * fVar345 + 0.008333452) * fVar345 +
                    0.041665796) * fVar345 + 0.16666666) * fVar345 + 0.5;
              auVar192._20_4_ =
                   ((((fVar346 * 0.00019875691 + 0.0013981999) * fVar346 + 0.008333452) * fVar346 +
                    0.041665796) * fVar346 + 0.16666666) * fVar346 + 0.5;
              auVar192._24_4_ =
                   ((((fVar347 * 0.00019875691 + 0.0013981999) * fVar347 + 0.008333452) * fVar347 +
                    0.041665796) * fVar347 + 0.16666666) * fVar347 + 0.5;
              auVar192._28_4_ =
                   auVar223._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 + 0.5;
              auVar210._0_4_ = (int)auVar147._0_4_;
              auVar210._4_4_ = (int)auVar147._4_4_;
              auVar210._8_4_ = (int)auVar147._8_4_;
              auVar210._12_4_ = (int)auVar147._12_4_;
              auVar146._16_4_ = (int)auVar147._16_4_;
              auVar146._0_16_ = auVar210;
              auVar146._20_4_ = (int)auVar147._20_4_;
              auVar146._24_4_ = (int)auVar147._24_4_;
              auVar146._28_4_ = (int)auVar147._28_4_;
              auVar210 = vpslld_avx(auVar210,0x17);
              auVar104 = vpslld_avx(auVar146._16_16_,0x17);
              auVar104 = vpaddd_avx(auVar104,auVar197);
              auVar210 = vpaddd_avx(auVar210,auVar197);
              auVar82._0_4_ =
                   (fVar162 + fVar56 + fVar162 * fVar162 * auVar192._0_4_) * auVar210._0_4_ + fVar56
              ;
              auVar82._4_4_ =
                   (fVar163 + fVar98 + fVar163 * fVar163 * auVar192._4_4_) * auVar210._4_4_ + fVar98
              ;
              auVar82._8_4_ =
                   (fVar343 + fVar99 + fVar343 * fVar343 * auVar192._8_4_) * auVar210._8_4_ + fVar99
              ;
              auVar82._12_4_ =
                   (fVar344 + fVar62 + fVar344 * fVar344 * auVar192._12_4_) * auVar210._12_4_ +
                   fVar62;
              auVar82._16_4_ =
                   (fVar345 + fVar97 + fVar345 * fVar345 * auVar192._16_4_) * auVar104._0_4_ +
                   fVar97;
              auVar82._20_4_ =
                   (fVar346 + fVar100 + fVar346 * fVar346 * auVar192._20_4_) * auVar104._4_4_ +
                   fVar100;
              auVar82._24_4_ =
                   (fVar347 + fVar101 + fVar347 * fVar347 * auVar192._24_4_) * auVar104._8_4_ +
                   fVar101;
              auVar82._28_4_ = auVar86._28_4_ + fVar102 + auVar61._28_4_ + fVar102;
              auVar86 = vrcpps_avx(auVar82);
              fVar56 = auVar86._0_4_;
              fVar98 = auVar86._4_4_;
              fVar99 = auVar86._8_4_;
              fVar62 = auVar86._12_4_;
              fVar97 = auVar86._16_4_;
              fVar100 = auVar86._20_4_;
              fVar101 = auVar86._24_4_;
              auVar204._4_4_ = auVar82._4_4_ * (fVar98 + fVar98);
              auVar204._0_4_ = auVar82._0_4_ * (fVar56 + fVar56);
              auVar204._8_4_ = auVar82._8_4_ * (fVar99 + fVar99);
              auVar204._12_4_ = auVar82._12_4_ * (fVar62 + fVar62);
              auVar204._16_4_ = auVar82._16_4_ * (fVar97 + fVar97);
              auVar204._20_4_ = auVar82._20_4_ * (fVar100 + fVar100);
              auVar204._24_4_ = auVar82._24_4_ * (fVar101 + fVar101);
              auVar204._28_4_ = auVar82._28_4_;
              auVar61._8_4_ = 0x40000000;
              auVar61._0_8_ = 0x4000000040000000;
              auVar61._12_4_ = 0x40000000;
              auVar61._16_4_ = 0x40000000;
              auVar61._20_4_ = 0x40000000;
              auVar61._24_4_ = 0x40000000;
              auVar61._28_4_ = 0x40000000;
              auVar204 = vsubps_avx(auVar61,auVar204);
              auVar147._0_4_ = fVar56 + fVar56 + -1.0;
              auVar147._4_4_ = fVar98 + fVar98 + -1.0;
              auVar147._8_4_ = fVar99 + fVar99 + -1.0;
              auVar147._12_4_ = fVar62 + fVar62 + -1.0;
              auVar147._16_4_ = fVar97 + fVar97 + -1.0;
              auVar147._20_4_ = fVar100 + fVar100 + -1.0;
              auVar147._24_4_ = fVar101 + fVar101 + -1.0;
              auVar147._28_4_ = auVar86._28_4_ + auVar86._28_4_ + -1.0;
              auVar77._0_4_ = auVar147._0_4_ + fVar56 * auVar204._0_4_;
              auVar77._4_4_ = auVar147._4_4_ + fVar98 * auVar204._4_4_;
              auVar77._8_4_ = auVar147._8_4_ + fVar99 * auVar204._8_4_;
              auVar77._12_4_ = auVar147._12_4_ + fVar62 * auVar204._12_4_;
              auVar77._16_4_ = auVar147._16_4_ + fVar97 * auVar204._16_4_;
              auVar77._20_4_ = auVar147._20_4_ + fVar100 * auVar204._20_4_;
              auVar77._24_4_ = auVar147._24_4_ + fVar101 * auVar204._24_4_;
              goto LAB_004b7c7a;
            case 6:
              fVar56 = **(float **)(&this->field_0xf8 + (long)p_Var4);
              fVar98 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
              auVar147._4_4_ = fVar98;
              auVar147._0_4_ = fVar98;
              auVar147._8_4_ = fVar98;
              auVar147._12_4_ = fVar98;
              auVar147._16_4_ = fVar98;
              auVar147._20_4_ = fVar98;
              auVar147._24_4_ = fVar98;
              auVar147._28_4_ = fVar98;
              auVar86._0_4_ = auVar309._0_4_ * fVar56 + fVar98;
              auVar86._4_4_ = auVar309._4_4_ * fVar56 + fVar98;
              auVar86._8_4_ = fVar103 * fVar56 + fVar98;
              auVar86._12_4_ = fVar158 * fVar56 + fVar98;
              auVar86._16_4_ = fVar159 * fVar56 + fVar98;
              auVar86._20_4_ = fVar160 * fVar56 + fVar98;
              auVar86._24_4_ = fVar161 * fVar56 + fVar98;
              auVar86._28_4_ = fVar56 + fVar98;
              auVar86 = vmaxps_avx(auVar61,auVar86);
              auVar86 = vminps_avx(auVar86,auVar204);
              auVar77 = auVar86._0_28_;
LAB_004b7c7a:
              in_ZMM2 = ZEXT3264(auVar147);
              auVar35._4_4_ = auVar309._4_4_ * auVar77._4_4_;
              auVar35._0_4_ = auVar309._0_4_ * auVar77._0_4_;
              auVar35._8_4_ = fVar103 * auVar77._8_4_;
              auVar35._12_4_ = fVar158 * auVar77._12_4_;
              auVar35._16_4_ = fVar159 * auVar77._16_4_;
              auVar35._20_4_ = fVar160 * auVar77._20_4_;
              auVar35._24_4_ = fVar161 * auVar77._24_4_;
              auVar35._28_4_ = auVar192._28_4_;
              auVar192 = auVar35;
            }
switchD_004b77ed_caseD_1:
            *pauVar47 = auVar192;
            pauVar47 = pauVar47 + 1;
          }
        }
      }
      if ((iVar2 == 1) && (_elempack == 8)) {
        uVar42 = 0;
        if (0 < iVar38) {
          uVar42 = (ulong)(uint)iVar38;
        }
        pvVar41 = (void *)0x0;
        if (0 < iVar51) {
          pvVar41 = pvVar39;
        }
        auVar273 = ZEXT3264(CONCAT428(0x42b0c0a5,
                                      CONCAT424(0x42b0c0a5,
                                                CONCAT420(0x42b0c0a5,
                                                          CONCAT416(0x42b0c0a5,
                                                                    CONCAT412(0x42b0c0a5,
                                                                              CONCAT48(0x42b0c0a5,
                                                                                                                                                                              
                                                  0x42b0c0a542b0c0a5)))))));
        auVar278 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                      CONCAT424(0xc2b0c0a5,
                                                CONCAT420(0xc2b0c0a5,
                                                          CONCAT416(0xc2b0c0a5,
                                                                    CONCAT412(0xc2b0c0a5,
                                                                              CONCAT48(0xc2b0c0a5,
                                                                                                                                                                              
                                                  0xc2b0c0a5c2b0c0a5)))))));
        auVar280 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                      CONCAT424(0x3fb8aa3b,
                                                CONCAT420(0x3fb8aa3b,
                                                          CONCAT416(0x3fb8aa3b,
                                                                    CONCAT412(0x3fb8aa3b,
                                                                              CONCAT48(0x3fb8aa3b,
                                                                                                                                                                              
                                                  0x3fb8aa3b3fb8aa3b)))))));
        auVar309 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar208 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar283 = ZEXT3264(CONCAT428(0x39506967,
                                      CONCAT424(0x39506967,
                                                CONCAT420(0x39506967,
                                                          CONCAT416(0x39506967,
                                                                    CONCAT412(0x39506967,
                                                                              CONCAT48(0x39506967,
                                                                                                                                                                              
                                                  0x3950696739506967)))))));
        auVar291 = ZEXT3264(CONCAT428(0x3ab743ce,
                                      CONCAT424(0x3ab743ce,
                                                CONCAT420(0x3ab743ce,
                                                          CONCAT416(0x3ab743ce,
                                                                    CONCAT412(0x3ab743ce,
                                                                              CONCAT48(0x3ab743ce,
                                                                                                                                                                              
                                                  0x3ab743ce3ab743ce)))))));
        auVar299 = ZEXT3264(CONCAT428(0x3c088908,
                                      CONCAT424(0x3c088908,
                                                CONCAT420(0x3c088908,
                                                          CONCAT416(0x3c088908,
                                                                    CONCAT412(0x3c088908,
                                                                              CONCAT48(0x3c088908,
                                                                                                                                                                              
                                                  0x3c0889083c088908)))))));
        auVar207 = ZEXT3264(CONCAT428(0x3d2aa9c1,
                                      CONCAT424(0x3d2aa9c1,
                                                CONCAT420(0x3d2aa9c1,
                                                          CONCAT416(0x3d2aa9c1,
                                                                    CONCAT412(0x3d2aa9c1,
                                                                              CONCAT48(0x3d2aa9c1,
                                                                                                                                                                              
                                                  0x3d2aa9c13d2aa9c1)))))));
        auVar321 = ZEXT3264(CONCAT428(0x3e2aaaaa,
                                      CONCAT424(0x3e2aaaaa,
                                                CONCAT420(0x3e2aaaaa,
                                                          CONCAT416(0x3e2aaaaa,
                                                                    CONCAT412(0x3e2aaaaa,
                                                                              CONCAT48(0x3e2aaaaa,
                                                                                                                                                                              
                                                  0x3e2aaaaa3e2aaaaa)))))));
        auVar282 = ZEXT1664(ZEXT816(0) << 0x40);
        for (pvVar45 = (void *)0x0; pvVar45 != pvVar41; pvVar45 = (void *)((long)pvVar45 + 1)) {
          pauVar47 = (undefined1 (*) [32])
                     ((long)top_blob->w * (long)pvVar45 * top_blob->elemsize + (long)top_blob->data)
          ;
          pp_Var5 = this->_vptr_Convolution1D_x86_avx;
          for (iVar50 = 0; iVar50 <= iVar52; iVar50 = iVar50 + 1) {
            p_Var4 = pp_Var5[-3];
            if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
              auVar310 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar310 = ZEXT3264(*(undefined1 (*) [32])
                                   (*(long *)(&this->field_0x190 + (long)p_Var4) +
                                   (long)pvVar45 * 0x20));
            }
            pfVar53 = (float *)((this->weight_data_packed).cstep * (long)pvVar45 *
                                (this->weight_data_packed).elemsize +
                               (long)(this->weight_data_packed).data);
            for (uVar44 = 0; uVar44 != uVar42; uVar44 = uVar44 + 1) {
              p_Var6 = this->_vptr_Convolution1D_x86_avx[-3];
              pfVar49 = (float *)((long)(_func_int ***)local_98.data +
                                 (long)*(int *)(&this->field_0xdc + (long)p_Var6) * (long)iVar50 * 4
                                 + (long)local_98.w * local_98.elemsize * uVar44);
              iVar46 = *(int *)(&this->field_0xd4 + (long)p_Var6);
              if (*(int *)(&this->field_0xd4 + (long)p_Var6) < 1) {
                iVar46 = 0;
              }
              while (bVar55 = iVar46 != 0, iVar46 = iVar46 + -1, bVar55) {
                fVar56 = *pfVar49;
                auVar310 = ZEXT3264(CONCAT428(auVar310._28_4_ + fVar56,
                                              CONCAT424(auVar310._24_4_ + fVar56 * pfVar53[6],
                                                        CONCAT420(auVar310._20_4_ +
                                                                  fVar56 * pfVar53[5],
                                                                  CONCAT416(auVar310._16_4_ +
                                                                            fVar56 * pfVar53[4],
                                                                            CONCAT412(auVar310.
                                                  _12_4_ + fVar56 * pfVar53[3],
                                                  CONCAT48(auVar310._8_4_ + fVar56 * pfVar53[2],
                                                           CONCAT44(auVar310._4_4_ +
                                                                    fVar56 * pfVar53[1],
                                                                    auVar310._0_4_ +
                                                                    fVar56 * *pfVar53))))))));
                pfVar49 = pfVar49 + *(int *)(&this->field_0xd8 + (long)p_Var6);
                pfVar53 = pfVar53 + 8;
              }
            }
            auVar320 = auVar310._0_32_;
            auVar229 = auVar320;
            if (5 < *(int *)(&this->field_0xf4 + (long)p_Var4) - 1U) goto switchD_004b7e65_caseD_1;
            auVar192 = auVar282._0_32_;
            auVar229 = vmaxps_avx(auVar320,auVar192);
            fVar311 = auVar310._8_4_;
            fVar312 = auVar310._12_4_;
            fVar313 = auVar310._16_4_;
            fVar314 = auVar310._20_4_;
            fVar315 = auVar310._24_4_;
            fVar209 = auVar280._0_4_;
            fVar239 = auVar280._4_4_;
            fVar240 = auVar280._8_4_;
            fVar241 = auVar280._12_4_;
            fVar242 = auVar280._16_4_;
            fVar243 = auVar280._20_4_;
            fVar244 = auVar280._24_4_;
            auVar86 = auVar208._0_32_;
            fVar281 = auVar283._0_4_;
            fVar284 = auVar283._4_4_;
            fVar285 = auVar283._8_4_;
            fVar286 = auVar283._12_4_;
            fVar287 = auVar283._16_4_;
            fVar288 = auVar283._20_4_;
            fVar289 = auVar283._24_4_;
            fVar290 = auVar291._0_4_;
            fVar292 = auVar291._4_4_;
            fVar293 = auVar291._8_4_;
            fVar294 = auVar291._12_4_;
            fVar295 = auVar291._16_4_;
            fVar296 = auVar291._20_4_;
            fVar297 = auVar291._24_4_;
            fVar298 = auVar299._0_4_;
            fVar300 = auVar299._4_4_;
            fVar301 = auVar299._8_4_;
            fVar302 = auVar299._12_4_;
            fVar303 = auVar299._16_4_;
            fVar304 = auVar299._20_4_;
            fVar305 = auVar299._24_4_;
            fVar316 = auVar321._0_4_;
            fVar322 = auVar321._4_4_;
            fVar323 = auVar321._8_4_;
            fVar324 = auVar321._12_4_;
            fVar325 = auVar321._16_4_;
            fVar326 = auVar321._20_4_;
            fVar327 = auVar321._24_4_;
            auVar204 = auVar273._0_32_;
            auVar61 = auVar278._0_32_;
            fVar100 = auVar309._4_4_;
            fVar103 = auVar309._8_4_;
            fVar158 = auVar309._12_4_;
            fVar161 = auVar309._16_4_;
            fVar343 = auVar309._20_4_;
            fVar348 = auVar309._24_4_;
            fVar11 = auVar309._28_4_;
            fVar56 = auVar207._0_4_;
            fVar62 = auVar207._4_4_;
            fVar102 = auVar207._8_4_;
            fVar159 = auVar207._12_4_;
            fVar162 = auVar207._16_4_;
            fVar344 = auVar207._20_4_;
            fVar347 = auVar207._24_4_;
            fVar97 = auVar208._4_4_;
            fVar101 = auVar208._8_4_;
            fVar160 = auVar208._12_4_;
            fVar163 = auVar208._16_4_;
            fVar345 = auVar208._20_4_;
            fVar346 = auVar208._24_4_;
            fVar12 = auVar208._28_4_;
            fVar98 = auVar208._0_4_;
            fVar99 = auVar309._0_4_;
            switch(*(int *)(&this->field_0xf4 + (long)p_Var4)) {
            case 2:
              auVar320 = vminps_avx(auVar320,auVar192);
              fVar56 = **(float **)(&this->field_0xf8 + (long)p_Var4);
              auVar227._0_4_ = fVar56 * auVar320._0_4_ + auVar229._0_4_;
              auVar227._4_4_ = fVar56 * auVar320._4_4_ + auVar229._4_4_;
              auVar227._8_4_ = fVar56 * auVar320._8_4_ + auVar229._8_4_;
              auVar227._12_4_ = fVar56 * auVar320._12_4_ + auVar229._12_4_;
              auVar227._16_4_ = fVar56 * auVar320._16_4_ + auVar229._16_4_;
              auVar227._20_4_ = fVar56 * auVar320._20_4_ + auVar229._20_4_;
              auVar227._24_4_ = fVar56 * auVar320._24_4_ + auVar229._24_4_;
              auVar227._28_4_ = auVar320._28_4_ + auVar229._28_4_;
              auVar229 = auVar227;
              break;
            case 3:
              uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
              auVar230._4_4_ = uVar1;
              auVar230._0_4_ = uVar1;
              auVar230._8_4_ = uVar1;
              auVar230._12_4_ = uVar1;
              auVar230._16_4_ = uVar1;
              auVar230._20_4_ = uVar1;
              auVar230._24_4_ = uVar1;
              auVar230._28_4_ = uVar1;
              uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
              auVar341._4_4_ = uVar1;
              auVar341._0_4_ = uVar1;
              auVar341._8_4_ = uVar1;
              auVar341._12_4_ = uVar1;
              auVar341._16_4_ = uVar1;
              auVar341._20_4_ = uVar1;
              auVar341._24_4_ = uVar1;
              auVar341._28_4_ = uVar1;
              auVar320 = vmaxps_avx(auVar320,auVar230);
              auVar229 = vminps_avx(auVar341,auVar320);
              break;
            case 4:
              auVar231._0_8_ = auVar310._0_8_ ^ 0x8000000080000000;
              auVar231._8_4_ = -fVar311;
              auVar231._12_4_ = -fVar312;
              auVar231._16_4_ = -fVar313;
              auVar231._20_4_ = -fVar314;
              auVar231._24_4_ = -fVar315;
              auVar231._28_4_ = -auVar310._28_4_;
              auVar320 = vminps_avx(auVar231,auVar204);
              auVar192 = vmaxps_avx(auVar61,auVar320);
              auVar307._0_4_ = fVar209 * auVar192._0_4_ + fVar99;
              auVar307._4_4_ = fVar239 * auVar192._4_4_ + fVar100;
              auVar307._8_4_ = fVar240 * auVar192._8_4_ + fVar103;
              auVar307._12_4_ = fVar241 * auVar192._12_4_ + fVar158;
              auVar307._16_4_ = fVar242 * auVar192._16_4_ + fVar161;
              auVar307._20_4_ = fVar243 * auVar192._20_4_ + fVar343;
              auVar307._24_4_ = fVar244 * auVar192._24_4_ + fVar348;
              auVar307._28_4_ = auVar310._28_4_ + fVar11;
              auVar204 = vroundps_avx(auVar307,1);
              auVar320 = vcmpps_avx(auVar307,auVar204,1);
              auVar320 = vandps_avx(auVar320,auVar86);
              auVar320 = vsubps_avx(auVar204,auVar320);
              fVar209 = auVar320._0_4_ * -0.6931472 + auVar192._0_4_;
              fVar239 = auVar320._4_4_ * -0.6931472 + auVar192._4_4_;
              fVar240 = auVar320._8_4_ * -0.6931472 + auVar192._8_4_;
              fVar241 = auVar320._12_4_ * -0.6931472 + auVar192._12_4_;
              fVar242 = auVar320._16_4_ * -0.6931472 + auVar192._16_4_;
              fVar243 = auVar320._20_4_ * -0.6931472 + auVar192._20_4_;
              fVar244 = auVar320._24_4_ * -0.6931472 + auVar192._24_4_;
              auVar214._0_4_ = (int)auVar320._0_4_;
              auVar214._4_4_ = (int)auVar320._4_4_;
              auVar214._8_4_ = (int)auVar320._8_4_;
              auVar214._12_4_ = (int)auVar320._12_4_;
              auVar232._16_4_ = (int)auVar320._16_4_;
              auVar232._0_16_ = auVar214;
              auVar232._20_4_ = (int)auVar320._20_4_;
              auVar232._24_4_ = (int)auVar320._24_4_;
              auVar232._28_4_ = (int)auVar320._28_4_;
              auVar210 = vpslld_avx(auVar214,0x17);
              auVar104 = vpslld_avx(auVar232._16_16_,0x17);
              auVar107._8_4_ = 0x3f800000;
              auVar107._0_8_ = 0x3f8000003f800000;
              auVar107._12_4_ = 0x3f800000;
              auVar104 = vpaddd_avx(auVar104,auVar107);
              auVar210 = vpaddd_avx(auVar210,auVar107);
              auVar90._0_4_ =
                   (fVar209 + fVar98 +
                   fVar209 * fVar209 *
                   ((fVar316 +
                    ((fVar298 + (fVar290 + fVar281 * fVar209) * fVar209) * fVar209 + fVar56) *
                    fVar209) * fVar209 + fVar99)) * auVar210._0_4_ + fVar98;
              auVar90._4_4_ =
                   (fVar239 + fVar97 +
                   fVar239 * fVar239 *
                   ((fVar322 +
                    ((fVar300 + (fVar292 + fVar284 * fVar239) * fVar239) * fVar239 + fVar62) *
                    fVar239) * fVar239 + fVar100)) * auVar210._4_4_ + fVar97;
              auVar90._8_4_ =
                   (fVar240 + fVar101 +
                   fVar240 * fVar240 *
                   ((fVar323 +
                    ((fVar301 + (fVar293 + fVar285 * fVar240) * fVar240) * fVar240 + fVar102) *
                    fVar240) * fVar240 + fVar103)) * auVar210._8_4_ + fVar101;
              auVar90._12_4_ =
                   (fVar241 + fVar160 +
                   fVar241 * fVar241 *
                   ((fVar324 +
                    ((fVar302 + (fVar294 + fVar286 * fVar241) * fVar241) * fVar241 + fVar159) *
                    fVar241) * fVar241 + fVar158)) * auVar210._12_4_ + fVar160;
              auVar90._16_4_ =
                   (fVar242 + fVar163 +
                   fVar242 * fVar242 *
                   ((fVar325 +
                    ((fVar303 + (fVar295 + fVar287 * fVar242) * fVar242) * fVar242 + fVar162) *
                    fVar242) * fVar242 + fVar161)) * auVar104._0_4_ + fVar163;
              auVar90._20_4_ =
                   (fVar243 + fVar345 +
                   fVar243 * fVar243 *
                   ((fVar326 +
                    ((fVar304 + (fVar296 + fVar288 * fVar243) * fVar243) * fVar243 + fVar344) *
                    fVar243) * fVar243 + fVar343)) * auVar104._4_4_ + fVar345;
              auVar90._24_4_ =
                   (fVar244 + fVar346 +
                   fVar244 * fVar244 *
                   ((fVar327 +
                    ((fVar305 + (fVar297 + fVar289 * fVar244) * fVar244) * fVar244 + fVar347) *
                    fVar244) * fVar244 + fVar348)) * auVar104._8_4_ + fVar346;
              auVar90._28_4_ =
                   auVar204._28_4_ + auVar192._28_4_ + fVar12 +
                   auVar321._28_4_ +
                   auVar299._28_4_ + auVar291._28_4_ + -0.6931472 + auVar207._28_4_ + fVar11 +
                   fVar12;
              auVar320 = vrcpps_avx(auVar90);
              fVar56 = auVar320._0_4_;
              fVar98 = auVar320._4_4_;
              auVar28._4_4_ = auVar90._4_4_ * fVar98;
              auVar28._0_4_ = auVar90._0_4_ * fVar56;
              fVar99 = auVar320._8_4_;
              auVar28._8_4_ = auVar90._8_4_ * fVar99;
              fVar62 = auVar320._12_4_;
              auVar28._12_4_ = auVar90._12_4_ * fVar62;
              fVar97 = auVar320._16_4_;
              auVar28._16_4_ = auVar90._16_4_ * fVar97;
              fVar100 = auVar320._20_4_;
              auVar28._20_4_ = auVar90._20_4_ * fVar100;
              fVar101 = auVar320._24_4_;
              auVar28._24_4_ = auVar90._24_4_ * fVar101;
              auVar28._28_4_ = auVar90._28_4_;
              auVar192 = vsubps_avx(auVar86,auVar28);
              auVar229._0_4_ = fVar56 + fVar56 * auVar192._0_4_;
              auVar229._4_4_ = fVar98 + fVar98 * auVar192._4_4_;
              auVar229._8_4_ = fVar99 + fVar99 * auVar192._8_4_;
              auVar229._12_4_ = fVar62 + fVar62 * auVar192._12_4_;
              auVar229._16_4_ = fVar97 + fVar97 * auVar192._16_4_;
              auVar229._20_4_ = fVar100 + fVar100 * auVar192._20_4_;
              auVar229._24_4_ = fVar101 + fVar101 * auVar192._24_4_;
              auVar229._28_4_ = auVar320._28_4_ + auVar192._28_4_;
              break;
            case 5:
              auVar320 = vminps_avx(auVar320,auVar204);
              auVar192 = vmaxps_avx(auVar61,auVar320);
              auVar228._0_4_ = fVar209 * auVar192._0_4_ + fVar99;
              auVar228._4_4_ = fVar239 * auVar192._4_4_ + fVar100;
              auVar228._8_4_ = fVar240 * auVar192._8_4_ + fVar103;
              auVar228._12_4_ = fVar241 * auVar192._12_4_ + fVar158;
              auVar228._16_4_ = fVar242 * auVar192._16_4_ + fVar161;
              auVar228._20_4_ = fVar243 * auVar192._20_4_ + fVar343;
              auVar228._24_4_ = fVar244 * auVar192._24_4_ + fVar348;
              auVar228._28_4_ = auVar229._28_4_ + fVar11;
              auVar147 = vroundps_avx(auVar228,1);
              auVar320 = vcmpps_avx(auVar228,auVar147,1);
              auVar320 = vandps_avx(auVar320,auVar86);
              auVar320 = vsubps_avx(auVar147,auVar320);
              auVar24._4_4_ = auVar320._4_4_ * 0.6931472;
              auVar24._0_4_ = auVar320._0_4_ * 0.6931472;
              auVar24._8_4_ = auVar320._8_4_ * 0.6931472;
              auVar24._12_4_ = auVar320._12_4_ * 0.6931472;
              auVar24._16_4_ = auVar320._16_4_ * 0.6931472;
              auVar24._20_4_ = auVar320._20_4_ * 0.6931472;
              auVar24._24_4_ = auVar320._24_4_ * 0.6931472;
              auVar24._28_4_ = auVar147._28_4_;
              auVar192 = vsubps_avx(auVar192,auVar24);
              fVar13 = auVar192._0_4_;
              fVar14 = auVar192._4_4_;
              fVar15 = auVar192._8_4_;
              fVar16 = auVar192._12_4_;
              fVar17 = auVar192._16_4_;
              fVar18 = auVar192._20_4_;
              fVar19 = auVar192._24_4_;
              auVar105._0_4_ = (int)auVar320._0_4_;
              auVar105._4_4_ = (int)auVar320._4_4_;
              auVar105._8_4_ = (int)auVar320._8_4_;
              auVar105._12_4_ = (int)auVar320._12_4_;
              auVar148._16_4_ = (int)auVar320._16_4_;
              auVar148._0_16_ = auVar105;
              auVar148._20_4_ = (int)auVar320._20_4_;
              auVar148._24_4_ = (int)auVar320._24_4_;
              auVar148._28_4_ = (int)auVar320._28_4_;
              auVar210 = vpslld_avx(auVar105,0x17);
              auVar104 = vpslld_avx(auVar148._16_16_,0x17);
              auVar164._8_4_ = 0x3f800000;
              auVar164._0_8_ = 0x3f8000003f800000;
              auVar164._12_4_ = 0x3f800000;
              auVar104 = vpaddd_avx(auVar104,auVar164);
              auVar210 = vpaddd_avx(auVar210,auVar164);
              auVar149._0_4_ =
                   (fVar13 + fVar98 +
                   fVar13 * fVar13 *
                   ((fVar316 +
                    ((fVar298 + (fVar290 + fVar281 * fVar13) * fVar13) * fVar13 + fVar56) * fVar13)
                    * fVar13 + fVar99)) * auVar210._0_4_ + fVar98;
              auVar149._4_4_ =
                   (fVar14 + fVar97 +
                   fVar14 * fVar14 *
                   ((fVar322 +
                    ((fVar300 + (fVar292 + fVar284 * fVar14) * fVar14) * fVar14 + fVar62) * fVar14)
                    * fVar14 + fVar100)) * auVar210._4_4_ + fVar97;
              auVar149._8_4_ =
                   (fVar15 + fVar101 +
                   fVar15 * fVar15 *
                   ((fVar323 +
                    ((fVar301 + (fVar293 + fVar285 * fVar15) * fVar15) * fVar15 + fVar102) * fVar15)
                    * fVar15 + fVar103)) * auVar210._8_4_ + fVar101;
              auVar149._12_4_ =
                   (fVar16 + fVar160 +
                   fVar16 * fVar16 *
                   ((fVar324 +
                    ((fVar302 + (fVar294 + fVar286 * fVar16) * fVar16) * fVar16 + fVar159) * fVar16)
                    * fVar16 + fVar158)) * auVar210._12_4_ + fVar160;
              auVar149._16_4_ =
                   (fVar17 + fVar163 +
                   fVar17 * fVar17 *
                   ((fVar325 +
                    ((fVar303 + (fVar295 + fVar287 * fVar17) * fVar17) * fVar17 + fVar162) * fVar17)
                    * fVar17 + fVar161)) * auVar104._0_4_ + fVar163;
              auVar149._20_4_ =
                   (fVar18 + fVar345 +
                   fVar18 * fVar18 *
                   ((fVar326 +
                    ((fVar304 + (fVar296 + fVar288 * fVar18) * fVar18) * fVar18 + fVar344) * fVar18)
                    * fVar18 + fVar343)) * auVar104._4_4_ + fVar345;
              auVar149._24_4_ =
                   (fVar19 + fVar346 +
                   fVar19 * fVar19 *
                   ((fVar327 +
                    ((fVar305 + (fVar297 + fVar289 * fVar19) * fVar19) * fVar19 + fVar347) * fVar19)
                    * fVar19 + fVar348)) * auVar104._8_4_ + fVar346;
              auVar149._28_4_ =
                   auVar192._28_4_ + fVar12 +
                   auVar321._28_4_ + auVar299._28_4_ + auVar291._28_4_ + 0.6931472 + auVar207._28_4_
                   + fVar11 + fVar12;
              auVar87._8_4_ = 0x800000;
              auVar87._0_8_ = 0x80000000800000;
              auVar87._12_4_ = 0x800000;
              auVar87._16_4_ = 0x800000;
              auVar87._20_4_ = 0x800000;
              auVar87._24_4_ = 0x800000;
              auVar87._28_4_ = 0x800000;
              auVar86 = vmaxps_avx(auVar149,auVar87);
              auVar104 = vpsrld_avx(auVar86._16_16_,0x17);
              auVar193._8_4_ = 0x807fffff;
              auVar193._0_8_ = 0x807fffff807fffff;
              auVar193._12_4_ = 0x807fffff;
              auVar193._16_4_ = 0x807fffff;
              auVar193._20_4_ = 0x807fffff;
              auVar193._24_4_ = 0x807fffff;
              auVar193._28_4_ = 0x807fffff;
              auVar320 = vandps_avx(auVar86,auVar193);
              auVar147 = vorps_avx(auVar320,auVar309._0_32_);
              auVar194._8_4_ = 0x3f3504f3;
              auVar194._0_8_ = 0x3f3504f33f3504f3;
              auVar194._12_4_ = 0x3f3504f3;
              auVar194._16_4_ = 0x3f3504f3;
              auVar194._20_4_ = 0x3f3504f3;
              auVar194._24_4_ = 0x3f3504f3;
              auVar194._28_4_ = 0x3f3504f3;
              auVar192 = vcmpps_avx(auVar194,auVar147,2);
              auVar320 = vandnps_avx(auVar192,auVar147);
              fVar98 = auVar147._0_4_ + -1.0 + auVar320._0_4_;
              fVar97 = auVar147._4_4_ + -1.0 + auVar320._4_4_;
              fVar101 = auVar147._8_4_ + -1.0 + auVar320._8_4_;
              fVar160 = auVar147._12_4_ + -1.0 + auVar320._12_4_;
              fVar163 = auVar147._16_4_ + -1.0 + auVar320._16_4_;
              fVar345 = auVar147._20_4_ + -1.0 + auVar320._20_4_;
              fVar346 = auVar147._24_4_ + -1.0 + auVar320._24_4_;
              auVar104 = vpsubd_avx(auVar104,auVar192._16_16_);
              auVar273 = ZEXT3264(auVar204);
              auVar278 = ZEXT3264(auVar61);
              auVar280 = ZEXT3264(auVar280._0_32_);
              auVar283 = ZEXT3264(auVar283._0_32_);
              auVar291 = ZEXT3264(auVar291._0_32_);
              auVar299 = ZEXT3264(auVar299._0_32_);
              auVar207 = ZEXT3264(auVar207._0_32_);
              auVar309 = ZEXT3264(auVar309._0_32_);
              auVar321 = ZEXT3264(auVar321._0_32_);
              auVar205._8_4_ = 0x3f800000;
              auVar205._0_8_ = 0x3f8000003f800000;
              auVar205._12_4_ = 0x3f800000;
              auVar205._16_4_ = 0x3f800000;
              auVar205._20_4_ = 0x3f800000;
              auVar205._24_4_ = 0x3f800000;
              auVar205._28_4_ = 0x3f800000;
              auVar208 = ZEXT3264(auVar205);
              auVar210 = vpsrld_avx(auVar86._0_16_,0x17);
              auVar212._8_4_ = 0xffffff81;
              auVar212._0_8_ = 0xffffff81ffffff81;
              auVar212._12_4_ = 0xffffff81;
              auVar104 = vpaddd_avx(auVar104,auVar212);
              auVar210 = vpsubd_avx(auVar210,auVar192._0_16_);
              auVar210 = vpaddd_avx(auVar210,auVar212);
              auVar88._16_16_ = auVar104;
              auVar88._0_16_ = auVar210;
              auVar192 = vcmpps_avx(auVar149,_DAT_004d5ba0,2);
              auVar86 = vcvtdq2ps_avx(auVar88);
              auVar25._4_4_ =
                   (fVar97 + auVar86._4_4_ * 0.6931472 +
                   fVar97 * fVar97 *
                   (fVar97 * (fVar97 * (fVar97 * (fVar97 * (fVar97 * (fVar97 * (fVar97 * (fVar97 * (
                                                  fVar97 * 0.070376836 + -0.1151461) + 0.116769984)
                                                  + -0.12420141) + 0.14249323) + -0.16668057) +
                                                 0.20000714) + -0.24999994) + 0.3333333) + -0.5)) *
                   -2.0;
              auVar25._0_4_ =
                   (fVar98 + auVar86._0_4_ * 0.6931472 +
                   fVar98 * fVar98 *
                   (fVar98 * (fVar98 * (fVar98 * (fVar98 * (fVar98 * (fVar98 * (fVar98 * (fVar98 * (
                                                  fVar98 * 0.070376836 + -0.1151461) + 0.116769984)
                                                  + -0.12420141) + 0.14249323) + -0.16668057) +
                                                 0.20000714) + -0.24999994) + 0.3333333) + -0.5)) *
                   -2.0;
              auVar25._8_4_ =
                   (fVar101 + auVar86._8_4_ * 0.6931472 +
                   fVar101 * fVar101 *
                   (fVar101 * (fVar101 * (fVar101 * (fVar101 * (fVar101 * (fVar101 * (fVar101 * (
                                                  fVar101 * (fVar101 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar25._12_4_ =
                   (fVar160 + auVar86._12_4_ * 0.6931472 +
                   fVar160 * fVar160 *
                   (fVar160 * (fVar160 * (fVar160 * (fVar160 * (fVar160 * (fVar160 * (fVar160 * (
                                                  fVar160 * (fVar160 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar25._16_4_ =
                   (fVar163 + auVar86._16_4_ * 0.6931472 +
                   fVar163 * fVar163 *
                   (fVar163 * (fVar163 * (fVar163 * (fVar163 * (fVar163 * (fVar163 * (fVar163 * (
                                                  fVar163 * (fVar163 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar25._20_4_ =
                   (fVar345 + auVar86._20_4_ * 0.6931472 +
                   fVar345 * fVar345 *
                   (fVar345 * (fVar345 * (fVar345 * (fVar345 * (fVar345 * (fVar345 * (fVar345 * (
                                                  fVar345 * (fVar345 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar25._24_4_ =
                   (fVar346 + auVar86._24_4_ * 0.6931472 +
                   fVar346 * fVar346 *
                   (fVar346 * (fVar346 * (fVar346 * (fVar346 * (fVar346 * (fVar346 * (fVar346 * (
                                                  fVar346 * (fVar346 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar25._28_4_ = auVar147._28_4_ + -1.0 + auVar320._28_4_ + auVar86._28_4_ + 0.0;
              auVar150._8_4_ = 0x7fffffff;
              auVar150._0_8_ = 0x7fffffff7fffffff;
              auVar150._12_4_ = 0x7fffffff;
              auVar150._16_4_ = 0x7fffffff;
              auVar150._20_4_ = 0x7fffffff;
              auVar150._24_4_ = 0x7fffffff;
              auVar150._28_4_ = 0x7fffffff;
              auVar320 = vblendvps_avx(auVar25,auVar150,auVar192);
              auVar320 = vminps_avx(auVar320,auVar204);
              auVar192 = vmaxps_avx(auVar61,auVar320);
              auVar151._0_4_ = fVar209 * auVar192._0_4_ + fVar99;
              auVar151._4_4_ = fVar239 * auVar192._4_4_ + fVar100;
              auVar151._8_4_ = fVar240 * auVar192._8_4_ + fVar103;
              auVar151._12_4_ = fVar241 * auVar192._12_4_ + fVar158;
              auVar151._16_4_ = fVar242 * auVar192._16_4_ + fVar161;
              auVar151._20_4_ = fVar243 * auVar192._20_4_ + fVar343;
              auVar151._24_4_ = fVar244 * auVar192._24_4_ + fVar348;
              auVar151._28_4_ = fVar11 + NAN;
              auVar86 = vroundps_avx(auVar151,1);
              auVar320 = vcmpps_avx(auVar151,auVar86,1);
              auVar320 = vandps_avx(auVar320,auVar205);
              auVar320 = vsubps_avx(auVar86,auVar320);
              auVar26._4_4_ = auVar320._4_4_ * 0.6931472;
              auVar26._0_4_ = auVar320._0_4_ * 0.6931472;
              auVar26._8_4_ = auVar320._8_4_ * 0.6931472;
              auVar26._12_4_ = auVar320._12_4_ * 0.6931472;
              auVar26._16_4_ = auVar320._16_4_ * 0.6931472;
              auVar26._20_4_ = auVar320._20_4_ * 0.6931472;
              auVar26._24_4_ = auVar320._24_4_ * 0.6931472;
              auVar26._28_4_ = auVar86._28_4_;
              auVar192 = vsubps_avx(auVar192,auVar26);
              fVar98 = auVar192._0_4_;
              fVar97 = auVar192._4_4_;
              fVar101 = auVar192._8_4_;
              fVar160 = auVar192._12_4_;
              fVar163 = auVar192._16_4_;
              fVar345 = auVar192._20_4_;
              fVar346 = auVar192._24_4_;
              auVar106._0_4_ = (int)auVar320._0_4_;
              auVar106._4_4_ = (int)auVar320._4_4_;
              auVar106._8_4_ = (int)auVar320._8_4_;
              auVar106._12_4_ = (int)auVar320._12_4_;
              auVar152._16_4_ = (int)auVar320._16_4_;
              auVar152._0_16_ = auVar106;
              auVar152._20_4_ = (int)auVar320._20_4_;
              auVar152._24_4_ = (int)auVar320._24_4_;
              auVar152._28_4_ = (int)auVar320._28_4_;
              auVar210 = vpslld_avx(auVar106,0x17);
              auVar104 = vpslld_avx(auVar152._16_16_,0x17);
              auVar213._8_4_ = 0x3f800000;
              auVar213._0_8_ = 0x3f8000003f800000;
              auVar213._12_4_ = 0x3f800000;
              auVar104 = vpaddd_avx(auVar104,auVar213);
              auVar210 = vpaddd_avx(auVar210,auVar213);
              auVar89._0_4_ =
                   (fVar98 + 1.0 +
                   fVar98 * fVar98 *
                   ((fVar316 +
                    ((fVar298 + (fVar290 + fVar281 * fVar98) * fVar98) * fVar98 + fVar56) * fVar98)
                    * fVar98 + fVar99)) * auVar210._0_4_ + 1.0;
              auVar89._4_4_ =
                   (fVar97 + 1.0 +
                   fVar97 * fVar97 *
                   ((fVar322 +
                    ((fVar300 + (fVar292 + fVar284 * fVar97) * fVar97) * fVar97 + fVar62) * fVar97)
                    * fVar97 + fVar100)) * auVar210._4_4_ + 1.0;
              auVar89._8_4_ =
                   (fVar101 + 1.0 +
                   fVar101 * fVar101 *
                   ((fVar323 +
                    ((fVar301 + (fVar293 + fVar285 * fVar101) * fVar101) * fVar101 + fVar102) *
                    fVar101) * fVar101 + fVar103)) * auVar210._8_4_ + 1.0;
              auVar89._12_4_ =
                   (fVar160 + 1.0 +
                   fVar160 * fVar160 *
                   ((fVar324 +
                    ((fVar302 + (fVar294 + fVar286 * fVar160) * fVar160) * fVar160 + fVar159) *
                    fVar160) * fVar160 + fVar158)) * auVar210._12_4_ + 1.0;
              auVar89._16_4_ =
                   (fVar163 + 1.0 +
                   fVar163 * fVar163 *
                   ((fVar325 +
                    ((fVar303 + (fVar295 + fVar287 * fVar163) * fVar163) * fVar163 + fVar162) *
                    fVar163) * fVar163 + fVar161)) * auVar104._0_4_ + 1.0;
              auVar89._20_4_ =
                   (fVar345 + 1.0 +
                   fVar345 * fVar345 *
                   ((fVar326 +
                    ((fVar304 + (fVar296 + fVar288 * fVar345) * fVar345) * fVar345 + fVar344) *
                    fVar345) * fVar345 + fVar343)) * auVar104._4_4_ + 1.0;
              auVar89._24_4_ =
                   (fVar346 + 1.0 +
                   fVar346 * fVar346 *
                   ((fVar327 +
                    ((fVar305 + (fVar297 + fVar289 * fVar346) * fVar346) * fVar346 + fVar347) *
                    fVar346) * fVar346 + fVar348)) * auVar104._8_4_ + 1.0;
              auVar89._28_4_ = auVar192._28_4_ + 1.0 + auVar86._28_4_ + 1.0;
              auVar320 = vrcpps_avx(auVar89);
              fVar56 = auVar320._0_4_;
              fVar98 = auVar320._4_4_;
              fVar99 = auVar320._8_4_;
              fVar62 = auVar320._12_4_;
              fVar97 = auVar320._16_4_;
              fVar100 = auVar320._20_4_;
              fVar101 = auVar320._24_4_;
              auVar27._4_4_ = auVar89._4_4_ * (fVar98 + fVar98);
              auVar27._0_4_ = auVar89._0_4_ * (fVar56 + fVar56);
              auVar27._8_4_ = auVar89._8_4_ * (fVar99 + fVar99);
              auVar27._12_4_ = auVar89._12_4_ * (fVar62 + fVar62);
              auVar27._16_4_ = auVar89._16_4_ * (fVar97 + fVar97);
              auVar27._20_4_ = auVar89._20_4_ * (fVar100 + fVar100);
              auVar27._24_4_ = auVar89._24_4_ * (fVar101 + fVar101);
              auVar27._28_4_ = auVar89._28_4_;
              auVar229._8_4_ = 2.0;
              auVar229._0_8_ = 0x4000000040000000;
              auVar229._12_4_ = 2.0;
              auVar229._16_4_ = 2.0;
              auVar229._20_4_ = 2.0;
              auVar229._24_4_ = 2.0;
              auVar229._28_4_ = 2.0;
              auVar320 = vsubps_avx(auVar229,auVar27);
              auVar282 = ZEXT464(0) << 0x20;
              auVar78._0_4_ = fVar56 + fVar56 + -1.0 + fVar56 * auVar320._0_4_;
              auVar78._4_4_ = fVar98 + fVar98 + -1.0 + fVar98 * auVar320._4_4_;
              auVar78._8_4_ = fVar99 + fVar99 + -1.0 + fVar99 * auVar320._8_4_;
              auVar78._12_4_ = fVar62 + fVar62 + -1.0 + fVar62 * auVar320._12_4_;
              auVar78._16_4_ = fVar97 + fVar97 + -1.0 + fVar97 * auVar320._16_4_;
              auVar78._20_4_ = fVar100 + fVar100 + -1.0 + fVar100 * auVar320._20_4_;
              auVar78._24_4_ = fVar101 + fVar101 + -1.0 + fVar101 * auVar320._24_4_;
              goto LAB_004b82c2;
            case 6:
              fVar56 = **(float **)(&this->field_0xf8 + (long)p_Var4);
              fVar98 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
              auVar91._0_4_ = auVar310._0_4_ * fVar56 + fVar98;
              auVar91._4_4_ = auVar310._4_4_ * fVar56 + fVar98;
              auVar91._8_4_ = fVar311 * fVar56 + fVar98;
              auVar91._12_4_ = fVar312 * fVar56 + fVar98;
              auVar91._16_4_ = fVar313 * fVar56 + fVar98;
              auVar91._20_4_ = fVar314 * fVar56 + fVar98;
              auVar91._24_4_ = fVar315 * fVar56 + fVar98;
              auVar91._28_4_ = fVar56 + fVar98;
              auVar320 = vmaxps_avx(auVar91,auVar192);
              auVar320 = vminps_avx(auVar320,auVar86);
              auVar78 = auVar320._0_28_;
LAB_004b82c2:
              auVar36._4_4_ = auVar310._4_4_ * auVar78._4_4_;
              auVar36._0_4_ = auVar310._0_4_ * auVar78._0_4_;
              auVar36._8_4_ = fVar311 * auVar78._8_4_;
              auVar36._12_4_ = fVar312 * auVar78._12_4_;
              auVar36._16_4_ = fVar313 * auVar78._16_4_;
              auVar36._20_4_ = fVar314 * auVar78._20_4_;
              auVar36._24_4_ = fVar315 * auVar78._24_4_;
              auVar36._28_4_ = auVar229._28_4_;
              auVar229 = auVar36;
            }
switchD_004b7e65_caseD_1:
            *pauVar47 = auVar229;
            pauVar47 = pauVar47 + 1;
          }
        }
      }
      if ((iVar2 == 4) && (_elempack == 8)) {
        uVar42 = 0;
        if (0 < iVar38) {
          uVar42 = (ulong)(uint)iVar38;
        }
        pvVar41 = (void *)0x0;
        if (0 < iVar51) {
          pvVar41 = pvVar39;
        }
        auVar208 = ZEXT3264(CONCAT428(0x42b0c0a5,
                                      CONCAT424(0x42b0c0a5,
                                                CONCAT420(0x42b0c0a5,
                                                          CONCAT416(0x42b0c0a5,
                                                                    CONCAT412(0x42b0c0a5,
                                                                              CONCAT48(0x42b0c0a5,
                                                                                                                                                                              
                                                  0x42b0c0a542b0c0a5)))))));
        auVar273 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                      CONCAT424(0xc2b0c0a5,
                                                CONCAT420(0xc2b0c0a5,
                                                          CONCAT416(0xc2b0c0a5,
                                                                    CONCAT412(0xc2b0c0a5,
                                                                              CONCAT48(0xc2b0c0a5,
                                                                                                                                                                              
                                                  0xc2b0c0a5c2b0c0a5)))))));
        auVar278 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                      CONCAT424(0x3fb8aa3b,
                                                CONCAT420(0x3fb8aa3b,
                                                          CONCAT416(0x3fb8aa3b,
                                                                    CONCAT412(0x3fb8aa3b,
                                                                              CONCAT48(0x3fb8aa3b,
                                                                                                                                                                              
                                                  0x3fb8aa3b3fb8aa3b)))))));
        auVar282 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar309 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar280 = ZEXT3264(CONCAT428(0x39506967,
                                      CONCAT424(0x39506967,
                                                CONCAT420(0x39506967,
                                                          CONCAT416(0x39506967,
                                                                    CONCAT412(0x39506967,
                                                                              CONCAT48(0x39506967,
                                                                                                                                                                              
                                                  0x3950696739506967)))))));
        auVar283 = ZEXT3264(CONCAT428(0x3ab743ce,
                                      CONCAT424(0x3ab743ce,
                                                CONCAT420(0x3ab743ce,
                                                          CONCAT416(0x3ab743ce,
                                                                    CONCAT412(0x3ab743ce,
                                                                              CONCAT48(0x3ab743ce,
                                                                                                                                                                              
                                                  0x3ab743ce3ab743ce)))))));
        auVar291 = ZEXT3264(CONCAT428(0x3c088908,
                                      CONCAT424(0x3c088908,
                                                CONCAT420(0x3c088908,
                                                          CONCAT416(0x3c088908,
                                                                    CONCAT412(0x3c088908,
                                                                              CONCAT48(0x3c088908,
                                                                                                                                                                              
                                                  0x3c0889083c088908)))))));
        auVar207 = ZEXT3264(CONCAT428(0x3d2aa9c1,
                                      CONCAT424(0x3d2aa9c1,
                                                CONCAT420(0x3d2aa9c1,
                                                          CONCAT416(0x3d2aa9c1,
                                                                    CONCAT412(0x3d2aa9c1,
                                                                              CONCAT48(0x3d2aa9c1,
                                                                                                                                                                              
                                                  0x3d2aa9c13d2aa9c1)))))));
        auVar299 = ZEXT3264(CONCAT428(0x3e2aaaaa,
                                      CONCAT424(0x3e2aaaaa,
                                                CONCAT420(0x3e2aaaaa,
                                                          CONCAT416(0x3e2aaaaa,
                                                                    CONCAT412(0x3e2aaaaa,
                                                                              CONCAT48(0x3e2aaaaa,
                                                                                                                                                                              
                                                  0x3e2aaaaa3e2aaaaa)))))));
        auVar321 = ZEXT1664(ZEXT816(0) << 0x40);
        for (pvVar45 = (void *)0x0; pvVar45 != pvVar41; pvVar45 = (void *)((long)pvVar45 + 1)) {
          pauVar47 = (undefined1 (*) [32])
                     ((long)top_blob->w * (long)pvVar45 * top_blob->elemsize + (long)top_blob->data)
          ;
          pp_Var5 = this->_vptr_Convolution1D_x86_avx;
          for (iVar50 = 0; iVar50 <= iVar52; iVar50 = iVar50 + 1) {
            p_Var4 = pp_Var5[-3];
            if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
              auVar310 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar310 = ZEXT3264(*(undefined1 (*) [32])
                                   (*(long *)(&this->field_0x190 + (long)p_Var4) +
                                   (long)pvVar45 * 0x20));
            }
            pfVar53 = (float *)((this->weight_data_packed).cstep * (long)pvVar45 *
                                (this->weight_data_packed).elemsize +
                               (long)(this->weight_data_packed).data);
            for (uVar44 = 0; uVar44 != uVar42; uVar44 = uVar44 + 1) {
              p_Var6 = this->_vptr_Convolution1D_x86_avx[-3];
              pfVar49 = (float *)((long)(_func_int ***)local_98.data +
                                 (long)(*(int *)(&this->field_0xdc + (long)p_Var6) * iVar50 * 4) * 4
                                 + (long)local_98.w * local_98.elemsize * uVar44);
              iVar46 = *(int *)(&this->field_0xd4 + (long)p_Var6);
              if (iVar46 < 1) {
                iVar46 = 0;
              }
              while (bVar55 = iVar46 != 0, iVar46 = iVar46 + -1, bVar55) {
                fVar56 = *pfVar49;
                fVar98 = pfVar49[1];
                fVar99 = pfVar49[2];
                fVar62 = pfVar49[3];
                auVar310 = ZEXT3264(CONCAT428(auVar310._28_4_ + fVar56 + fVar98 + fVar99 +
                                              fVar98 + fVar99,
                                              CONCAT424(auVar310._24_4_ + fVar56 * pfVar53[6] +
                                                        fVar98 * pfVar53[0xe] +
                                                        fVar99 * pfVar53[0x16] +
                                                        fVar62 * pfVar53[0x1e],
                                                        CONCAT420(auVar310._20_4_ +
                                                                  fVar56 * pfVar53[5] +
                                                                  fVar98 * pfVar53[0xd] +
                                                                  fVar99 * pfVar53[0x15] +
                                                                  fVar62 * pfVar53[0x1d],
                                                                  CONCAT416(auVar310._16_4_ +
                                                                            fVar56 * pfVar53[4] +
                                                                            fVar98 * pfVar53[0xc] +
                                                                            fVar99 * pfVar53[0x14] +
                                                                            fVar62 * pfVar53[0x1c],
                                                                            CONCAT412(auVar310.
                                                  _12_4_ + fVar56 * pfVar53[3] +
                                                  fVar98 * pfVar53[0xb] + fVar99 * pfVar53[0x13] +
                                                  fVar62 * pfVar53[0x1b],
                                                  CONCAT48(auVar310._8_4_ + fVar56 * pfVar53[2] +
                                                           fVar98 * pfVar53[10] +
                                                           fVar99 * pfVar53[0x12] +
                                                           fVar62 * pfVar53[0x1a],
                                                           CONCAT44(auVar310._4_4_ +
                                                                    fVar56 * pfVar53[1] +
                                                                    fVar98 * pfVar53[9] +
                                                                    fVar99 * pfVar53[0x11] +
                                                                    fVar62 * pfVar53[0x19],
                                                                    auVar310._0_4_ +
                                                                    fVar56 * *pfVar53 +
                                                                    fVar98 * pfVar53[8] +
                                                                    fVar99 * pfVar53[0x10] +
                                                                    fVar62 * pfVar53[0x18]))))))));
                pfVar49 = pfVar49 + (long)*(int *)(&this->field_0xd8 + (long)p_Var6) * 4;
                pfVar53 = pfVar53 + 0x20;
              }
            }
            auVar320 = auVar310._0_32_;
            auVar235 = auVar320;
            if (5 < *(int *)(&this->field_0xf4 + (long)p_Var4) - 1U) goto switchD_004b84f1_caseD_1;
            auVar61 = auVar321._0_32_;
            auVar235 = vmaxps_avx(auVar320,auVar61);
            fVar311 = auVar310._8_4_;
            fVar312 = auVar310._12_4_;
            fVar313 = auVar310._16_4_;
            fVar314 = auVar310._20_4_;
            fVar315 = auVar310._24_4_;
            fVar209 = auVar278._0_4_;
            fVar239 = auVar278._4_4_;
            fVar240 = auVar278._8_4_;
            fVar241 = auVar278._12_4_;
            fVar242 = auVar278._16_4_;
            fVar243 = auVar278._20_4_;
            fVar244 = auVar278._24_4_;
            auVar192 = auVar309._0_32_;
            fVar281 = auVar280._0_4_;
            fVar284 = auVar280._4_4_;
            fVar285 = auVar280._8_4_;
            fVar286 = auVar280._12_4_;
            fVar287 = auVar280._16_4_;
            fVar288 = auVar280._20_4_;
            fVar289 = auVar280._24_4_;
            fVar290 = auVar283._0_4_;
            fVar292 = auVar283._4_4_;
            fVar293 = auVar283._8_4_;
            fVar294 = auVar283._12_4_;
            fVar295 = auVar283._16_4_;
            fVar296 = auVar283._20_4_;
            fVar297 = auVar283._24_4_;
            fVar298 = auVar291._0_4_;
            fVar300 = auVar291._4_4_;
            fVar301 = auVar291._8_4_;
            fVar302 = auVar291._12_4_;
            fVar303 = auVar291._16_4_;
            fVar304 = auVar291._20_4_;
            fVar305 = auVar291._24_4_;
            fVar316 = auVar299._0_4_;
            fVar322 = auVar299._4_4_;
            fVar323 = auVar299._8_4_;
            fVar324 = auVar299._12_4_;
            fVar325 = auVar299._16_4_;
            fVar326 = auVar299._20_4_;
            fVar327 = auVar299._24_4_;
            auVar86 = auVar208._0_32_;
            auVar204 = auVar273._0_32_;
            fVar100 = auVar282._4_4_;
            fVar103 = auVar282._8_4_;
            fVar160 = auVar282._12_4_;
            fVar163 = auVar282._16_4_;
            fVar344 = auVar282._20_4_;
            fVar346 = auVar282._24_4_;
            fVar11 = auVar282._28_4_;
            fVar99 = auVar207._0_4_;
            fVar97 = auVar207._4_4_;
            fVar102 = auVar207._8_4_;
            fVar159 = auVar207._12_4_;
            fVar162 = auVar207._16_4_;
            fVar343 = auVar207._20_4_;
            fVar347 = auVar207._24_4_;
            fVar62 = auVar309._4_4_;
            fVar101 = auVar309._8_4_;
            fVar158 = auVar309._12_4_;
            fVar161 = auVar309._16_4_;
            fVar345 = auVar309._20_4_;
            fVar348 = auVar309._24_4_;
            fVar12 = auVar309._28_4_;
            fVar98 = auVar309._0_4_;
            fVar56 = auVar282._0_4_;
            switch(*(int *)(&this->field_0xf4 + (long)p_Var4)) {
            case 2:
              auVar320 = vminps_avx(auVar320,auVar61);
              fVar56 = **(float **)(&this->field_0xf8 + (long)p_Var4);
              auVar321 = ZEXT464(0) << 0x20;
              auVar233._0_4_ = fVar56 * auVar320._0_4_ + auVar235._0_4_;
              auVar233._4_4_ = fVar56 * auVar320._4_4_ + auVar235._4_4_;
              auVar233._8_4_ = fVar56 * auVar320._8_4_ + auVar235._8_4_;
              auVar233._12_4_ = fVar56 * auVar320._12_4_ + auVar235._12_4_;
              auVar233._16_4_ = fVar56 * auVar320._16_4_ + auVar235._16_4_;
              auVar233._20_4_ = fVar56 * auVar320._20_4_ + auVar235._20_4_;
              auVar233._24_4_ = fVar56 * auVar320._24_4_ + auVar235._24_4_;
              auVar233._28_4_ = auVar320._28_4_ + auVar235._28_4_;
              auVar235 = auVar233;
              break;
            case 3:
              uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
              auVar236._4_4_ = uVar1;
              auVar236._0_4_ = uVar1;
              auVar236._8_4_ = uVar1;
              auVar236._12_4_ = uVar1;
              auVar236._16_4_ = uVar1;
              auVar236._20_4_ = uVar1;
              auVar236._24_4_ = uVar1;
              auVar236._28_4_ = uVar1;
              uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
              auVar342._4_4_ = uVar1;
              auVar342._0_4_ = uVar1;
              auVar342._8_4_ = uVar1;
              auVar342._12_4_ = uVar1;
              auVar342._16_4_ = uVar1;
              auVar342._20_4_ = uVar1;
              auVar342._24_4_ = uVar1;
              auVar342._28_4_ = uVar1;
              auVar320 = vmaxps_avx(auVar320,auVar236);
              auVar235 = vminps_avx(auVar342,auVar320);
              auVar321 = ZEXT464(0) << 0x20;
              break;
            case 4:
              auVar237._0_8_ = auVar310._0_8_ ^ 0x8000000080000000;
              auVar237._8_4_ = -fVar311;
              auVar237._12_4_ = -fVar312;
              auVar237._16_4_ = -fVar313;
              auVar237._20_4_ = -fVar314;
              auVar237._24_4_ = -fVar315;
              auVar237._28_4_ = -auVar310._28_4_;
              auVar320 = vminps_avx(auVar237,auVar86);
              auVar86 = vmaxps_avx(auVar204,auVar320);
              auVar308._0_4_ = fVar209 * auVar86._0_4_ + fVar56;
              auVar308._4_4_ = fVar239 * auVar86._4_4_ + fVar100;
              auVar308._8_4_ = fVar240 * auVar86._8_4_ + fVar103;
              auVar308._12_4_ = fVar241 * auVar86._12_4_ + fVar160;
              auVar308._16_4_ = fVar242 * auVar86._16_4_ + fVar163;
              auVar308._20_4_ = fVar243 * auVar86._20_4_ + fVar344;
              auVar308._24_4_ = fVar244 * auVar86._24_4_ + fVar346;
              auVar308._28_4_ = auVar310._28_4_ + fVar11;
              auVar204 = vroundps_avx(auVar308,1);
              auVar320 = vcmpps_avx(auVar308,auVar204,1);
              auVar320 = vandps_avx(auVar320,auVar192);
              auVar320 = vsubps_avx(auVar204,auVar320);
              fVar209 = auVar320._0_4_ * -0.6931472 + auVar86._0_4_;
              fVar239 = auVar320._4_4_ * -0.6931472 + auVar86._4_4_;
              fVar240 = auVar320._8_4_ * -0.6931472 + auVar86._8_4_;
              fVar241 = auVar320._12_4_ * -0.6931472 + auVar86._12_4_;
              fVar242 = auVar320._16_4_ * -0.6931472 + auVar86._16_4_;
              fVar243 = auVar320._20_4_ * -0.6931472 + auVar86._20_4_;
              fVar244 = auVar320._24_4_ * -0.6931472 + auVar86._24_4_;
              auVar321 = ZEXT464(0) << 0x20;
              auVar217._0_4_ = (int)auVar320._0_4_;
              auVar217._4_4_ = (int)auVar320._4_4_;
              auVar217._8_4_ = (int)auVar320._8_4_;
              auVar217._12_4_ = (int)auVar320._12_4_;
              auVar238._16_4_ = (int)auVar320._16_4_;
              auVar238._0_16_ = auVar217;
              auVar238._20_4_ = (int)auVar320._20_4_;
              auVar238._24_4_ = (int)auVar320._24_4_;
              auVar238._28_4_ = (int)auVar320._28_4_;
              auVar210 = vpslld_avx(auVar217,0x17);
              auVar104 = vpslld_avx(auVar238._16_16_,0x17);
              auVar110._8_4_ = 0x3f800000;
              auVar110._0_8_ = 0x3f8000003f800000;
              auVar110._12_4_ = 0x3f800000;
              auVar104 = vpaddd_avx(auVar104,auVar110);
              auVar210 = vpaddd_avx(auVar210,auVar110);
              auVar95._0_4_ =
                   (fVar209 + fVar98 +
                   fVar209 * fVar209 *
                   ((fVar316 +
                    ((fVar298 + (fVar290 + fVar281 * fVar209) * fVar209) * fVar209 + fVar99) *
                    fVar209) * fVar209 + fVar56)) * auVar210._0_4_ + fVar98;
              auVar95._4_4_ =
                   (fVar239 + fVar62 +
                   fVar239 * fVar239 *
                   ((fVar322 +
                    ((fVar300 + (fVar292 + fVar284 * fVar239) * fVar239) * fVar239 + fVar97) *
                    fVar239) * fVar239 + fVar100)) * auVar210._4_4_ + fVar62;
              auVar95._8_4_ =
                   (fVar240 + fVar101 +
                   fVar240 * fVar240 *
                   ((fVar323 +
                    ((fVar301 + (fVar293 + fVar285 * fVar240) * fVar240) * fVar240 + fVar102) *
                    fVar240) * fVar240 + fVar103)) * auVar210._8_4_ + fVar101;
              auVar95._12_4_ =
                   (fVar241 + fVar158 +
                   fVar241 * fVar241 *
                   ((fVar324 +
                    ((fVar302 + (fVar294 + fVar286 * fVar241) * fVar241) * fVar241 + fVar159) *
                    fVar241) * fVar241 + fVar160)) * auVar210._12_4_ + fVar158;
              auVar95._16_4_ =
                   (fVar242 + fVar161 +
                   fVar242 * fVar242 *
                   ((fVar325 +
                    ((fVar303 + (fVar295 + fVar287 * fVar242) * fVar242) * fVar242 + fVar162) *
                    fVar242) * fVar242 + fVar163)) * auVar104._0_4_ + fVar161;
              auVar95._20_4_ =
                   (fVar243 + fVar345 +
                   fVar243 * fVar243 *
                   ((fVar326 +
                    ((fVar304 + (fVar296 + fVar288 * fVar243) * fVar243) * fVar243 + fVar343) *
                    fVar243) * fVar243 + fVar344)) * auVar104._4_4_ + fVar345;
              auVar95._24_4_ =
                   (fVar244 + fVar348 +
                   fVar244 * fVar244 *
                   ((fVar327 +
                    ((fVar305 + (fVar297 + fVar289 * fVar244) * fVar244) * fVar244 + fVar347) *
                    fVar244) * fVar244 + fVar346)) * auVar104._8_4_ + fVar348;
              auVar95._28_4_ =
                   auVar204._28_4_ + auVar86._28_4_ + fVar12 +
                   auVar299._28_4_ +
                   auVar291._28_4_ + auVar283._28_4_ + -0.6931472 + auVar207._28_4_ + fVar11 +
                   fVar12;
              auVar320 = vrcpps_avx(auVar95);
              fVar56 = auVar320._0_4_;
              fVar98 = auVar320._4_4_;
              auVar33._4_4_ = auVar95._4_4_ * fVar98;
              auVar33._0_4_ = auVar95._0_4_ * fVar56;
              fVar99 = auVar320._8_4_;
              auVar33._8_4_ = auVar95._8_4_ * fVar99;
              fVar62 = auVar320._12_4_;
              auVar33._12_4_ = auVar95._12_4_ * fVar62;
              fVar97 = auVar320._16_4_;
              auVar33._16_4_ = auVar95._16_4_ * fVar97;
              fVar100 = auVar320._20_4_;
              auVar33._20_4_ = auVar95._20_4_ * fVar100;
              fVar101 = auVar320._24_4_;
              auVar33._24_4_ = auVar95._24_4_ * fVar101;
              auVar33._28_4_ = auVar95._28_4_;
              auVar192 = vsubps_avx(auVar192,auVar33);
              auVar235._0_4_ = fVar56 + fVar56 * auVar192._0_4_;
              auVar235._4_4_ = fVar98 + fVar98 * auVar192._4_4_;
              auVar235._8_4_ = fVar99 + fVar99 * auVar192._8_4_;
              auVar235._12_4_ = fVar62 + fVar62 * auVar192._12_4_;
              auVar235._16_4_ = fVar97 + fVar97 * auVar192._16_4_;
              auVar235._20_4_ = fVar100 + fVar100 * auVar192._20_4_;
              auVar235._24_4_ = fVar101 + fVar101 * auVar192._24_4_;
              auVar235._28_4_ = auVar320._28_4_ + auVar192._28_4_;
              break;
            case 5:
              auVar320 = vminps_avx(auVar320,auVar86);
              auVar61 = vmaxps_avx(auVar204,auVar320);
              auVar234._0_4_ = fVar209 * auVar61._0_4_ + fVar56;
              auVar234._4_4_ = fVar239 * auVar61._4_4_ + fVar100;
              auVar234._8_4_ = fVar240 * auVar61._8_4_ + fVar103;
              auVar234._12_4_ = fVar241 * auVar61._12_4_ + fVar160;
              auVar234._16_4_ = fVar242 * auVar61._16_4_ + fVar163;
              auVar234._20_4_ = fVar243 * auVar61._20_4_ + fVar344;
              auVar234._24_4_ = fVar244 * auVar61._24_4_ + fVar346;
              auVar234._28_4_ = auVar235._28_4_ + fVar11;
              auVar147 = vroundps_avx(auVar234,1);
              auVar320 = vcmpps_avx(auVar234,auVar147,1);
              auVar320 = vandps_avx(auVar320,auVar192);
              auVar320 = vsubps_avx(auVar147,auVar320);
              auVar29._4_4_ = auVar320._4_4_ * 0.6931472;
              auVar29._0_4_ = auVar320._0_4_ * 0.6931472;
              auVar29._8_4_ = auVar320._8_4_ * 0.6931472;
              auVar29._12_4_ = auVar320._12_4_ * 0.6931472;
              auVar29._16_4_ = auVar320._16_4_ * 0.6931472;
              auVar29._20_4_ = auVar320._20_4_ * 0.6931472;
              auVar29._24_4_ = auVar320._24_4_ * 0.6931472;
              auVar29._28_4_ = auVar147._28_4_;
              auVar192 = vsubps_avx(auVar61,auVar29);
              fVar13 = auVar192._0_4_;
              fVar14 = auVar192._4_4_;
              fVar15 = auVar192._8_4_;
              fVar16 = auVar192._12_4_;
              fVar17 = auVar192._16_4_;
              fVar18 = auVar192._20_4_;
              fVar19 = auVar192._24_4_;
              auVar108._0_4_ = (int)auVar320._0_4_;
              auVar108._4_4_ = (int)auVar320._4_4_;
              auVar108._8_4_ = (int)auVar320._8_4_;
              auVar108._12_4_ = (int)auVar320._12_4_;
              auVar153._16_4_ = (int)auVar320._16_4_;
              auVar153._0_16_ = auVar108;
              auVar153._20_4_ = (int)auVar320._20_4_;
              auVar153._24_4_ = (int)auVar320._24_4_;
              auVar153._28_4_ = (int)auVar320._28_4_;
              auVar210 = vpslld_avx(auVar108,0x17);
              auVar104 = vpslld_avx(auVar153._16_16_,0x17);
              auVar165._8_4_ = 0x3f800000;
              auVar165._0_8_ = 0x3f8000003f800000;
              auVar165._12_4_ = 0x3f800000;
              auVar104 = vpaddd_avx(auVar104,auVar165);
              auVar210 = vpaddd_avx(auVar210,auVar165);
              auVar154._0_4_ =
                   (fVar13 + fVar98 +
                   fVar13 * fVar13 *
                   ((fVar316 +
                    ((fVar298 + (fVar290 + fVar281 * fVar13) * fVar13) * fVar13 + fVar99) * fVar13)
                    * fVar13 + fVar56)) * auVar210._0_4_ + fVar98;
              auVar154._4_4_ =
                   (fVar14 + fVar62 +
                   fVar14 * fVar14 *
                   ((fVar322 +
                    ((fVar300 + (fVar292 + fVar284 * fVar14) * fVar14) * fVar14 + fVar97) * fVar14)
                    * fVar14 + fVar100)) * auVar210._4_4_ + fVar62;
              auVar154._8_4_ =
                   (fVar15 + fVar101 +
                   fVar15 * fVar15 *
                   ((fVar323 +
                    ((fVar301 + (fVar293 + fVar285 * fVar15) * fVar15) * fVar15 + fVar102) * fVar15)
                    * fVar15 + fVar103)) * auVar210._8_4_ + fVar101;
              auVar154._12_4_ =
                   (fVar16 + fVar158 +
                   fVar16 * fVar16 *
                   ((fVar324 +
                    ((fVar302 + (fVar294 + fVar286 * fVar16) * fVar16) * fVar16 + fVar159) * fVar16)
                    * fVar16 + fVar160)) * auVar210._12_4_ + fVar158;
              auVar154._16_4_ =
                   (fVar17 + fVar161 +
                   fVar17 * fVar17 *
                   ((fVar325 +
                    ((fVar303 + (fVar295 + fVar287 * fVar17) * fVar17) * fVar17 + fVar162) * fVar17)
                    * fVar17 + fVar163)) * auVar104._0_4_ + fVar161;
              auVar154._20_4_ =
                   (fVar18 + fVar345 +
                   fVar18 * fVar18 *
                   ((fVar326 +
                    ((fVar304 + (fVar296 + fVar288 * fVar18) * fVar18) * fVar18 + fVar343) * fVar18)
                    * fVar18 + fVar344)) * auVar104._4_4_ + fVar345;
              auVar154._24_4_ =
                   (fVar19 + fVar348 +
                   fVar19 * fVar19 *
                   ((fVar327 +
                    ((fVar305 + (fVar297 + fVar289 * fVar19) * fVar19) * fVar19 + fVar347) * fVar19)
                    * fVar19 + fVar346)) * auVar104._8_4_ + fVar348;
              auVar154._28_4_ =
                   auVar192._28_4_ + fVar12 +
                   auVar299._28_4_ + auVar291._28_4_ + auVar283._28_4_ + 0.6931472 + auVar207._28_4_
                   + fVar11 + fVar12;
              auVar92._8_4_ = 0x800000;
              auVar92._0_8_ = 0x80000000800000;
              auVar92._12_4_ = 0x800000;
              auVar92._16_4_ = 0x800000;
              auVar92._20_4_ = 0x800000;
              auVar92._24_4_ = 0x800000;
              auVar92._28_4_ = 0x800000;
              auVar61 = vmaxps_avx(auVar154,auVar92);
              auVar104 = vpsrld_avx(auVar61._16_16_,0x17);
              auVar195._8_4_ = 0x807fffff;
              auVar195._0_8_ = 0x807fffff807fffff;
              auVar195._12_4_ = 0x807fffff;
              auVar195._16_4_ = 0x807fffff;
              auVar195._20_4_ = 0x807fffff;
              auVar195._24_4_ = 0x807fffff;
              auVar195._28_4_ = 0x807fffff;
              auVar320 = vandps_avx(auVar61,auVar195);
              auVar147 = vorps_avx(auVar320,auVar282._0_32_);
              auVar196._8_4_ = 0x3f3504f3;
              auVar196._0_8_ = 0x3f3504f33f3504f3;
              auVar196._12_4_ = 0x3f3504f3;
              auVar196._16_4_ = 0x3f3504f3;
              auVar196._20_4_ = 0x3f3504f3;
              auVar196._24_4_ = 0x3f3504f3;
              auVar196._28_4_ = 0x3f3504f3;
              auVar192 = vcmpps_avx(auVar196,auVar147,2);
              auVar320 = vandnps_avx(auVar192,auVar147);
              fVar98 = auVar147._0_4_ + -1.0 + auVar320._0_4_;
              fVar62 = auVar147._4_4_ + -1.0 + auVar320._4_4_;
              fVar101 = auVar147._8_4_ + -1.0 + auVar320._8_4_;
              fVar158 = auVar147._12_4_ + -1.0 + auVar320._12_4_;
              fVar161 = auVar147._16_4_ + -1.0 + auVar320._16_4_;
              fVar345 = auVar147._20_4_ + -1.0 + auVar320._20_4_;
              fVar348 = auVar147._24_4_ + -1.0 + auVar320._24_4_;
              auVar104 = vpsubd_avx(auVar104,auVar192._16_16_);
              auVar208 = ZEXT3264(auVar86);
              auVar273 = ZEXT3264(auVar204);
              auVar278 = ZEXT3264(auVar278._0_32_);
              auVar280 = ZEXT3264(auVar280._0_32_);
              auVar283 = ZEXT3264(auVar283._0_32_);
              auVar291 = ZEXT3264(auVar291._0_32_);
              auVar207 = ZEXT3264(auVar207._0_32_);
              auVar282 = ZEXT3264(auVar282._0_32_);
              auVar299 = ZEXT3264(auVar299._0_32_);
              auVar206._8_4_ = 0x3f800000;
              auVar206._0_8_ = 0x3f8000003f800000;
              auVar206._12_4_ = 0x3f800000;
              auVar206._16_4_ = 0x3f800000;
              auVar206._20_4_ = 0x3f800000;
              auVar206._24_4_ = 0x3f800000;
              auVar206._28_4_ = 0x3f800000;
              auVar309 = ZEXT3264(auVar206);
              auVar210 = vpsrld_avx(auVar61._0_16_,0x17);
              auVar215._8_4_ = 0xffffff81;
              auVar215._0_8_ = 0xffffff81ffffff81;
              auVar215._12_4_ = 0xffffff81;
              auVar104 = vpaddd_avx(auVar104,auVar215);
              auVar210 = vpsubd_avx(auVar210,auVar192._0_16_);
              auVar210 = vpaddd_avx(auVar210,auVar215);
              auVar93._16_16_ = auVar104;
              auVar93._0_16_ = auVar210;
              auVar192 = vcmpps_avx(auVar154,_DAT_004d5ba0,2);
              auVar61 = vcvtdq2ps_avx(auVar93);
              auVar321 = ZEXT464(0) << 0x20;
              auVar30._4_4_ =
                   (fVar62 + auVar61._4_4_ * 0.6931472 +
                   fVar62 * fVar62 *
                   (fVar62 * (fVar62 * (fVar62 * (fVar62 * (fVar62 * (fVar62 * (fVar62 * (fVar62 * (
                                                  fVar62 * 0.070376836 + -0.1151461) + 0.116769984)
                                                  + -0.12420141) + 0.14249323) + -0.16668057) +
                                                 0.20000714) + -0.24999994) + 0.3333333) + -0.5)) *
                   -2.0;
              auVar30._0_4_ =
                   (fVar98 + auVar61._0_4_ * 0.6931472 +
                   fVar98 * fVar98 *
                   (fVar98 * (fVar98 * (fVar98 * (fVar98 * (fVar98 * (fVar98 * (fVar98 * (fVar98 * (
                                                  fVar98 * 0.070376836 + -0.1151461) + 0.116769984)
                                                  + -0.12420141) + 0.14249323) + -0.16668057) +
                                                 0.20000714) + -0.24999994) + 0.3333333) + -0.5)) *
                   -2.0;
              auVar30._8_4_ =
                   (fVar101 + auVar61._8_4_ * 0.6931472 +
                   fVar101 * fVar101 *
                   (fVar101 * (fVar101 * (fVar101 * (fVar101 * (fVar101 * (fVar101 * (fVar101 * (
                                                  fVar101 * (fVar101 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar30._12_4_ =
                   (fVar158 + auVar61._12_4_ * 0.6931472 +
                   fVar158 * fVar158 *
                   (fVar158 * (fVar158 * (fVar158 * (fVar158 * (fVar158 * (fVar158 * (fVar158 * (
                                                  fVar158 * (fVar158 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar30._16_4_ =
                   (fVar161 + auVar61._16_4_ * 0.6931472 +
                   fVar161 * fVar161 *
                   (fVar161 * (fVar161 * (fVar161 * (fVar161 * (fVar161 * (fVar161 * (fVar161 * (
                                                  fVar161 * (fVar161 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar30._20_4_ =
                   (fVar345 + auVar61._20_4_ * 0.6931472 +
                   fVar345 * fVar345 *
                   (fVar345 * (fVar345 * (fVar345 * (fVar345 * (fVar345 * (fVar345 * (fVar345 * (
                                                  fVar345 * (fVar345 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar30._24_4_ =
                   (fVar348 + auVar61._24_4_ * 0.6931472 +
                   fVar348 * fVar348 *
                   (fVar348 * (fVar348 * (fVar348 * (fVar348 * (fVar348 * (fVar348 * (fVar348 * (
                                                  fVar348 * (fVar348 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar30._28_4_ = auVar147._28_4_ + -1.0 + auVar320._28_4_ + auVar61._28_4_ + 0.0;
              auVar155._8_4_ = 0x7fffffff;
              auVar155._0_8_ = 0x7fffffff7fffffff;
              auVar155._12_4_ = 0x7fffffff;
              auVar155._16_4_ = 0x7fffffff;
              auVar155._20_4_ = 0x7fffffff;
              auVar155._24_4_ = 0x7fffffff;
              auVar155._28_4_ = 0x7fffffff;
              auVar320 = vblendvps_avx(auVar30,auVar155,auVar192);
              auVar320 = vminps_avx(auVar320,auVar86);
              auVar192 = vmaxps_avx(auVar204,auVar320);
              auVar156._0_4_ = fVar209 * auVar192._0_4_ + fVar56;
              auVar156._4_4_ = fVar239 * auVar192._4_4_ + fVar100;
              auVar156._8_4_ = fVar240 * auVar192._8_4_ + fVar103;
              auVar156._12_4_ = fVar241 * auVar192._12_4_ + fVar160;
              auVar156._16_4_ = fVar242 * auVar192._16_4_ + fVar163;
              auVar156._20_4_ = fVar243 * auVar192._20_4_ + fVar344;
              auVar156._24_4_ = fVar244 * auVar192._24_4_ + fVar346;
              auVar156._28_4_ = fVar11 + NAN;
              auVar86 = vroundps_avx(auVar156,1);
              auVar320 = vcmpps_avx(auVar156,auVar86,1);
              auVar320 = vandps_avx(auVar320,auVar206);
              auVar320 = vsubps_avx(auVar86,auVar320);
              auVar31._4_4_ = auVar320._4_4_ * 0.6931472;
              auVar31._0_4_ = auVar320._0_4_ * 0.6931472;
              auVar31._8_4_ = auVar320._8_4_ * 0.6931472;
              auVar31._12_4_ = auVar320._12_4_ * 0.6931472;
              auVar31._16_4_ = auVar320._16_4_ * 0.6931472;
              auVar31._20_4_ = auVar320._20_4_ * 0.6931472;
              auVar31._24_4_ = auVar320._24_4_ * 0.6931472;
              auVar31._28_4_ = auVar86._28_4_;
              auVar192 = vsubps_avx(auVar192,auVar31);
              fVar98 = auVar192._0_4_;
              fVar62 = auVar192._4_4_;
              fVar101 = auVar192._8_4_;
              fVar158 = auVar192._12_4_;
              fVar161 = auVar192._16_4_;
              fVar345 = auVar192._20_4_;
              fVar348 = auVar192._24_4_;
              auVar109._0_4_ = (int)auVar320._0_4_;
              auVar109._4_4_ = (int)auVar320._4_4_;
              auVar109._8_4_ = (int)auVar320._8_4_;
              auVar109._12_4_ = (int)auVar320._12_4_;
              auVar157._16_4_ = (int)auVar320._16_4_;
              auVar157._0_16_ = auVar109;
              auVar157._20_4_ = (int)auVar320._20_4_;
              auVar157._24_4_ = (int)auVar320._24_4_;
              auVar157._28_4_ = (int)auVar320._28_4_;
              auVar210 = vpslld_avx(auVar109,0x17);
              auVar104 = vpslld_avx(auVar157._16_16_,0x17);
              auVar216._8_4_ = 0x3f800000;
              auVar216._0_8_ = 0x3f8000003f800000;
              auVar216._12_4_ = 0x3f800000;
              auVar104 = vpaddd_avx(auVar104,auVar216);
              auVar210 = vpaddd_avx(auVar210,auVar216);
              auVar94._0_4_ =
                   (fVar98 + 1.0 +
                   fVar98 * fVar98 *
                   ((fVar316 +
                    ((fVar298 + (fVar290 + fVar281 * fVar98) * fVar98) * fVar98 + fVar99) * fVar98)
                    * fVar98 + fVar56)) * auVar210._0_4_ + 1.0;
              auVar94._4_4_ =
                   (fVar62 + 1.0 +
                   fVar62 * fVar62 *
                   ((fVar322 +
                    ((fVar300 + (fVar292 + fVar284 * fVar62) * fVar62) * fVar62 + fVar97) * fVar62)
                    * fVar62 + fVar100)) * auVar210._4_4_ + 1.0;
              auVar94._8_4_ =
                   (fVar101 + 1.0 +
                   fVar101 * fVar101 *
                   ((fVar323 +
                    ((fVar301 + (fVar293 + fVar285 * fVar101) * fVar101) * fVar101 + fVar102) *
                    fVar101) * fVar101 + fVar103)) * auVar210._8_4_ + 1.0;
              auVar94._12_4_ =
                   (fVar158 + 1.0 +
                   fVar158 * fVar158 *
                   ((fVar324 +
                    ((fVar302 + (fVar294 + fVar286 * fVar158) * fVar158) * fVar158 + fVar159) *
                    fVar158) * fVar158 + fVar160)) * auVar210._12_4_ + 1.0;
              auVar94._16_4_ =
                   (fVar161 + 1.0 +
                   fVar161 * fVar161 *
                   ((fVar325 +
                    ((fVar303 + (fVar295 + fVar287 * fVar161) * fVar161) * fVar161 + fVar162) *
                    fVar161) * fVar161 + fVar163)) * auVar104._0_4_ + 1.0;
              auVar94._20_4_ =
                   (fVar345 + 1.0 +
                   fVar345 * fVar345 *
                   ((fVar326 +
                    ((fVar304 + (fVar296 + fVar288 * fVar345) * fVar345) * fVar345 + fVar343) *
                    fVar345) * fVar345 + fVar344)) * auVar104._4_4_ + 1.0;
              auVar94._24_4_ =
                   (fVar348 + 1.0 +
                   fVar348 * fVar348 *
                   ((fVar327 +
                    ((fVar305 + (fVar297 + fVar289 * fVar348) * fVar348) * fVar348 + fVar347) *
                    fVar348) * fVar348 + fVar346)) * auVar104._8_4_ + 1.0;
              auVar94._28_4_ = auVar192._28_4_ + 1.0 + auVar86._28_4_ + 1.0;
              auVar320 = vrcpps_avx(auVar94);
              fVar56 = auVar320._0_4_;
              fVar98 = auVar320._4_4_;
              fVar99 = auVar320._8_4_;
              fVar62 = auVar320._12_4_;
              fVar97 = auVar320._16_4_;
              fVar100 = auVar320._20_4_;
              fVar101 = auVar320._24_4_;
              auVar32._4_4_ = auVar94._4_4_ * (fVar98 + fVar98);
              auVar32._0_4_ = auVar94._0_4_ * (fVar56 + fVar56);
              auVar32._8_4_ = auVar94._8_4_ * (fVar99 + fVar99);
              auVar32._12_4_ = auVar94._12_4_ * (fVar62 + fVar62);
              auVar32._16_4_ = auVar94._16_4_ * (fVar97 + fVar97);
              auVar32._20_4_ = auVar94._20_4_ * (fVar100 + fVar100);
              auVar32._24_4_ = auVar94._24_4_ * (fVar101 + fVar101);
              auVar32._28_4_ = auVar94._28_4_;
              auVar235._8_4_ = 2.0;
              auVar235._0_8_ = 0x4000000040000000;
              auVar235._12_4_ = 2.0;
              auVar235._16_4_ = 2.0;
              auVar235._20_4_ = 2.0;
              auVar235._24_4_ = 2.0;
              auVar235._28_4_ = 2.0;
              auVar320 = vsubps_avx(auVar235,auVar32);
              auVar79._0_4_ = fVar56 + fVar56 + -1.0 + fVar56 * auVar320._0_4_;
              auVar79._4_4_ = fVar98 + fVar98 + -1.0 + fVar98 * auVar320._4_4_;
              auVar79._8_4_ = fVar99 + fVar99 + -1.0 + fVar99 * auVar320._8_4_;
              auVar79._12_4_ = fVar62 + fVar62 + -1.0 + fVar62 * auVar320._12_4_;
              auVar79._16_4_ = fVar97 + fVar97 + -1.0 + fVar97 * auVar320._16_4_;
              auVar79._20_4_ = fVar100 + fVar100 + -1.0 + fVar100 * auVar320._20_4_;
              auVar79._24_4_ = fVar101 + fVar101 + -1.0 + fVar101 * auVar320._24_4_;
              goto LAB_004b895f;
            case 6:
              fVar56 = **(float **)(&this->field_0xf8 + (long)p_Var4);
              fVar98 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
              auVar96._0_4_ = auVar310._0_4_ * fVar56 + fVar98;
              auVar96._4_4_ = auVar310._4_4_ * fVar56 + fVar98;
              auVar96._8_4_ = fVar311 * fVar56 + fVar98;
              auVar96._12_4_ = fVar312 * fVar56 + fVar98;
              auVar96._16_4_ = fVar313 * fVar56 + fVar98;
              auVar96._20_4_ = fVar314 * fVar56 + fVar98;
              auVar96._24_4_ = fVar315 * fVar56 + fVar98;
              auVar96._28_4_ = fVar56 + fVar98;
              auVar320 = vmaxps_avx(auVar61,auVar96);
              auVar320 = vminps_avx(auVar320,auVar192);
              auVar79 = auVar320._0_28_;
LAB_004b895f:
              auVar37._4_4_ = auVar310._4_4_ * auVar79._4_4_;
              auVar37._0_4_ = auVar310._0_4_ * auVar79._0_4_;
              auVar37._8_4_ = fVar311 * auVar79._8_4_;
              auVar37._12_4_ = fVar312 * auVar79._12_4_;
              auVar37._16_4_ = fVar313 * auVar79._16_4_;
              auVar37._20_4_ = fVar314 * auVar79._20_4_;
              auVar37._24_4_ = fVar315 * auVar79._24_4_;
              auVar37._28_4_ = auVar235._28_4_;
              auVar235 = auVar37;
            }
switchD_004b84f1_caseD_1:
            *pauVar47 = auVar235;
            pauVar47 = pauVar47 + 1;
          }
        }
      }
      lVar40 = (long)iVar52;
      if ((iVar2 == 8) && (_elempack == 1)) {
        local_48 = top_blob->data;
        local_38 = (long)top_blob->w * top_blob->elemsize;
        uVar42 = 0;
        if (0 < iVar38) {
          uVar42 = (ulong)(uint)iVar38;
        }
        local_40 = (void *)0x0;
        if (0 < iVar51) {
          local_40 = pvVar39;
        }
        for (pvVar41 = (void *)0x0; pvVar45 = local_48, pvVar41 != local_40;
            pvVar41 = (void *)((long)pvVar41 + 1)) {
          lVar43 = local_38 * (long)pvVar41;
          sVar7 = (this->weight_data_packed).cstep;
          sVar8 = (this->weight_data_packed).elemsize;
          pp_Var5 = this->_vptr_Convolution1D_x86_avx;
          pvVar9 = (this->weight_data_packed).data;
          for (lVar54 = 0; lVar54 <= lVar40; lVar54 = lVar54 + 1) {
            p_Var4 = pp_Var5[-3];
            if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
              fVar56 = 0.0;
            }
            else {
              fVar56 = *(float *)(*(long *)(&this->field_0x190 + (long)p_Var4) + (long)pvVar41 * 4);
            }
            fVar98 = 0.0;
            fVar99 = 0.0;
            fVar62 = 0.0;
            fVar97 = 0.0;
            fVar100 = 0.0;
            fVar101 = 0.0;
            fVar102 = 0.0;
            fVar103 = 0.0;
            pfVar53 = (float *)(sVar7 * (long)pvVar41 * sVar8 + (long)pvVar9);
            for (uVar44 = 0; uVar44 != uVar42; uVar44 = uVar44 + 1) {
              p_Var6 = this->_vptr_Convolution1D_x86_avx[-3];
              pfVar49 = (float *)((long)(_func_int ***)local_98.data +
                                 (long)(*(int *)(&this->field_0xdc + (long)p_Var6) * (int)lVar54 * 8
                                       ) * 4 + (long)local_98.w * local_98.elemsize * uVar44);
              iVar50 = *(int *)(&this->field_0xd4 + (long)p_Var6);
              if (*(int *)(&this->field_0xd4 + (long)p_Var6) < 1) {
                iVar50 = 0;
              }
              while (bVar55 = iVar50 != 0, iVar50 = iVar50 + -1, bVar55) {
                fVar62 = *pfVar53 * *pfVar49 + fVar62;
                fVar97 = pfVar53[1] * pfVar49[1] + fVar97;
                fVar98 = pfVar53[2] * pfVar49[2] + fVar98;
                fVar99 = pfVar53[3] * pfVar49[3] + fVar99;
                fVar100 = pfVar53[4] * pfVar49[4] + fVar100;
                fVar101 = pfVar53[5] * pfVar49[5] + fVar101;
                fVar102 = pfVar53[6] * pfVar49[6] + fVar102;
                fVar103 = pfVar53[7] + fVar103;
                pfVar49 = pfVar49 + (long)*(int *)(&this->field_0xd8 + (long)p_Var6) * 8;
                pfVar53 = pfVar53 + 8;
              }
            }
            auVar63._0_4_ = fVar100 + fVar62;
            auVar63._4_4_ = fVar101 + fVar97;
            auVar63._8_4_ = fVar102 + fVar98;
            auVar63._12_4_ = fVar103 + fVar99;
            auVar104 = vshufpd_avx(auVar63,auVar63,1);
            auVar64._0_4_ = auVar104._0_4_ + auVar63._0_4_;
            auVar64._4_4_ = auVar104._4_4_ + auVar63._4_4_;
            auVar64._8_4_ = auVar104._8_4_ + auVar63._8_4_;
            auVar64._12_4_ = auVar104._12_4_ + auVar63._12_4_;
            auVar104 = vmovshdup_avx(auVar64);
            fVar56 = auVar104._0_4_ + fVar56 + auVar64._0_4_;
            auVar104 = ZEXT416((uint)fVar56);
            fVar98 = fVar56;
            switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
            case 1:
              auVar104 = vmaxss_avx(auVar104,ZEXT416(0));
              fVar98 = auVar104._0_4_;
              break;
            case 2:
              auVar58._0_12_ = ZEXT812(0);
              auVar58._12_4_ = 0;
              auVar104 = vcmpss_avx(auVar58,auVar104,1);
              auVar112._8_4_ = 0x3f800000;
              auVar112._0_8_ = 0x3f8000003f800000;
              auVar112._12_4_ = 0x3f800000;
              auVar104 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)),
                                       auVar112,auVar104);
              fVar62 = auVar104._0_4_;
LAB_004b8c17:
              fVar98 = fVar62 * fVar56;
              break;
            case 3:
              fVar56 = (float)(*(uint **)(&this->field_0xf8 + (long)p_Var4))[1];
              auVar104 = vmaxss_avx(auVar104,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)))
              ;
              fVar98 = auVar104._0_4_;
              if (fVar56 < auVar104._0_4_) {
                fVar98 = fVar56;
              }
              break;
            case 4:
              auVar104 = vminss_avx(auVar104,ZEXT416(0x42b0c0a5));
              auVar65._0_8_ = auVar104._0_8_ ^ 0x8000000080000000;
              auVar65._8_4_ = auVar104._8_4_ ^ 0x80000000;
              auVar65._12_4_ = auVar104._12_4_ ^ 0x80000000;
              auVar104 = vcmpss_avx(auVar104,ZEXT416(0xc2b0c0a5),1);
              auVar111._8_4_ = 0x42b0c0a5;
              auVar111._0_8_ = 0x42b0c0a542b0c0a5;
              auVar111._12_4_ = 0x42b0c0a5;
              auVar104 = vblendvps_avx(auVar65,auVar111,auVar104);
              fVar56 = expf(auVar104._0_4_);
              fVar98 = 1.0 / (fVar56 + 1.0);
              break;
            case 5:
              fVar98 = expf(fVar56);
              fVar98 = logf(fVar98 + 1.0);
              fVar98 = tanhf(fVar98);
              fVar98 = fVar98 * fVar56;
              break;
            case 6:
              fVar99 = **(float **)(&this->field_0xf8 + (long)p_Var4);
              fVar62 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
              fVar97 = -fVar62 / fVar99;
              fVar98 = 0.0;
              if ((fVar97 <= fVar56) && (fVar98 = fVar56, fVar56 <= fVar97 + 1.0 / fVar99)) {
                fVar62 = fVar99 * fVar56 + fVar62;
                goto LAB_004b8c17;
              }
            }
            *(float *)((long)pvVar45 + lVar54 * 4 + lVar43) = fVar98;
          }
        }
      }
      if ((iVar2 == 8) && (_elempack == 4)) {
        uVar42 = 0;
        if (0 < iVar38) {
          uVar42 = (ulong)(uint)iVar38;
        }
        pvVar41 = (void *)0x0;
        if (0 < iVar51) {
          pvVar41 = pvVar39;
        }
        auVar207 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar282 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar218._8_4_ = 0x3f800000;
        auVar218._0_8_ = 0x3f8000003f800000;
        auVar218._12_4_ = 0x3f800000;
        for (pvVar45 = (void *)0x0; pvVar45 != pvVar41; pvVar45 = (void *)((long)pvVar45 + 1)) {
          pauVar48 = (undefined1 (*) [16])
                     ((long)top_blob->w * (long)pvVar45 * top_blob->elemsize + (long)top_blob->data)
          ;
          pp_Var5 = this->_vptr_Convolution1D_x86_avx;
          for (iVar50 = 0; iVar50 <= iVar52; iVar50 = iVar50 + 1) {
            p_Var4 = pp_Var5[-3];
            if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
              auVar104 = ZEXT816(0) << 0x40;
            }
            else {
              auVar104 = *(undefined1 (*) [16])
                          (*(long *)(&this->field_0x190 + (long)p_Var4) + (long)pvVar45 * 0x10);
            }
            auVar309 = ZEXT1664(auVar104);
            pfVar53 = (float *)((this->weight_data_packed).cstep * (long)pvVar45 *
                                (this->weight_data_packed).elemsize +
                               (long)(this->weight_data_packed).data);
            for (uVar44 = 0; uVar44 != uVar42; uVar44 = uVar44 + 1) {
              p_Var6 = this->_vptr_Convolution1D_x86_avx[-3];
              pfVar49 = (float *)((long)(_func_int ***)local_98.data +
                                 (long)(*(int *)(&this->field_0xdc + (long)p_Var6) * iVar50 * 8) * 4
                                 + (long)local_98.w * local_98.elemsize * uVar44);
              iVar46 = *(int *)(&this->field_0xd4 + (long)p_Var6);
              if (*(int *)(&this->field_0xd4 + (long)p_Var6) < 1) {
                iVar46 = 0;
              }
              while (bVar55 = iVar46 != 0, iVar46 = iVar46 + -1, bVar55) {
                fVar56 = *pfVar49;
                fVar98 = pfVar49[1];
                fVar99 = pfVar49[2];
                fVar62 = pfVar49[3];
                fVar97 = pfVar49[4];
                fVar100 = pfVar49[5];
                fVar101 = pfVar49[6];
                fVar102 = pfVar49[7];
                auVar309 = ZEXT1664(CONCAT412(fVar56 * pfVar53[3] + auVar309._12_4_ +
                                              fVar98 * pfVar53[7] + fVar99 * pfVar53[0xb] +
                                              fVar62 * pfVar53[0xf] + fVar97 * pfVar53[0x13] +
                                              fVar100 * pfVar53[0x17] +
                                              fVar101 * pfVar53[0x1b] + fVar102 * pfVar53[0x1f],
                                              CONCAT48(fVar56 * pfVar53[2] + auVar309._8_4_ +
                                                       fVar98 * pfVar53[6] + fVar99 * pfVar53[10] +
                                                       fVar62 * pfVar53[0xe] +
                                                       fVar97 * pfVar53[0x12] +
                                                       fVar100 * pfVar53[0x16] +
                                                       fVar101 * pfVar53[0x1a] +
                                                       fVar102 * pfVar53[0x1e],
                                                       CONCAT44(fVar56 * pfVar53[1] + auVar309._4_4_
                                                                + fVar98 * pfVar53[5] +
                                                                  fVar99 * pfVar53[9] +
                                                                fVar62 * pfVar53[0xd] +
                                                                fVar97 * pfVar53[0x11] +
                                                                fVar100 * pfVar53[0x15] +
                                                                fVar101 * pfVar53[0x19] +
                                                                fVar102 * pfVar53[0x1d],
                                                                fVar56 * *pfVar53 + auVar309._0_4_ +
                                                                fVar98 * pfVar53[4] +
                                                                fVar99 * pfVar53[8] +
                                                                fVar62 * pfVar53[0xc] +
                                                                fVar97 * pfVar53[0x10] +
                                                                fVar100 * pfVar53[0x14] +
                                                                fVar101 * pfVar53[0x18] +
                                                                fVar102 * pfVar53[0x1c]))));
                pfVar49 = pfVar49 + (long)*(int *)(&this->field_0xd8 + (long)p_Var6) * 8;
                pfVar53 = pfVar53 + 0x20;
              }
            }
            auVar104 = auVar309._0_16_;
            auVar254 = auVar104;
            if (5 < *(int *)(&this->field_0xf4 + (long)p_Var4) - 1U) goto switchD_004b8eb1_caseD_1;
            auVar210 = auVar207._0_16_;
            auVar254 = vmaxps_avx(auVar104,auVar210);
            fVar98 = auVar282._4_4_;
            fVar99 = auVar282._8_4_;
            fVar62 = auVar282._12_4_;
            fVar56 = auVar282._0_4_;
            fVar97 = auVar309._8_4_;
            fVar100 = auVar309._12_4_;
            switch(*(int *)(&this->field_0xf4 + (long)p_Var4)) {
            case 2:
              auVar104 = vminps_avx(auVar104,auVar210);
              fVar56 = **(float **)(&this->field_0xf8 + (long)p_Var4);
              auVar246._0_4_ = fVar56 * auVar104._0_4_ + auVar254._0_4_;
              auVar246._4_4_ = fVar56 * auVar104._4_4_ + auVar254._4_4_;
              auVar246._8_4_ = fVar56 * auVar104._8_4_ + auVar254._8_4_;
              auVar246._12_4_ = fVar56 * auVar104._12_4_ + auVar254._12_4_;
              auVar254 = auVar246;
              break;
            case 3:
              uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
              auVar251._4_4_ = uVar1;
              auVar251._0_4_ = uVar1;
              auVar251._8_4_ = uVar1;
              auVar251._12_4_ = uVar1;
              uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
              auVar330._4_4_ = uVar1;
              auVar330._0_4_ = uVar1;
              auVar330._8_4_ = uVar1;
              auVar330._12_4_ = uVar1;
              auVar104 = vmaxps_avx(auVar104,auVar251);
              auVar254 = vminps_avx(auVar330,auVar104);
              break;
            case 4:
              auVar66._0_8_ = auVar309._0_8_ ^ 0x8000000080000000;
              auVar66._8_4_ = -fVar97;
              auVar66._12_4_ = -fVar100;
              auVar118._8_4_ = 0x42b0c0a5;
              auVar118._0_8_ = 0x42b0c0a542b0c0a5;
              auVar118._12_4_ = 0x42b0c0a5;
              auVar104 = vminps_avx(auVar66,auVar118);
              auVar119._8_4_ = 0xc2b0c0a5;
              auVar119._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar119._12_4_ = 0xc2b0c0a5;
              auVar197 = vmaxps_avx(auVar104,auVar119);
              auVar252._0_4_ = auVar197._0_4_ * 1.442695 + fVar56;
              auVar252._4_4_ = auVar197._4_4_ * 1.442695 + fVar98;
              auVar252._8_4_ = auVar197._8_4_ * 1.442695 + fVar99;
              auVar252._12_4_ = auVar197._12_4_ * 1.442695 + fVar62;
              auVar331._0_4_ = (int)auVar252._0_4_;
              auVar331._4_4_ = (int)auVar252._4_4_;
              auVar331._8_4_ = (int)auVar252._8_4_;
              auVar331._12_4_ = (int)auVar252._12_4_;
              auVar210 = vcvtdq2ps_avx(auVar331);
              auVar104 = vcmpps_avx(auVar252,auVar210,1);
              auVar104 = vandps_avx(auVar104,auVar218);
              auVar104 = vsubps_avx(auVar210,auVar104);
              fVar97 = auVar104._0_4_ * -0.6931472 + auVar197._0_4_;
              fVar100 = auVar104._4_4_ * -0.6931472 + auVar197._4_4_;
              fVar101 = auVar104._8_4_ * -0.6931472 + auVar197._8_4_;
              fVar102 = auVar104._12_4_ * -0.6931472 + auVar197._12_4_;
              auVar253._0_4_ = (int)auVar104._0_4_;
              auVar253._4_4_ = (int)auVar104._4_4_;
              auVar253._8_4_ = (int)auVar104._8_4_;
              auVar253._12_4_ = (int)auVar104._12_4_;
              auVar104 = vpslld_avx(auVar253,0x17);
              auVar104 = vpaddd_avx(auVar104,auVar218);
              auVar67._0_4_ =
                   (fVar97 * fVar97 *
                    (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 + 0.008333452) * fVar97 +
                      0.041665796) * fVar97 + 0.16666666) * fVar97 + fVar56) + fVar97 + 1.0) *
                   auVar104._0_4_ + 1.0;
              auVar67._4_4_ =
                   (fVar100 * fVar100 *
                    (((((fVar100 * 0.00019875691 + 0.0013981999) * fVar100 + 0.008333452) * fVar100
                      + 0.041665796) * fVar100 + 0.16666666) * fVar100 + fVar98) + fVar100 + 1.0) *
                   auVar104._4_4_ + 1.0;
              auVar67._8_4_ =
                   (fVar101 * fVar101 *
                    (((((fVar101 * 0.00019875691 + 0.0013981999) * fVar101 + 0.008333452) * fVar101
                      + 0.041665796) * fVar101 + 0.16666666) * fVar101 + fVar99) + fVar101 + 1.0) *
                   auVar104._8_4_ + 1.0;
              auVar67._12_4_ =
                   (fVar102 * fVar102 *
                    (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) * fVar102
                      + 0.041665796) * fVar102 + 0.16666666) * fVar102 + fVar62) + fVar102 + 1.0) *
                   auVar104._12_4_ + 1.0;
              auVar104 = vrcpps_avx(auVar67);
              fVar56 = auVar104._0_4_;
              auVar68._0_4_ = auVar67._0_4_ * fVar56;
              fVar98 = auVar104._4_4_;
              auVar68._4_4_ = auVar67._4_4_ * fVar98;
              fVar99 = auVar104._8_4_;
              auVar68._8_4_ = auVar67._8_4_ * fVar99;
              fVar62 = auVar104._12_4_;
              auVar68._12_4_ = auVar67._12_4_ * fVar62;
              auVar104 = vsubps_avx(auVar218,auVar68);
              auVar254._0_4_ = fVar56 + fVar56 * auVar104._0_4_;
              auVar254._4_4_ = fVar98 + fVar98 * auVar104._4_4_;
              auVar254._8_4_ = fVar99 + fVar99 * auVar104._8_4_;
              auVar254._12_4_ = fVar62 + fVar62 * auVar104._12_4_;
              break;
            case 5:
              auVar198._8_4_ = 0x42b0c0a5;
              auVar198._0_8_ = 0x42b0c0a542b0c0a5;
              auVar198._12_4_ = 0x42b0c0a5;
              auVar104 = vminps_avx(auVar104,auVar198);
              auVar274._8_4_ = 0xc2b0c0a5;
              auVar274._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar274._12_4_ = 0xc2b0c0a5;
              auVar197 = vmaxps_avx(auVar274,auVar104);
              auVar317._0_4_ = auVar197._0_4_ * 1.442695 + fVar56;
              auVar317._4_4_ = auVar197._4_4_ * 1.442695 + fVar98;
              auVar317._8_4_ = auVar197._8_4_ * 1.442695 + fVar99;
              auVar317._12_4_ = auVar197._12_4_ * 1.442695 + fVar62;
              auVar328._0_4_ = (int)auVar317._0_4_;
              auVar328._4_4_ = (int)auVar317._4_4_;
              auVar328._8_4_ = (int)auVar317._8_4_;
              auVar328._12_4_ = (int)auVar317._12_4_;
              auVar210 = vcvtdq2ps_avx(auVar328);
              auVar104 = vcmpps_avx(auVar317,auVar210,1);
              auVar104 = vandps_avx(auVar104,auVar218);
              auVar104 = vsubps_avx(auVar210,auVar104);
              auVar329._0_4_ = auVar104._0_4_ * 0.6931472;
              auVar329._4_4_ = auVar104._4_4_ * 0.6931472;
              auVar329._8_4_ = auVar104._8_4_ * 0.6931472;
              auVar329._12_4_ = auVar104._12_4_ * 0.6931472;
              auVar210 = vsubps_avx(auVar197,auVar329);
              fVar101 = auVar210._0_4_;
              fVar102 = auVar210._4_4_;
              fVar103 = auVar210._8_4_;
              fVar158 = auVar210._12_4_;
              auVar247._0_4_ = (int)auVar104._0_4_;
              auVar247._4_4_ = (int)auVar104._4_4_;
              auVar247._8_4_ = (int)auVar104._8_4_;
              auVar247._12_4_ = (int)auVar104._12_4_;
              auVar104 = vpslld_avx(auVar247,0x17);
              auVar104 = vpaddd_avx(auVar104,auVar218);
              auVar248._0_4_ =
                   (fVar101 + 1.0 +
                   fVar101 * fVar101 *
                   (((((fVar101 * 0.00019875691 + 0.0013981999) * fVar101 + 0.008333452) * fVar101 +
                     0.041665796) * fVar101 + 0.16666666) * fVar101 + fVar56)) * auVar104._0_4_ +
                   1.0;
              auVar248._4_4_ =
                   (fVar102 + 1.0 +
                   fVar102 * fVar102 *
                   (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) * fVar102 +
                     0.041665796) * fVar102 + 0.16666666) * fVar102 + fVar98)) * auVar104._4_4_ +
                   1.0;
              auVar248._8_4_ =
                   (fVar103 + 1.0 +
                   fVar103 * fVar103 *
                   (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) * fVar103 +
                     0.041665796) * fVar103 + 0.16666666) * fVar103 + fVar99)) * auVar104._8_4_ +
                   1.0;
              auVar248._12_4_ =
                   (fVar158 + 1.0 +
                   fVar158 * fVar158 *
                   (((((fVar158 * 0.00019875691 + 0.0013981999) * fVar158 + 0.008333452) * fVar158 +
                     0.041665796) * fVar158 + 0.16666666) * fVar158 + fVar62)) * auVar104._12_4_ +
                   1.0;
              auVar113._8_4_ = 0x800000;
              auVar113._0_8_ = 0x80000000800000;
              auVar113._12_4_ = 0x800000;
              auVar104 = vmaxps_avx(auVar248,auVar113);
              auVar210 = vpsrld_avx(auVar104,0x17);
              auVar166._8_4_ = 0xffffff82;
              auVar166._0_8_ = 0xffffff82ffffff82;
              auVar166._12_4_ = 0xffffff82;
              auVar210 = vpaddd_avx(auVar210,auVar166);
              auVar167._8_4_ = 0x807fffff;
              auVar167._0_8_ = 0x807fffff807fffff;
              auVar167._12_4_ = 0x807fffff;
              auVar104 = vandps_avx(auVar104,auVar167);
              auVar245 = vorps_avx(auVar104,auVar282._0_16_);
              auVar197 = vcvtdq2ps_avx(auVar210);
              auVar168._8_4_ = 0x3f3504f3;
              auVar168._0_8_ = 0x3f3504f33f3504f3;
              auVar168._12_4_ = 0x3f3504f3;
              auVar210 = vcmpps_avx(auVar245,auVar168,1);
              auVar104 = vandps_avx(auVar210,auVar245);
              fVar101 = auVar245._0_4_ + -1.0 + auVar104._0_4_;
              fVar102 = auVar245._4_4_ + -1.0 + auVar104._4_4_;
              fVar103 = auVar245._8_4_ + -1.0 + auVar104._8_4_;
              fVar158 = auVar245._12_4_ + -1.0 + auVar104._12_4_;
              auVar104 = vandps_avx(auVar210,auVar218);
              auVar210 = vsubps_avx(auVar197,auVar104);
              auVar104 = vcmpps_avx(auVar248,_DAT_004d3a10,2);
              auVar114._0_4_ =
                   (fVar101 * fVar101 *
                    (((((((((fVar101 * 0.070376836 + -0.1151461) * fVar101 + 0.116769984) * fVar101
                          + -0.12420141) * fVar101 + 0.14249323) * fVar101 + -0.16668057) * fVar101
                       + 0.20000714) * fVar101 + -0.24999994) * fVar101 + 0.3333333) * fVar101 +
                    -0.5) + auVar210._0_4_ * 0.6931472 + fVar101) * -2.0;
              auVar114._4_4_ =
                   (fVar102 * fVar102 *
                    (((((((((fVar102 * 0.070376836 + -0.1151461) * fVar102 + 0.116769984) * fVar102
                          + -0.12420141) * fVar102 + 0.14249323) * fVar102 + -0.16668057) * fVar102
                       + 0.20000714) * fVar102 + -0.24999994) * fVar102 + 0.3333333) * fVar102 +
                    -0.5) + auVar210._4_4_ * 0.6931472 + fVar102) * -2.0;
              auVar114._8_4_ =
                   (fVar103 * fVar103 *
                    (((((((((fVar103 * 0.070376836 + -0.1151461) * fVar103 + 0.116769984) * fVar103
                          + -0.12420141) * fVar103 + 0.14249323) * fVar103 + -0.16668057) * fVar103
                       + 0.20000714) * fVar103 + -0.24999994) * fVar103 + 0.3333333) * fVar103 +
                    -0.5) + auVar210._8_4_ * 0.6931472 + fVar103) * -2.0;
              auVar114._12_4_ =
                   (fVar158 * fVar158 *
                    (((((((((fVar158 * 0.070376836 + -0.1151461) * fVar158 + 0.116769984) * fVar158
                          + -0.12420141) * fVar158 + 0.14249323) * fVar158 + -0.16668057) * fVar158
                       + 0.20000714) * fVar158 + -0.24999994) * fVar158 + 0.3333333) * fVar158 +
                    -0.5) + auVar210._12_4_ * 0.6931472 + fVar158) * -2.0;
              auVar169._8_4_ = 0x7fffffff;
              auVar169._0_8_ = 0x7fffffff7fffffff;
              auVar169._12_4_ = 0x7fffffff;
              auVar104 = vblendvps_avx(auVar114,auVar169,auVar104);
              auVar170._8_4_ = 0x42b0c0a5;
              auVar170._0_8_ = 0x42b0c0a542b0c0a5;
              auVar170._12_4_ = 0x42b0c0a5;
              auVar104 = vminps_avx(auVar104,auVar170);
              auVar171._8_4_ = 0xc2b0c0a5;
              auVar171._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar171._12_4_ = 0xc2b0c0a5;
              auVar197 = vmaxps_avx(auVar104,auVar171);
              auVar172._0_4_ = auVar197._0_4_ * 1.442695 + fVar56;
              auVar172._4_4_ = auVar197._4_4_ * 1.442695 + fVar98;
              auVar172._8_4_ = auVar197._8_4_ * 1.442695 + fVar99;
              auVar172._12_4_ = auVar197._12_4_ * 1.442695 + fVar62;
              auVar249._0_4_ = (int)auVar172._0_4_;
              auVar249._4_4_ = (int)auVar172._4_4_;
              auVar249._8_4_ = (int)auVar172._8_4_;
              auVar249._12_4_ = (int)auVar172._12_4_;
              auVar210 = vcvtdq2ps_avx(auVar249);
              auVar104 = vcmpps_avx(auVar172,auVar210,1);
              auVar104 = vandps_avx(auVar104,auVar218);
              auVar104 = vsubps_avx(auVar210,auVar104);
              auVar250._0_4_ = auVar104._0_4_ * 0.6931472;
              auVar250._4_4_ = auVar104._4_4_ * 0.6931472;
              auVar250._8_4_ = auVar104._8_4_ * 0.6931472;
              auVar250._12_4_ = auVar104._12_4_ * 0.6931472;
              auVar210 = vsubps_avx(auVar197,auVar250);
              fVar101 = auVar210._0_4_;
              fVar102 = auVar210._4_4_;
              fVar103 = auVar210._8_4_;
              fVar158 = auVar210._12_4_;
              auVar282 = ZEXT1664(auVar282._0_16_);
              auVar207 = ZEXT864(0) << 0x20;
              auVar173._0_4_ = (int)auVar104._0_4_;
              auVar173._4_4_ = (int)auVar104._4_4_;
              auVar173._8_4_ = (int)auVar104._8_4_;
              auVar173._12_4_ = (int)auVar104._12_4_;
              auVar104 = vpslld_avx(auVar173,0x17);
              auVar104 = vpaddd_avx(auVar104,auVar218);
              auVar115._0_4_ =
                   (fVar101 + 1.0 +
                   (((((fVar101 * 0.00019875691 + 0.0013981999) * fVar101 + 0.008333452) * fVar101 +
                     0.041665796) * fVar101 + 0.16666666) * fVar101 + fVar56) * fVar101 * fVar101) *
                   auVar104._0_4_ + 1.0;
              auVar115._4_4_ =
                   (fVar102 + 1.0 +
                   (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) * fVar102 +
                     0.041665796) * fVar102 + 0.16666666) * fVar102 + fVar98) * fVar102 * fVar102) *
                   auVar104._4_4_ + 1.0;
              auVar115._8_4_ =
                   (fVar103 + 1.0 +
                   (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) * fVar103 +
                     0.041665796) * fVar103 + 0.16666666) * fVar103 + fVar99) * fVar103 * fVar103) *
                   auVar104._8_4_ + 1.0;
              auVar115._12_4_ =
                   (fVar158 + 1.0 +
                   (((((fVar158 * 0.00019875691 + 0.0013981999) * fVar158 + 0.008333452) * fVar158 +
                     0.041665796) * fVar158 + 0.16666666) * fVar158 + fVar62) * fVar158 * fVar158) *
                   auVar104._12_4_ + 1.0;
              auVar104 = vrcpps_avx(auVar115);
              fVar56 = auVar104._0_4_;
              fVar98 = auVar104._4_4_;
              fVar99 = auVar104._8_4_;
              fVar62 = auVar104._12_4_;
              auVar116._0_4_ = auVar115._0_4_ * (fVar56 + fVar56);
              auVar116._4_4_ = auVar115._4_4_ * (fVar98 + fVar98);
              auVar116._8_4_ = auVar115._8_4_ * (fVar99 + fVar99);
              auVar116._12_4_ = auVar115._12_4_ * (fVar62 + fVar62);
              auVar199._8_4_ = 0x40000000;
              auVar199._0_8_ = 0x4000000040000000;
              auVar199._12_4_ = 0x40000000;
              auVar104 = vsubps_avx(auVar199,auVar116);
              auVar117._0_4_ = fVar56 + fVar56 + -1.0 + fVar56 * auVar104._0_4_;
              auVar117._4_4_ = fVar98 + fVar98 + -1.0 + fVar98 * auVar104._4_4_;
              auVar117._8_4_ = fVar99 + fVar99 + -1.0 + fVar99 * auVar104._8_4_;
              auVar117._12_4_ = fVar62 + fVar62 + -1.0 + fVar62 * auVar104._12_4_;
              goto LAB_004b92bc;
            case 6:
              fVar56 = **(float **)(&this->field_0xf8 + (long)p_Var4);
              fVar98 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
              auVar120._0_4_ = fVar56 * auVar309._0_4_ + fVar98;
              auVar120._4_4_ = fVar56 * auVar309._4_4_ + fVar98;
              auVar120._8_4_ = fVar56 * fVar97 + fVar98;
              auVar120._12_4_ = fVar56 * fVar100 + fVar98;
              auVar104 = vmaxps_avx(auVar120,auVar210);
              auVar117 = vminps_avx(auVar104,auVar218);
LAB_004b92bc:
              auVar254._0_4_ = auVar117._0_4_ * auVar309._0_4_;
              auVar254._4_4_ = auVar117._4_4_ * auVar309._4_4_;
              auVar254._8_4_ = auVar117._8_4_ * fVar97;
              auVar254._12_4_ = auVar117._12_4_ * fVar100;
            }
switchD_004b8eb1_caseD_1:
            *pauVar48 = auVar254;
            pauVar48 = pauVar48 + 1;
          }
        }
      }
      if ((iVar2 == 4) && (_elempack == 4)) {
        uVar42 = 0;
        if (0 < iVar38) {
          uVar42 = (ulong)(uint)iVar38;
        }
        pvVar41 = (void *)0x0;
        if (0 < iVar51) {
          pvVar41 = pvVar39;
        }
        auVar207 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar282 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar219._8_4_ = 0x3f800000;
        auVar219._0_8_ = 0x3f8000003f800000;
        auVar219._12_4_ = 0x3f800000;
        for (pvVar45 = (void *)0x0; pvVar45 != pvVar41; pvVar45 = (void *)((long)pvVar45 + 1)) {
          pauVar48 = (undefined1 (*) [16])
                     ((long)top_blob->w * (long)pvVar45 * top_blob->elemsize + (long)top_blob->data)
          ;
          pp_Var5 = this->_vptr_Convolution1D_x86_avx;
          for (iVar50 = 0; iVar50 <= iVar52; iVar50 = iVar50 + 1) {
            p_Var4 = pp_Var5[-3];
            if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
              auVar104 = ZEXT816(0) << 0x40;
            }
            else {
              auVar104 = *(undefined1 (*) [16])
                          (*(long *)(&this->field_0x190 + (long)p_Var4) + (long)pvVar45 * 0x10);
            }
            auVar309 = ZEXT1664(auVar104);
            pfVar53 = (float *)((this->weight_data_packed).cstep * (long)pvVar45 *
                                (this->weight_data_packed).elemsize +
                               (long)(this->weight_data_packed).data);
            for (uVar44 = 0; uVar44 != uVar42; uVar44 = uVar44 + 1) {
              p_Var6 = this->_vptr_Convolution1D_x86_avx[-3];
              pfVar49 = (float *)((long)(_func_int ***)local_98.data +
                                 (long)(*(int *)(&this->field_0xdc + (long)p_Var6) * iVar50 * 4) * 4
                                 + (long)local_98.w * local_98.elemsize * uVar44);
              iVar46 = *(int *)(&this->field_0xd4 + (long)p_Var6);
              if (*(int *)(&this->field_0xd4 + (long)p_Var6) < 1) {
                iVar46 = 0;
              }
              while (bVar55 = iVar46 != 0, iVar46 = iVar46 + -1, bVar55) {
                fVar56 = *pfVar49;
                fVar98 = pfVar49[1];
                fVar99 = pfVar49[2];
                fVar62 = pfVar49[3];
                auVar309 = ZEXT1664(CONCAT412(fVar56 * pfVar53[3] + auVar309._12_4_ +
                                              fVar98 * pfVar53[7] + fVar99 * pfVar53[0xb] +
                                              fVar62 * pfVar53[0xf],
                                              CONCAT48(fVar56 * pfVar53[2] + auVar309._8_4_ +
                                                       fVar98 * pfVar53[6] + fVar99 * pfVar53[10] +
                                                       fVar62 * pfVar53[0xe],
                                                       CONCAT44(fVar56 * pfVar53[1] + auVar309._4_4_
                                                                + fVar98 * pfVar53[5] +
                                                                  fVar99 * pfVar53[9] +
                                                                fVar62 * pfVar53[0xd],
                                                                fVar56 * *pfVar53 + auVar309._0_4_ +
                                                                fVar98 * pfVar53[4] +
                                                                fVar99 * pfVar53[8] +
                                                                fVar62 * pfVar53[0xc]))));
                pfVar49 = pfVar49 + (long)*(int *)(&this->field_0xd8 + (long)p_Var6) * 4;
                pfVar53 = pfVar53 + 0x10;
              }
            }
            auVar104 = auVar309._0_16_;
            auVar263 = auVar104;
            if (5 < *(int *)(&this->field_0xf4 + (long)p_Var4) - 1U) goto switchD_004b94cd_caseD_1;
            auVar210 = auVar207._0_16_;
            auVar263 = vmaxps_avx(auVar104,auVar210);
            fVar98 = auVar282._4_4_;
            fVar99 = auVar282._8_4_;
            fVar62 = auVar282._12_4_;
            fVar56 = auVar282._0_4_;
            fVar97 = auVar309._8_4_;
            fVar100 = auVar309._12_4_;
            switch(*(int *)(&this->field_0xf4 + (long)p_Var4)) {
            case 2:
              auVar104 = vminps_avx(auVar104,auVar210);
              fVar56 = **(float **)(&this->field_0xf8 + (long)p_Var4);
              auVar255._0_4_ = fVar56 * auVar104._0_4_ + auVar263._0_4_;
              auVar255._4_4_ = fVar56 * auVar104._4_4_ + auVar263._4_4_;
              auVar255._8_4_ = fVar56 * auVar104._8_4_ + auVar263._8_4_;
              auVar255._12_4_ = fVar56 * auVar104._12_4_ + auVar263._12_4_;
              auVar263 = auVar255;
              break;
            case 3:
              uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
              auVar260._4_4_ = uVar1;
              auVar260._0_4_ = uVar1;
              auVar260._8_4_ = uVar1;
              auVar260._12_4_ = uVar1;
              uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
              auVar334._4_4_ = uVar1;
              auVar334._0_4_ = uVar1;
              auVar334._8_4_ = uVar1;
              auVar334._12_4_ = uVar1;
              auVar104 = vmaxps_avx(auVar104,auVar260);
              auVar263 = vminps_avx(auVar334,auVar104);
              break;
            case 4:
              auVar69._0_8_ = auVar309._0_8_ ^ 0x8000000080000000;
              auVar69._8_4_ = -fVar97;
              auVar69._12_4_ = -fVar100;
              auVar126._8_4_ = 0x42b0c0a5;
              auVar126._0_8_ = 0x42b0c0a542b0c0a5;
              auVar126._12_4_ = 0x42b0c0a5;
              auVar104 = vminps_avx(auVar69,auVar126);
              auVar127._8_4_ = 0xc2b0c0a5;
              auVar127._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar127._12_4_ = 0xc2b0c0a5;
              auVar197 = vmaxps_avx(auVar104,auVar127);
              auVar261._0_4_ = auVar197._0_4_ * 1.442695 + fVar56;
              auVar261._4_4_ = auVar197._4_4_ * 1.442695 + fVar98;
              auVar261._8_4_ = auVar197._8_4_ * 1.442695 + fVar99;
              auVar261._12_4_ = auVar197._12_4_ * 1.442695 + fVar62;
              auVar335._0_4_ = (int)auVar261._0_4_;
              auVar335._4_4_ = (int)auVar261._4_4_;
              auVar335._8_4_ = (int)auVar261._8_4_;
              auVar335._12_4_ = (int)auVar261._12_4_;
              auVar210 = vcvtdq2ps_avx(auVar335);
              auVar104 = vcmpps_avx(auVar261,auVar210,1);
              auVar104 = vandps_avx(auVar104,auVar219);
              auVar104 = vsubps_avx(auVar210,auVar104);
              fVar97 = auVar104._0_4_ * -0.6931472 + auVar197._0_4_;
              fVar100 = auVar104._4_4_ * -0.6931472 + auVar197._4_4_;
              fVar101 = auVar104._8_4_ * -0.6931472 + auVar197._8_4_;
              fVar102 = auVar104._12_4_ * -0.6931472 + auVar197._12_4_;
              auVar262._0_4_ = (int)auVar104._0_4_;
              auVar262._4_4_ = (int)auVar104._4_4_;
              auVar262._8_4_ = (int)auVar104._8_4_;
              auVar262._12_4_ = (int)auVar104._12_4_;
              auVar104 = vpslld_avx(auVar262,0x17);
              auVar104 = vpaddd_avx(auVar104,auVar219);
              auVar70._0_4_ =
                   (fVar97 * fVar97 *
                    (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 + 0.008333452) * fVar97 +
                      0.041665796) * fVar97 + 0.16666666) * fVar97 + fVar56) + fVar97 + 1.0) *
                   auVar104._0_4_ + 1.0;
              auVar70._4_4_ =
                   (fVar100 * fVar100 *
                    (((((fVar100 * 0.00019875691 + 0.0013981999) * fVar100 + 0.008333452) * fVar100
                      + 0.041665796) * fVar100 + 0.16666666) * fVar100 + fVar98) + fVar100 + 1.0) *
                   auVar104._4_4_ + 1.0;
              auVar70._8_4_ =
                   (fVar101 * fVar101 *
                    (((((fVar101 * 0.00019875691 + 0.0013981999) * fVar101 + 0.008333452) * fVar101
                      + 0.041665796) * fVar101 + 0.16666666) * fVar101 + fVar99) + fVar101 + 1.0) *
                   auVar104._8_4_ + 1.0;
              auVar70._12_4_ =
                   (fVar102 * fVar102 *
                    (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) * fVar102
                      + 0.041665796) * fVar102 + 0.16666666) * fVar102 + fVar62) + fVar102 + 1.0) *
                   auVar104._12_4_ + 1.0;
              auVar104 = vrcpps_avx(auVar70);
              fVar56 = auVar104._0_4_;
              auVar71._0_4_ = auVar70._0_4_ * fVar56;
              fVar98 = auVar104._4_4_;
              auVar71._4_4_ = auVar70._4_4_ * fVar98;
              fVar99 = auVar104._8_4_;
              auVar71._8_4_ = auVar70._8_4_ * fVar99;
              fVar62 = auVar104._12_4_;
              auVar71._12_4_ = auVar70._12_4_ * fVar62;
              auVar104 = vsubps_avx(auVar219,auVar71);
              auVar263._0_4_ = fVar56 + fVar56 * auVar104._0_4_;
              auVar263._4_4_ = fVar98 + fVar98 * auVar104._4_4_;
              auVar263._8_4_ = fVar99 + fVar99 * auVar104._8_4_;
              auVar263._12_4_ = fVar62 + fVar62 * auVar104._12_4_;
              break;
            case 5:
              auVar200._8_4_ = 0x42b0c0a5;
              auVar200._0_8_ = 0x42b0c0a542b0c0a5;
              auVar200._12_4_ = 0x42b0c0a5;
              auVar104 = vminps_avx(auVar104,auVar200);
              auVar275._8_4_ = 0xc2b0c0a5;
              auVar275._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar275._12_4_ = 0xc2b0c0a5;
              auVar197 = vmaxps_avx(auVar275,auVar104);
              auVar318._0_4_ = auVar197._0_4_ * 1.442695 + fVar56;
              auVar318._4_4_ = auVar197._4_4_ * 1.442695 + fVar98;
              auVar318._8_4_ = auVar197._8_4_ * 1.442695 + fVar99;
              auVar318._12_4_ = auVar197._12_4_ * 1.442695 + fVar62;
              auVar332._0_4_ = (int)auVar318._0_4_;
              auVar332._4_4_ = (int)auVar318._4_4_;
              auVar332._8_4_ = (int)auVar318._8_4_;
              auVar332._12_4_ = (int)auVar318._12_4_;
              auVar210 = vcvtdq2ps_avx(auVar332);
              auVar104 = vcmpps_avx(auVar318,auVar210,1);
              auVar104 = vandps_avx(auVar104,auVar219);
              auVar104 = vsubps_avx(auVar210,auVar104);
              auVar333._0_4_ = auVar104._0_4_ * 0.6931472;
              auVar333._4_4_ = auVar104._4_4_ * 0.6931472;
              auVar333._8_4_ = auVar104._8_4_ * 0.6931472;
              auVar333._12_4_ = auVar104._12_4_ * 0.6931472;
              auVar210 = vsubps_avx(auVar197,auVar333);
              fVar101 = auVar210._0_4_;
              fVar102 = auVar210._4_4_;
              fVar103 = auVar210._8_4_;
              fVar158 = auVar210._12_4_;
              auVar256._0_4_ = (int)auVar104._0_4_;
              auVar256._4_4_ = (int)auVar104._4_4_;
              auVar256._8_4_ = (int)auVar104._8_4_;
              auVar256._12_4_ = (int)auVar104._12_4_;
              auVar104 = vpslld_avx(auVar256,0x17);
              auVar104 = vpaddd_avx(auVar104,auVar219);
              auVar257._0_4_ =
                   (fVar101 + 1.0 +
                   fVar101 * fVar101 *
                   (((((fVar101 * 0.00019875691 + 0.0013981999) * fVar101 + 0.008333452) * fVar101 +
                     0.041665796) * fVar101 + 0.16666666) * fVar101 + fVar56)) * auVar104._0_4_ +
                   1.0;
              auVar257._4_4_ =
                   (fVar102 + 1.0 +
                   fVar102 * fVar102 *
                   (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) * fVar102 +
                     0.041665796) * fVar102 + 0.16666666) * fVar102 + fVar98)) * auVar104._4_4_ +
                   1.0;
              auVar257._8_4_ =
                   (fVar103 + 1.0 +
                   fVar103 * fVar103 *
                   (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) * fVar103 +
                     0.041665796) * fVar103 + 0.16666666) * fVar103 + fVar99)) * auVar104._8_4_ +
                   1.0;
              auVar257._12_4_ =
                   (fVar158 + 1.0 +
                   fVar158 * fVar158 *
                   (((((fVar158 * 0.00019875691 + 0.0013981999) * fVar158 + 0.008333452) * fVar158 +
                     0.041665796) * fVar158 + 0.16666666) * fVar158 + fVar62)) * auVar104._12_4_ +
                   1.0;
              auVar121._8_4_ = 0x800000;
              auVar121._0_8_ = 0x80000000800000;
              auVar121._12_4_ = 0x800000;
              auVar104 = vmaxps_avx(auVar257,auVar121);
              auVar210 = vpsrld_avx(auVar104,0x17);
              auVar174._8_4_ = 0xffffff82;
              auVar174._0_8_ = 0xffffff82ffffff82;
              auVar174._12_4_ = 0xffffff82;
              auVar210 = vpaddd_avx(auVar210,auVar174);
              auVar175._8_4_ = 0x807fffff;
              auVar175._0_8_ = 0x807fffff807fffff;
              auVar175._12_4_ = 0x807fffff;
              auVar104 = vandps_avx(auVar104,auVar175);
              auVar245 = vorps_avx(auVar104,auVar282._0_16_);
              auVar197 = vcvtdq2ps_avx(auVar210);
              auVar176._8_4_ = 0x3f3504f3;
              auVar176._0_8_ = 0x3f3504f33f3504f3;
              auVar176._12_4_ = 0x3f3504f3;
              auVar210 = vcmpps_avx(auVar245,auVar176,1);
              auVar104 = vandps_avx(auVar210,auVar245);
              fVar101 = auVar245._0_4_ + -1.0 + auVar104._0_4_;
              fVar102 = auVar245._4_4_ + -1.0 + auVar104._4_4_;
              fVar103 = auVar245._8_4_ + -1.0 + auVar104._8_4_;
              fVar158 = auVar245._12_4_ + -1.0 + auVar104._12_4_;
              auVar104 = vandps_avx(auVar210,auVar219);
              auVar210 = vsubps_avx(auVar197,auVar104);
              auVar104 = vcmpps_avx(auVar257,_DAT_004d3a10,2);
              auVar122._0_4_ =
                   (fVar101 * fVar101 *
                    (((((((((fVar101 * 0.070376836 + -0.1151461) * fVar101 + 0.116769984) * fVar101
                          + -0.12420141) * fVar101 + 0.14249323) * fVar101 + -0.16668057) * fVar101
                       + 0.20000714) * fVar101 + -0.24999994) * fVar101 + 0.3333333) * fVar101 +
                    -0.5) + auVar210._0_4_ * 0.6931472 + fVar101) * -2.0;
              auVar122._4_4_ =
                   (fVar102 * fVar102 *
                    (((((((((fVar102 * 0.070376836 + -0.1151461) * fVar102 + 0.116769984) * fVar102
                          + -0.12420141) * fVar102 + 0.14249323) * fVar102 + -0.16668057) * fVar102
                       + 0.20000714) * fVar102 + -0.24999994) * fVar102 + 0.3333333) * fVar102 +
                    -0.5) + auVar210._4_4_ * 0.6931472 + fVar102) * -2.0;
              auVar122._8_4_ =
                   (fVar103 * fVar103 *
                    (((((((((fVar103 * 0.070376836 + -0.1151461) * fVar103 + 0.116769984) * fVar103
                          + -0.12420141) * fVar103 + 0.14249323) * fVar103 + -0.16668057) * fVar103
                       + 0.20000714) * fVar103 + -0.24999994) * fVar103 + 0.3333333) * fVar103 +
                    -0.5) + auVar210._8_4_ * 0.6931472 + fVar103) * -2.0;
              auVar122._12_4_ =
                   (fVar158 * fVar158 *
                    (((((((((fVar158 * 0.070376836 + -0.1151461) * fVar158 + 0.116769984) * fVar158
                          + -0.12420141) * fVar158 + 0.14249323) * fVar158 + -0.16668057) * fVar158
                       + 0.20000714) * fVar158 + -0.24999994) * fVar158 + 0.3333333) * fVar158 +
                    -0.5) + auVar210._12_4_ * 0.6931472 + fVar158) * -2.0;
              auVar177._8_4_ = 0x7fffffff;
              auVar177._0_8_ = 0x7fffffff7fffffff;
              auVar177._12_4_ = 0x7fffffff;
              auVar104 = vblendvps_avx(auVar122,auVar177,auVar104);
              auVar178._8_4_ = 0x42b0c0a5;
              auVar178._0_8_ = 0x42b0c0a542b0c0a5;
              auVar178._12_4_ = 0x42b0c0a5;
              auVar104 = vminps_avx(auVar104,auVar178);
              auVar179._8_4_ = 0xc2b0c0a5;
              auVar179._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar179._12_4_ = 0xc2b0c0a5;
              auVar197 = vmaxps_avx(auVar104,auVar179);
              auVar180._0_4_ = auVar197._0_4_ * 1.442695 + fVar56;
              auVar180._4_4_ = auVar197._4_4_ * 1.442695 + fVar98;
              auVar180._8_4_ = auVar197._8_4_ * 1.442695 + fVar99;
              auVar180._12_4_ = auVar197._12_4_ * 1.442695 + fVar62;
              auVar258._0_4_ = (int)auVar180._0_4_;
              auVar258._4_4_ = (int)auVar180._4_4_;
              auVar258._8_4_ = (int)auVar180._8_4_;
              auVar258._12_4_ = (int)auVar180._12_4_;
              auVar210 = vcvtdq2ps_avx(auVar258);
              auVar104 = vcmpps_avx(auVar180,auVar210,1);
              auVar104 = vandps_avx(auVar104,auVar219);
              auVar104 = vsubps_avx(auVar210,auVar104);
              auVar259._0_4_ = auVar104._0_4_ * 0.6931472;
              auVar259._4_4_ = auVar104._4_4_ * 0.6931472;
              auVar259._8_4_ = auVar104._8_4_ * 0.6931472;
              auVar259._12_4_ = auVar104._12_4_ * 0.6931472;
              auVar210 = vsubps_avx(auVar197,auVar259);
              fVar101 = auVar210._0_4_;
              fVar102 = auVar210._4_4_;
              fVar103 = auVar210._8_4_;
              fVar158 = auVar210._12_4_;
              auVar282 = ZEXT1664(auVar282._0_16_);
              auVar207 = ZEXT864(0) << 0x20;
              auVar181._0_4_ = (int)auVar104._0_4_;
              auVar181._4_4_ = (int)auVar104._4_4_;
              auVar181._8_4_ = (int)auVar104._8_4_;
              auVar181._12_4_ = (int)auVar104._12_4_;
              auVar104 = vpslld_avx(auVar181,0x17);
              auVar104 = vpaddd_avx(auVar104,auVar219);
              auVar123._0_4_ =
                   (fVar101 + 1.0 +
                   (((((fVar101 * 0.00019875691 + 0.0013981999) * fVar101 + 0.008333452) * fVar101 +
                     0.041665796) * fVar101 + 0.16666666) * fVar101 + fVar56) * fVar101 * fVar101) *
                   auVar104._0_4_ + 1.0;
              auVar123._4_4_ =
                   (fVar102 + 1.0 +
                   (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) * fVar102 +
                     0.041665796) * fVar102 + 0.16666666) * fVar102 + fVar98) * fVar102 * fVar102) *
                   auVar104._4_4_ + 1.0;
              auVar123._8_4_ =
                   (fVar103 + 1.0 +
                   (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) * fVar103 +
                     0.041665796) * fVar103 + 0.16666666) * fVar103 + fVar99) * fVar103 * fVar103) *
                   auVar104._8_4_ + 1.0;
              auVar123._12_4_ =
                   (fVar158 + 1.0 +
                   (((((fVar158 * 0.00019875691 + 0.0013981999) * fVar158 + 0.008333452) * fVar158 +
                     0.041665796) * fVar158 + 0.16666666) * fVar158 + fVar62) * fVar158 * fVar158) *
                   auVar104._12_4_ + 1.0;
              auVar104 = vrcpps_avx(auVar123);
              fVar56 = auVar104._0_4_;
              fVar98 = auVar104._4_4_;
              fVar99 = auVar104._8_4_;
              fVar62 = auVar104._12_4_;
              auVar124._0_4_ = auVar123._0_4_ * (fVar56 + fVar56);
              auVar124._4_4_ = auVar123._4_4_ * (fVar98 + fVar98);
              auVar124._8_4_ = auVar123._8_4_ * (fVar99 + fVar99);
              auVar124._12_4_ = auVar123._12_4_ * (fVar62 + fVar62);
              auVar201._8_4_ = 0x40000000;
              auVar201._0_8_ = 0x4000000040000000;
              auVar201._12_4_ = 0x40000000;
              auVar104 = vsubps_avx(auVar201,auVar124);
              auVar125._0_4_ = fVar56 + fVar56 + -1.0 + fVar56 * auVar104._0_4_;
              auVar125._4_4_ = fVar98 + fVar98 + -1.0 + fVar98 * auVar104._4_4_;
              auVar125._8_4_ = fVar99 + fVar99 + -1.0 + fVar99 * auVar104._8_4_;
              auVar125._12_4_ = fVar62 + fVar62 + -1.0 + fVar62 * auVar104._12_4_;
              goto LAB_004b98cf;
            case 6:
              fVar56 = **(float **)(&this->field_0xf8 + (long)p_Var4);
              fVar98 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
              auVar128._0_4_ = fVar56 * auVar309._0_4_ + fVar98;
              auVar128._4_4_ = fVar56 * auVar309._4_4_ + fVar98;
              auVar128._8_4_ = fVar56 * fVar97 + fVar98;
              auVar128._12_4_ = fVar56 * fVar100 + fVar98;
              auVar104 = vmaxps_avx(auVar128,auVar210);
              auVar125 = vminps_avx(auVar104,auVar219);
LAB_004b98cf:
              auVar263._0_4_ = auVar125._0_4_ * auVar309._0_4_;
              auVar263._4_4_ = auVar125._4_4_ * auVar309._4_4_;
              auVar263._8_4_ = auVar125._8_4_ * fVar97;
              auVar263._12_4_ = auVar125._12_4_ * fVar100;
            }
switchD_004b94cd_caseD_1:
            *pauVar48 = auVar263;
            pauVar48 = pauVar48 + 1;
          }
        }
      }
      if ((iVar2 == 1) && (_elempack == 4)) {
        uVar42 = 0;
        if (0 < iVar38) {
          uVar42 = (ulong)(uint)iVar38;
        }
        pvVar41 = (void *)0x0;
        if (0 < iVar51) {
          pvVar41 = pvVar39;
        }
        auVar207 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar282 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar220._8_4_ = 0x3f800000;
        auVar220._0_8_ = 0x3f8000003f800000;
        auVar220._12_4_ = 0x3f800000;
        for (pvVar45 = (void *)0x0; pvVar45 != pvVar41; pvVar45 = (void *)((long)pvVar45 + 1)) {
          pauVar48 = (undefined1 (*) [16])
                     ((long)top_blob->w * (long)pvVar45 * top_blob->elemsize + (long)top_blob->data)
          ;
          pp_Var5 = this->_vptr_Convolution1D_x86_avx;
          for (iVar50 = 0; iVar50 <= iVar52; iVar50 = iVar50 + 1) {
            p_Var4 = pp_Var5[-3];
            if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
              auVar104 = ZEXT816(0) << 0x40;
            }
            else {
              auVar104 = *(undefined1 (*) [16])
                          (*(long *)(&this->field_0x190 + (long)p_Var4) + (long)pvVar45 * 0x10);
            }
            auVar309 = ZEXT1664(auVar104);
            pfVar53 = (float *)((this->weight_data_packed).cstep * (long)pvVar45 *
                                (this->weight_data_packed).elemsize +
                               (long)(this->weight_data_packed).data);
            for (uVar44 = 0; uVar44 != uVar42; uVar44 = uVar44 + 1) {
              p_Var6 = this->_vptr_Convolution1D_x86_avx[-3];
              pfVar49 = (float *)((long)(_func_int ***)local_98.data +
                                 (long)*(int *)(&this->field_0xdc + (long)p_Var6) * (long)iVar50 * 4
                                 + (long)local_98.w * local_98.elemsize * uVar44);
              iVar46 = *(int *)(&this->field_0xd4 + (long)p_Var6);
              if (iVar46 < 1) {
                iVar46 = 0;
              }
              while (bVar55 = iVar46 != 0, iVar46 = iVar46 + -1, bVar55) {
                fVar56 = *pfVar49;
                auVar309 = ZEXT1664(CONCAT412(fVar56 * pfVar53[3] + auVar309._12_4_,
                                              CONCAT48(fVar56 * pfVar53[2] + auVar309._8_4_,
                                                       CONCAT44(fVar56 * pfVar53[1] + auVar309._4_4_
                                                                ,fVar56 * *pfVar53 + auVar309._0_4_)
                                                      )));
                pfVar49 = pfVar49 + *(int *)(&this->field_0xd8 + (long)p_Var6);
                pfVar53 = pfVar53 + 4;
              }
            }
            auVar104 = auVar309._0_16_;
            auVar272 = auVar104;
            if (5 < *(int *)(&this->field_0xf4 + (long)p_Var4) - 1U) goto switchD_004b9a9e_caseD_1;
            auVar210 = auVar207._0_16_;
            auVar272 = vmaxps_avx(auVar104,auVar210);
            fVar98 = auVar282._4_4_;
            fVar99 = auVar282._8_4_;
            fVar62 = auVar282._12_4_;
            fVar56 = auVar282._0_4_;
            fVar97 = auVar309._8_4_;
            fVar100 = auVar309._12_4_;
            switch(*(int *)(&this->field_0xf4 + (long)p_Var4)) {
            case 2:
              auVar104 = vminps_avx(auVar104,auVar210);
              fVar56 = **(float **)(&this->field_0xf8 + (long)p_Var4);
              auVar264._0_4_ = fVar56 * auVar104._0_4_ + auVar272._0_4_;
              auVar264._4_4_ = fVar56 * auVar104._4_4_ + auVar272._4_4_;
              auVar264._8_4_ = fVar56 * auVar104._8_4_ + auVar272._8_4_;
              auVar264._12_4_ = fVar56 * auVar104._12_4_ + auVar272._12_4_;
              auVar272 = auVar264;
              break;
            case 3:
              uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
              auVar269._4_4_ = uVar1;
              auVar269._0_4_ = uVar1;
              auVar269._8_4_ = uVar1;
              auVar269._12_4_ = uVar1;
              uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
              auVar338._4_4_ = uVar1;
              auVar338._0_4_ = uVar1;
              auVar338._8_4_ = uVar1;
              auVar338._12_4_ = uVar1;
              auVar104 = vmaxps_avx(auVar104,auVar269);
              auVar272 = vminps_avx(auVar338,auVar104);
              break;
            case 4:
              auVar72._0_8_ = auVar309._0_8_ ^ 0x8000000080000000;
              auVar72._8_4_ = -fVar97;
              auVar72._12_4_ = -fVar100;
              auVar134._8_4_ = 0x42b0c0a5;
              auVar134._0_8_ = 0x42b0c0a542b0c0a5;
              auVar134._12_4_ = 0x42b0c0a5;
              auVar104 = vminps_avx(auVar72,auVar134);
              auVar135._8_4_ = 0xc2b0c0a5;
              auVar135._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar135._12_4_ = 0xc2b0c0a5;
              auVar197 = vmaxps_avx(auVar104,auVar135);
              auVar270._0_4_ = auVar197._0_4_ * 1.442695 + fVar56;
              auVar270._4_4_ = auVar197._4_4_ * 1.442695 + fVar98;
              auVar270._8_4_ = auVar197._8_4_ * 1.442695 + fVar99;
              auVar270._12_4_ = auVar197._12_4_ * 1.442695 + fVar62;
              auVar339._0_4_ = (int)auVar270._0_4_;
              auVar339._4_4_ = (int)auVar270._4_4_;
              auVar339._8_4_ = (int)auVar270._8_4_;
              auVar339._12_4_ = (int)auVar270._12_4_;
              auVar210 = vcvtdq2ps_avx(auVar339);
              auVar104 = vcmpps_avx(auVar270,auVar210,1);
              auVar104 = vandps_avx(auVar104,auVar220);
              auVar104 = vsubps_avx(auVar210,auVar104);
              fVar97 = auVar104._0_4_ * -0.6931472 + auVar197._0_4_;
              fVar100 = auVar104._4_4_ * -0.6931472 + auVar197._4_4_;
              fVar101 = auVar104._8_4_ * -0.6931472 + auVar197._8_4_;
              fVar102 = auVar104._12_4_ * -0.6931472 + auVar197._12_4_;
              auVar271._0_4_ = (int)auVar104._0_4_;
              auVar271._4_4_ = (int)auVar104._4_4_;
              auVar271._8_4_ = (int)auVar104._8_4_;
              auVar271._12_4_ = (int)auVar104._12_4_;
              auVar104 = vpslld_avx(auVar271,0x17);
              auVar104 = vpaddd_avx(auVar104,auVar220);
              auVar73._0_4_ =
                   (fVar97 * fVar97 *
                    (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 + 0.008333452) * fVar97 +
                      0.041665796) * fVar97 + 0.16666666) * fVar97 + fVar56) + fVar97 + 1.0) *
                   auVar104._0_4_ + 1.0;
              auVar73._4_4_ =
                   (fVar100 * fVar100 *
                    (((((fVar100 * 0.00019875691 + 0.0013981999) * fVar100 + 0.008333452) * fVar100
                      + 0.041665796) * fVar100 + 0.16666666) * fVar100 + fVar98) + fVar100 + 1.0) *
                   auVar104._4_4_ + 1.0;
              auVar73._8_4_ =
                   (fVar101 * fVar101 *
                    (((((fVar101 * 0.00019875691 + 0.0013981999) * fVar101 + 0.008333452) * fVar101
                      + 0.041665796) * fVar101 + 0.16666666) * fVar101 + fVar99) + fVar101 + 1.0) *
                   auVar104._8_4_ + 1.0;
              auVar73._12_4_ =
                   (fVar102 * fVar102 *
                    (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) * fVar102
                      + 0.041665796) * fVar102 + 0.16666666) * fVar102 + fVar62) + fVar102 + 1.0) *
                   auVar104._12_4_ + 1.0;
              auVar104 = vrcpps_avx(auVar73);
              fVar56 = auVar104._0_4_;
              auVar74._0_4_ = auVar73._0_4_ * fVar56;
              fVar98 = auVar104._4_4_;
              auVar74._4_4_ = auVar73._4_4_ * fVar98;
              fVar99 = auVar104._8_4_;
              auVar74._8_4_ = auVar73._8_4_ * fVar99;
              fVar62 = auVar104._12_4_;
              auVar74._12_4_ = auVar73._12_4_ * fVar62;
              auVar104 = vsubps_avx(auVar220,auVar74);
              auVar272._0_4_ = fVar56 + fVar56 * auVar104._0_4_;
              auVar272._4_4_ = fVar98 + fVar98 * auVar104._4_4_;
              auVar272._8_4_ = fVar99 + fVar99 * auVar104._8_4_;
              auVar272._12_4_ = fVar62 + fVar62 * auVar104._12_4_;
              break;
            case 5:
              auVar202._8_4_ = 0x42b0c0a5;
              auVar202._0_8_ = 0x42b0c0a542b0c0a5;
              auVar202._12_4_ = 0x42b0c0a5;
              auVar104 = vminps_avx(auVar104,auVar202);
              auVar276._8_4_ = 0xc2b0c0a5;
              auVar276._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar276._12_4_ = 0xc2b0c0a5;
              auVar197 = vmaxps_avx(auVar276,auVar104);
              auVar319._0_4_ = auVar197._0_4_ * 1.442695 + fVar56;
              auVar319._4_4_ = auVar197._4_4_ * 1.442695 + fVar98;
              auVar319._8_4_ = auVar197._8_4_ * 1.442695 + fVar99;
              auVar319._12_4_ = auVar197._12_4_ * 1.442695 + fVar62;
              auVar336._0_4_ = (int)auVar319._0_4_;
              auVar336._4_4_ = (int)auVar319._4_4_;
              auVar336._8_4_ = (int)auVar319._8_4_;
              auVar336._12_4_ = (int)auVar319._12_4_;
              auVar210 = vcvtdq2ps_avx(auVar336);
              auVar104 = vcmpps_avx(auVar319,auVar210,1);
              auVar104 = vandps_avx(auVar104,auVar220);
              auVar104 = vsubps_avx(auVar210,auVar104);
              auVar337._0_4_ = auVar104._0_4_ * 0.6931472;
              auVar337._4_4_ = auVar104._4_4_ * 0.6931472;
              auVar337._8_4_ = auVar104._8_4_ * 0.6931472;
              auVar337._12_4_ = auVar104._12_4_ * 0.6931472;
              auVar210 = vsubps_avx(auVar197,auVar337);
              fVar101 = auVar210._0_4_;
              fVar102 = auVar210._4_4_;
              fVar103 = auVar210._8_4_;
              fVar158 = auVar210._12_4_;
              auVar265._0_4_ = (int)auVar104._0_4_;
              auVar265._4_4_ = (int)auVar104._4_4_;
              auVar265._8_4_ = (int)auVar104._8_4_;
              auVar265._12_4_ = (int)auVar104._12_4_;
              auVar104 = vpslld_avx(auVar265,0x17);
              auVar104 = vpaddd_avx(auVar104,auVar220);
              auVar266._0_4_ =
                   (fVar101 + 1.0 +
                   fVar101 * fVar101 *
                   (((((fVar101 * 0.00019875691 + 0.0013981999) * fVar101 + 0.008333452) * fVar101 +
                     0.041665796) * fVar101 + 0.16666666) * fVar101 + fVar56)) * auVar104._0_4_ +
                   1.0;
              auVar266._4_4_ =
                   (fVar102 + 1.0 +
                   fVar102 * fVar102 *
                   (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) * fVar102 +
                     0.041665796) * fVar102 + 0.16666666) * fVar102 + fVar98)) * auVar104._4_4_ +
                   1.0;
              auVar266._8_4_ =
                   (fVar103 + 1.0 +
                   fVar103 * fVar103 *
                   (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) * fVar103 +
                     0.041665796) * fVar103 + 0.16666666) * fVar103 + fVar99)) * auVar104._8_4_ +
                   1.0;
              auVar266._12_4_ =
                   (fVar158 + 1.0 +
                   fVar158 * fVar158 *
                   (((((fVar158 * 0.00019875691 + 0.0013981999) * fVar158 + 0.008333452) * fVar158 +
                     0.041665796) * fVar158 + 0.16666666) * fVar158 + fVar62)) * auVar104._12_4_ +
                   1.0;
              auVar129._8_4_ = 0x800000;
              auVar129._0_8_ = 0x80000000800000;
              auVar129._12_4_ = 0x800000;
              auVar104 = vmaxps_avx(auVar266,auVar129);
              auVar210 = vpsrld_avx(auVar104,0x17);
              auVar182._8_4_ = 0xffffff82;
              auVar182._0_8_ = 0xffffff82ffffff82;
              auVar182._12_4_ = 0xffffff82;
              auVar210 = vpaddd_avx(auVar210,auVar182);
              auVar183._8_4_ = 0x807fffff;
              auVar183._0_8_ = 0x807fffff807fffff;
              auVar183._12_4_ = 0x807fffff;
              auVar104 = vandps_avx(auVar104,auVar183);
              auVar245 = vorps_avx(auVar104,auVar282._0_16_);
              auVar197 = vcvtdq2ps_avx(auVar210);
              auVar184._8_4_ = 0x3f3504f3;
              auVar184._0_8_ = 0x3f3504f33f3504f3;
              auVar184._12_4_ = 0x3f3504f3;
              auVar210 = vcmpps_avx(auVar245,auVar184,1);
              auVar104 = vandps_avx(auVar210,auVar245);
              fVar101 = auVar245._0_4_ + -1.0 + auVar104._0_4_;
              fVar102 = auVar245._4_4_ + -1.0 + auVar104._4_4_;
              fVar103 = auVar245._8_4_ + -1.0 + auVar104._8_4_;
              fVar158 = auVar245._12_4_ + -1.0 + auVar104._12_4_;
              auVar104 = vandps_avx(auVar210,auVar220);
              auVar210 = vsubps_avx(auVar197,auVar104);
              auVar104 = vcmpps_avx(auVar266,_DAT_004d3a10,2);
              auVar130._0_4_ =
                   (fVar101 * fVar101 *
                    (((((((((fVar101 * 0.070376836 + -0.1151461) * fVar101 + 0.116769984) * fVar101
                          + -0.12420141) * fVar101 + 0.14249323) * fVar101 + -0.16668057) * fVar101
                       + 0.20000714) * fVar101 + -0.24999994) * fVar101 + 0.3333333) * fVar101 +
                    -0.5) + auVar210._0_4_ * 0.6931472 + fVar101) * -2.0;
              auVar130._4_4_ =
                   (fVar102 * fVar102 *
                    (((((((((fVar102 * 0.070376836 + -0.1151461) * fVar102 + 0.116769984) * fVar102
                          + -0.12420141) * fVar102 + 0.14249323) * fVar102 + -0.16668057) * fVar102
                       + 0.20000714) * fVar102 + -0.24999994) * fVar102 + 0.3333333) * fVar102 +
                    -0.5) + auVar210._4_4_ * 0.6931472 + fVar102) * -2.0;
              auVar130._8_4_ =
                   (fVar103 * fVar103 *
                    (((((((((fVar103 * 0.070376836 + -0.1151461) * fVar103 + 0.116769984) * fVar103
                          + -0.12420141) * fVar103 + 0.14249323) * fVar103 + -0.16668057) * fVar103
                       + 0.20000714) * fVar103 + -0.24999994) * fVar103 + 0.3333333) * fVar103 +
                    -0.5) + auVar210._8_4_ * 0.6931472 + fVar103) * -2.0;
              auVar130._12_4_ =
                   (fVar158 * fVar158 *
                    (((((((((fVar158 * 0.070376836 + -0.1151461) * fVar158 + 0.116769984) * fVar158
                          + -0.12420141) * fVar158 + 0.14249323) * fVar158 + -0.16668057) * fVar158
                       + 0.20000714) * fVar158 + -0.24999994) * fVar158 + 0.3333333) * fVar158 +
                    -0.5) + auVar210._12_4_ * 0.6931472 + fVar158) * -2.0;
              auVar185._8_4_ = 0x7fffffff;
              auVar185._0_8_ = 0x7fffffff7fffffff;
              auVar185._12_4_ = 0x7fffffff;
              auVar104 = vblendvps_avx(auVar130,auVar185,auVar104);
              auVar186._8_4_ = 0x42b0c0a5;
              auVar186._0_8_ = 0x42b0c0a542b0c0a5;
              auVar186._12_4_ = 0x42b0c0a5;
              auVar104 = vminps_avx(auVar104,auVar186);
              auVar187._8_4_ = 0xc2b0c0a5;
              auVar187._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar187._12_4_ = 0xc2b0c0a5;
              auVar197 = vmaxps_avx(auVar104,auVar187);
              auVar188._0_4_ = auVar197._0_4_ * 1.442695 + fVar56;
              auVar188._4_4_ = auVar197._4_4_ * 1.442695 + fVar98;
              auVar188._8_4_ = auVar197._8_4_ * 1.442695 + fVar99;
              auVar188._12_4_ = auVar197._12_4_ * 1.442695 + fVar62;
              auVar267._0_4_ = (int)auVar188._0_4_;
              auVar267._4_4_ = (int)auVar188._4_4_;
              auVar267._8_4_ = (int)auVar188._8_4_;
              auVar267._12_4_ = (int)auVar188._12_4_;
              auVar210 = vcvtdq2ps_avx(auVar267);
              auVar104 = vcmpps_avx(auVar188,auVar210,1);
              auVar104 = vandps_avx(auVar104,auVar220);
              auVar104 = vsubps_avx(auVar210,auVar104);
              auVar268._0_4_ = auVar104._0_4_ * 0.6931472;
              auVar268._4_4_ = auVar104._4_4_ * 0.6931472;
              auVar268._8_4_ = auVar104._8_4_ * 0.6931472;
              auVar268._12_4_ = auVar104._12_4_ * 0.6931472;
              auVar210 = vsubps_avx(auVar197,auVar268);
              fVar101 = auVar210._0_4_;
              fVar102 = auVar210._4_4_;
              fVar103 = auVar210._8_4_;
              fVar158 = auVar210._12_4_;
              auVar282 = ZEXT1664(auVar282._0_16_);
              auVar207 = ZEXT864(0) << 0x20;
              auVar189._0_4_ = (int)auVar104._0_4_;
              auVar189._4_4_ = (int)auVar104._4_4_;
              auVar189._8_4_ = (int)auVar104._8_4_;
              auVar189._12_4_ = (int)auVar104._12_4_;
              auVar104 = vpslld_avx(auVar189,0x17);
              auVar104 = vpaddd_avx(auVar104,auVar220);
              auVar131._0_4_ =
                   (fVar101 + 1.0 +
                   (((((fVar101 * 0.00019875691 + 0.0013981999) * fVar101 + 0.008333452) * fVar101 +
                     0.041665796) * fVar101 + 0.16666666) * fVar101 + fVar56) * fVar101 * fVar101) *
                   auVar104._0_4_ + 1.0;
              auVar131._4_4_ =
                   (fVar102 + 1.0 +
                   (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) * fVar102 +
                     0.041665796) * fVar102 + 0.16666666) * fVar102 + fVar98) * fVar102 * fVar102) *
                   auVar104._4_4_ + 1.0;
              auVar131._8_4_ =
                   (fVar103 + 1.0 +
                   (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) * fVar103 +
                     0.041665796) * fVar103 + 0.16666666) * fVar103 + fVar99) * fVar103 * fVar103) *
                   auVar104._8_4_ + 1.0;
              auVar131._12_4_ =
                   (fVar158 + 1.0 +
                   (((((fVar158 * 0.00019875691 + 0.0013981999) * fVar158 + 0.008333452) * fVar158 +
                     0.041665796) * fVar158 + 0.16666666) * fVar158 + fVar62) * fVar158 * fVar158) *
                   auVar104._12_4_ + 1.0;
              auVar104 = vrcpps_avx(auVar131);
              fVar56 = auVar104._0_4_;
              fVar98 = auVar104._4_4_;
              fVar99 = auVar104._8_4_;
              fVar62 = auVar104._12_4_;
              auVar132._0_4_ = auVar131._0_4_ * (fVar56 + fVar56);
              auVar132._4_4_ = auVar131._4_4_ * (fVar98 + fVar98);
              auVar132._8_4_ = auVar131._8_4_ * (fVar99 + fVar99);
              auVar132._12_4_ = auVar131._12_4_ * (fVar62 + fVar62);
              auVar203._8_4_ = 0x40000000;
              auVar203._0_8_ = 0x4000000040000000;
              auVar203._12_4_ = 0x40000000;
              auVar104 = vsubps_avx(auVar203,auVar132);
              auVar133._0_4_ = fVar56 + fVar56 + -1.0 + fVar56 * auVar104._0_4_;
              auVar133._4_4_ = fVar98 + fVar98 + -1.0 + fVar98 * auVar104._4_4_;
              auVar133._8_4_ = fVar99 + fVar99 + -1.0 + fVar99 * auVar104._8_4_;
              auVar133._12_4_ = fVar62 + fVar62 + -1.0 + fVar62 * auVar104._12_4_;
              goto LAB_004b9ea0;
            case 6:
              fVar56 = **(float **)(&this->field_0xf8 + (long)p_Var4);
              fVar98 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
              auVar136._0_4_ = fVar56 * auVar309._0_4_ + fVar98;
              auVar136._4_4_ = fVar56 * auVar309._4_4_ + fVar98;
              auVar136._8_4_ = fVar56 * fVar97 + fVar98;
              auVar136._12_4_ = fVar56 * fVar100 + fVar98;
              auVar104 = vmaxps_avx(auVar136,auVar210);
              auVar133 = vminps_avx(auVar104,auVar220);
LAB_004b9ea0:
              auVar272._0_4_ = auVar133._0_4_ * auVar309._0_4_;
              auVar272._4_4_ = auVar133._4_4_ * auVar309._4_4_;
              auVar272._8_4_ = auVar133._8_4_ * fVar97;
              auVar272._12_4_ = auVar133._12_4_ * fVar100;
            }
switchD_004b9a9e_caseD_1:
            *pauVar48 = auVar272;
            pauVar48 = pauVar48 + 1;
          }
        }
      }
      if ((iVar2 == 4) && (_elempack == 1)) {
        local_40 = top_blob->data;
        local_48 = (void *)((long)top_blob->w * top_blob->elemsize);
        uVar42 = 0;
        if (0 < iVar38) {
          uVar42 = (ulong)(uint)iVar38;
        }
        pvVar41 = (void *)0x0;
        if (0 < iVar51) {
          pvVar41 = pvVar39;
        }
        for (pvVar45 = (void *)0x0; pvVar9 = local_40, pvVar45 != pvVar41;
            pvVar45 = (void *)((long)pvVar45 + 1)) {
          lVar43 = (long)local_48 * (long)pvVar45;
          sVar7 = (this->weight_data_packed).cstep;
          sVar8 = (this->weight_data_packed).elemsize;
          pp_Var5 = this->_vptr_Convolution1D_x86_avx;
          pvVar10 = (this->weight_data_packed).data;
          for (lVar54 = 0; lVar54 <= lVar40; lVar54 = lVar54 + 1) {
            p_Var4 = pp_Var5[-3];
            if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
              auVar207 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar207 = ZEXT464(*(uint *)(*(long *)(&this->field_0x190 + (long)p_Var4) +
                                          (long)pvVar45 * 4));
            }
            pfVar53 = (float *)(sVar7 * (long)pvVar45 * sVar8 + (long)pvVar10);
            for (uVar44 = 0; uVar44 != uVar42; uVar44 = uVar44 + 1) {
              p_Var6 = this->_vptr_Convolution1D_x86_avx[-3];
              pfVar49 = (float *)((long)(_func_int ***)local_98.data +
                                 (long)(*(int *)(&this->field_0xdc + (long)p_Var6) * (int)lVar54 * 4
                                       ) * 4 + (long)local_98.w * local_98.elemsize * uVar44);
              iVar52 = *(int *)(&this->field_0xd4 + (long)p_Var6);
              if (*(int *)(&this->field_0xd4 + (long)p_Var6) < 1) {
                iVar52 = 0;
              }
              while (bVar55 = iVar52 != 0, iVar52 = iVar52 + -1, bVar55) {
                auVar59._0_4_ = *pfVar53 * *pfVar49;
                auVar59._4_4_ = pfVar53[1] * pfVar49[1];
                auVar59._8_4_ = pfVar53[2] * pfVar49[2];
                auVar59._12_4_ = pfVar53[3] * pfVar49[3];
                auVar104 = vshufpd_avx(auVar59,auVar59,1);
                auVar60._0_4_ = auVar104._0_4_ + auVar59._0_4_;
                auVar60._4_4_ = auVar104._4_4_ + auVar59._4_4_;
                auVar60._8_4_ = auVar104._8_4_ + auVar59._8_4_;
                auVar60._12_4_ = auVar104._12_4_ + auVar59._12_4_;
                auVar104 = vmovshdup_avx(auVar60);
                auVar207 = ZEXT464((uint)(auVar104._0_4_ + auVar207._0_4_ + auVar60._0_4_));
                pfVar49 = pfVar49 + (long)*(int *)(&this->field_0xd8 + (long)p_Var6) * 4;
                pfVar53 = pfVar53 + 4;
              }
            }
            auVar104 = auVar207._0_16_;
            fVar98 = auVar207._0_4_;
            fVar56 = fVar98;
            switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
            case 1:
              auVar104 = vmaxss_avx(auVar104,ZEXT416(0));
              fVar56 = auVar104._0_4_;
              break;
            case 2:
              auVar104 = vcmpss_avx(ZEXT816(0) << 0x40,auVar104,1);
              auVar138._8_4_ = 0x3f800000;
              auVar138._0_8_ = 0x3f8000003f800000;
              auVar138._12_4_ = 0x3f800000;
              auVar104 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)),
                                       auVar138,auVar104);
              fVar56 = auVar104._0_4_ * fVar98;
              break;
            case 3:
              fVar98 = (float)(*(uint **)(&this->field_0xf8 + (long)p_Var4))[1];
              auVar104 = vmaxss_avx(auVar104,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)))
              ;
              fVar56 = auVar104._0_4_;
              if (fVar98 < auVar104._0_4_) {
                fVar56 = fVar98;
              }
              break;
            case 4:
              auVar104 = vminss_avx(auVar104,ZEXT416(0x42b0c0a5));
              auVar75._0_8_ = auVar104._0_8_ ^ 0x8000000080000000;
              auVar75._8_4_ = auVar104._8_4_ ^ 0x80000000;
              auVar75._12_4_ = auVar104._12_4_ ^ 0x80000000;
              auVar104 = vcmpss_avx(auVar104,ZEXT416(0xc2b0c0a5),1);
              auVar137._8_4_ = 0x42b0c0a5;
              auVar137._0_8_ = 0x42b0c0a542b0c0a5;
              auVar137._12_4_ = 0x42b0c0a5;
              auVar104 = vblendvps_avx(auVar75,auVar137,auVar104);
              fVar56 = expf(auVar104._0_4_);
              fVar56 = 1.0 / (fVar56 + 1.0);
              break;
            case 5:
              fVar56 = expf(fVar98);
              fVar56 = logf(fVar56 + 1.0);
              fVar56 = tanhf(fVar56);
              fVar56 = fVar56 * fVar98;
              break;
            case 6:
              fVar99 = **(float **)(&this->field_0xf8 + (long)p_Var4);
              fVar62 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
              fVar97 = -fVar62 / fVar99;
              fVar56 = 0.0;
              if ((fVar97 <= fVar98) && (fVar56 = fVar98, fVar98 <= fVar97 + 1.0 / fVar99)) {
                fVar56 = (fVar99 * fVar98 + fVar62) * fVar98;
              }
            }
            *(float *)((long)pvVar9 + lVar54 * 4 + lVar43) = fVar56;
          }
        }
      }
      local_b8 = 0;
      if ((iVar2 == 1) && (_elempack == 1)) {
        pvVar41 = top_blob->data;
        iVar2 = top_blob->w;
        sVar7 = top_blob->elemsize;
        uVar42 = 0;
        if (0 < iVar38) {
          uVar42 = (ulong)(uint)iVar38;
        }
        local_b8 = 0;
        if (iVar51 < 1) {
          pvVar39 = (void *)0x0;
        }
        for (pvVar45 = (void *)0x0; pvVar45 != pvVar39; pvVar45 = (void *)((long)pvVar45 + 1)) {
          pp_Var5 = this->_vptr_Convolution1D_x86_avx;
          for (lVar43 = 0; lVar43 <= lVar40; lVar43 = lVar43 + 1) {
            p_Var4 = pp_Var5[-3];
            if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
              auVar207 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar207 = ZEXT464(*(uint *)(*(long *)(&this->field_0x190 + (long)p_Var4) +
                                          (long)pvVar45 * 4));
            }
            iVar52 = *(int *)(&this->field_0xd4 + (long)p_Var4);
            pfVar53 = (float *)((long)(iVar38 * (int)pvVar45 * iVar52) * 4 +
                               *(long *)(&this->field_0x148 + (long)p_Var4));
            if (iVar52 < 1) {
              iVar52 = 0;
            }
            for (uVar44 = 0; uVar44 != uVar42; uVar44 = uVar44 + 1) {
              pfVar49 = (float *)((long)(_func_int ***)local_98.data +
                                 (long)*(int *)(&this->field_0xdc + (long)p_Var4) *
                                 (long)(int)lVar43 * 4 +
                                 (long)local_98.w * local_98.elemsize * uVar44);
              iVar51 = iVar52;
              while (bVar55 = iVar51 != 0, iVar51 = iVar51 + -1, bVar55) {
                auVar207 = ZEXT464((uint)(*pfVar53 * *pfVar49 + auVar207._0_4_));
                pfVar49 = pfVar49 + *(int *)(&this->field_0xd8 + (long)p_Var4);
                pfVar53 = pfVar53 + 1;
              }
            }
            auVar104 = auVar207._0_16_;
            fVar98 = auVar207._0_4_;
            fVar56 = fVar98;
            switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
            case 1:
              auVar104 = vmaxss_avx(auVar104,ZEXT416(0));
              fVar56 = auVar104._0_4_;
              break;
            case 2:
              auVar104 = vcmpss_avx(ZEXT816(0) << 0x40,auVar104,1);
              auVar140._8_4_ = 0x3f800000;
              auVar140._0_8_ = 0x3f8000003f800000;
              auVar140._12_4_ = 0x3f800000;
              auVar104 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)),
                                       auVar140,auVar104);
              fVar62 = auVar104._0_4_;
LAB_004ba405:
              fVar56 = fVar62 * fVar98;
              break;
            case 3:
              fVar98 = (float)(*(uint **)(&this->field_0xf8 + (long)p_Var4))[1];
              auVar104 = vmaxss_avx(auVar104,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)))
              ;
              fVar56 = auVar104._0_4_;
              if (fVar98 < auVar104._0_4_) {
                fVar56 = fVar98;
              }
              break;
            case 4:
              auVar104 = vminss_avx(auVar104,ZEXT416(0x42b0c0a5));
              auVar76._0_8_ = auVar104._0_8_ ^ 0x8000000080000000;
              auVar76._8_4_ = auVar104._8_4_ ^ 0x80000000;
              auVar76._12_4_ = auVar104._12_4_ ^ 0x80000000;
              auVar104 = vcmpss_avx(auVar104,ZEXT416(0xc2b0c0a5),1);
              auVar139._8_4_ = 0x42b0c0a5;
              auVar139._0_8_ = 0x42b0c0a542b0c0a5;
              auVar139._12_4_ = 0x42b0c0a5;
              auVar104 = vblendvps_avx(auVar76,auVar139,auVar104);
              fVar56 = expf(auVar104._0_4_);
              fVar56 = 1.0 / (fVar56 + 1.0);
              break;
            case 5:
              fVar56 = expf(fVar98);
              fVar56 = logf(fVar56 + 1.0);
              fVar56 = tanhf(fVar56);
              fVar56 = fVar56 * fVar98;
              break;
            case 6:
              fVar99 = **(float **)(&this->field_0xf8 + (long)p_Var4);
              fVar62 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
              fVar97 = -fVar62 / fVar99;
              fVar56 = 0.0;
              if ((fVar97 <= fVar98) && (fVar56 = fVar98, fVar98 <= fVar97 + 1.0 / fVar99)) {
                fVar62 = fVar99 * fVar98 + fVar62;
                goto LAB_004ba405;
              }
            }
            *(float *)((long)pvVar41 + lVar43 * 4 + (long)iVar2 * sVar7 * (long)pvVar45) = fVar56;
          }
        }
      }
    }
  }
  piVar34 = (int *)CONCAT44(local_98.refcount._4_4_,(int)local_98.refcount);
  if (piVar34 != (int *)0x0) {
    LOCK();
    *piVar34 = *piVar34 + -1;
    UNLOCK();
    if (*piVar34 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        free(local_98.data);
      }
      else {
        (*(local_98.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return local_b8;
}

Assistant:

int Convolution1D_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_blob, tmp, 8, opt);

        Mat tmpout;
        forward(tmp, tmpout, opt);

        convert_packing(tmpout, top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __SSE2__
#if __AVX__
    if (elempack == 8 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);
                            __m256 _val4 = _mm256_broadcast_ss(sptr + 4);
                            __m256 _val5 = _mm256_broadcast_ss(sptr + 5);
                            __m256 _val6 = _mm256_broadcast_ss(sptr + 6);
                            __m256 _val7 = _mm256_broadcast_ss(sptr + 7);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            __m256 _w4 = _mm256_loadu_ps(kptr + 32);
                            __m256 _w5 = _mm256_loadu_ps(kptr + 40);
                            __m256 _w6 = _mm256_loadu_ps(kptr + 48);
                            __m256 _w7 = _mm256_loadu_ps(kptr + 56);

                            _mm256_comp_fmadd_ps8(_sum,
                                                  _val0, _val1, _val2, _val3, _val4, _val5, _val6, _val7,
                                                  _w0, _w1, _w2, _w3, _w4, _w5, _w6, _w7);

                            sptr += dilation_w * 8;
                            kptr += 64;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val = _mm256_set1_ps(sptr[0]);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);

                            sptr += dilation_w;
                            kptr += 8;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps((const float*)bias_data + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val0, _w0, _sum);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            _sum = _mm256_comp_fmadd_ps(_val1, _w1, _sum);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            _sum = _mm256_comp_fmadd_ps(_val2, _w2, _sum);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            _sum = _mm256_comp_fmadd_ps(_val3, _w3, _sum);

                            sptr += dilation_w * 4;
                            kptr += 32;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    __m256 _sum8 = _mm256_set1_ps(0);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++) // 29.23
                        {
                            __m256 _val = _mm256_loadu_ps(sptr);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            __m256 _s8 = _mm256_mul_ps(_val, _w);
                            _sum8 = _mm256_add_ps(_sum8, _s8);

                            sptr += dilation_w * 8;
                            kptr += 8;
                        }
                    }
                    sum += _mm256_reduce_add_ps(_sum8); // dot
                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_broadcast_ss(sptr);
                            __m128 _val1 = _mm_broadcast_ss(sptr + 1);
                            __m128 _val2 = _mm_broadcast_ss(sptr + 2);
                            __m128 _val3 = _mm_broadcast_ss(sptr + 3);
                            __m128 _val4 = _mm_broadcast_ss(sptr + 4);
                            __m128 _val5 = _mm_broadcast_ss(sptr + 5);
                            __m128 _val6 = _mm_broadcast_ss(sptr + 6);
                            __m128 _val7 = _mm_broadcast_ss(sptr + 7);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_comp_fmadd_ps(_val1, _w1, _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_comp_fmadd_ps(_val2, _w2, _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_comp_fmadd_ps(_val3, _w3, _sum);
                            __m128 _w4 = _mm_loadu_ps(kptr + 16);
                            _sum = _mm_comp_fmadd_ps(_val4, _w4, _sum);
                            __m128 _w5 = _mm_loadu_ps(kptr + 20);
                            _sum = _mm_comp_fmadd_ps(_val5, _w5, _sum);
                            __m128 _w6 = _mm_loadu_ps(kptr + 24);
                            _sum = _mm_comp_fmadd_ps(_val6, _w6, _sum);
                            __m128 _w7 = _mm_loadu_ps(kptr + 28);
                            _sum = _mm_comp_fmadd_ps(_val7, _w7, _sum);

                            sptr += dilation_w * 8;
                            kptr += 32;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }
#endif

    if (elempack == 4 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_set1_ps(sptr[0]);
                            __m128 _val1 = _mm_set1_ps(sptr[1]);
                            __m128 _val2 = _mm_set1_ps(sptr[2]);
                            __m128 _val3 = _mm_set1_ps(sptr[3]);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val0, _w0), _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_add_ps(_mm_mul_ps(_val1, _w1), _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_add_ps(_mm_mul_ps(_val2, _w2), _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_add_ps(_mm_mul_ps(_val3, _w3), _sum);

                            sptr += dilation_w * 4;
                            kptr += 16;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_set1_ps(sptr[0]);
                            __m128 _w = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);

                            sptr += dilation_w;
                            kptr += 4;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_loadu_ps(sptr);
                            __m128 _w = _mm_loadu_ps(kptr);
                            __m128 _s4 = _mm_mul_ps(_val, _w);
                            sum += _mm_reduce_add_ps(_s4); // dot

                            sptr += dilation_w * 4;
                            kptr += 4;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = (const float*)weight_data + kernel_w * h * p;

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            float val = sptr[0];
                            float wt = kptr[0];
                            sum += val * wt;

                            sptr += dilation_w;
                            kptr += 1;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    return 0;
}